

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersector1<8>::
     occluded_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  RTCFilterFunctionN p_Var23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  ulong uVar94;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  byte bVar103;
  uint uVar104;
  ulong uVar105;
  ulong uVar106;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar107;
  long lVar108;
  ulong uVar109;
  uint uVar110;
  long lVar111;
  uint uVar112;
  byte bVar113;
  bool bVar114;
  __m128 a;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar146;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar118 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar150;
  float fVar176;
  float fVar177;
  undefined1 auVar160 [32];
  undefined1 auVar151 [16];
  undefined1 auVar161 [32];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar178;
  undefined1 auVar152 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar179;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar180;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar200;
  float fVar201;
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar202;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar186 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar203;
  float fVar227;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar225;
  float fVar226;
  float fVar228;
  float fVar229;
  float fVar230;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar231;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar232;
  float fVar253;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [28];
  float fVar251;
  float fVar252;
  float fVar254;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar255;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float fVar256;
  float fVar274;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar272;
  float fVar273;
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [64];
  float fVar278;
  float fVar285;
  float fVar286;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar291;
  float fVar292;
  float fVar294;
  float fVar295;
  float fVar297;
  float fVar298;
  undefined1 auVar283 [32];
  float fVar290;
  float fVar293;
  float fVar296;
  undefined1 auVar284 [64];
  float fVar299;
  undefined1 auVar300 [16];
  float fVar305;
  float fVar306;
  float fVar308;
  float fVar309;
  float fVar310;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  float fVar307;
  undefined1 auVar303 [32];
  undefined1 auVar304 [64];
  float fVar311;
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  float fVar327;
  float fVar332;
  float fVar342;
  float fVar346;
  float fVar350;
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar321 [32];
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  float fVar363;
  float fVar364;
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [64];
  float fVar365;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [64];
  float fVar380;
  float fVar391;
  float fVar393;
  undefined1 auVar382 [16];
  float fVar397;
  float fVar399;
  float fVar401;
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  float fVar381;
  float fVar392;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar398;
  float fVar400;
  float fVar402;
  float fVar403;
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [64];
  float fVar404;
  float fVar410;
  float fVar411;
  float fVar412;
  float fVar413;
  float fVar414;
  float fVar415;
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [64];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  float fVar421;
  float fVar426;
  float fVar427;
  float fVar428;
  float fVar429;
  float fVar430;
  float fVar431;
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_bc4;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  int local_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined4 local_9f8;
  float local_9f4;
  undefined4 local_9f0;
  undefined4 local_9ec;
  uint local_9e8;
  uint local_9e4;
  uint local_9e0;
  ulong local_9c8;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 auStack_9b0 [16];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 auStack_8d0 [16];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  undefined1 auStack_8b0 [16];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  undefined1 auStack_890 [16];
  undefined1 local_880 [16];
  ulong local_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  float local_800;
  float fStack_7fc;
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_650 [16];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 uStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar18 = prim[1];
  uVar105 = (ulong)(byte)PVar18;
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 4 + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 4 + 10)));
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 5 + 6)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 5 + 10)));
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 6 + 6)));
  lVar108 = uVar105 * 0x25;
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 6 + 10)));
  auVar153 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0xf + 6)));
  auVar120 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0xf + 10)));
  auVar115 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 6)));
  auVar159 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 10)));
  auVar156 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x11 + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x11 + 10)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1a + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1a + 10)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1b + 6)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1b + 10)));
  auStack_890 = auVar209;
  _local_8a0 = auVar30;
  fVar203 = *(float *)(prim + lVar108 + 0x12);
  auVar217._16_16_ = auVar32;
  auVar217._0_16_ = auVar31;
  auVar30 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar108 + 6));
  auVar279._0_4_ = fVar203 * auVar30._0_4_;
  auVar279._4_4_ = fVar203 * auVar30._4_4_;
  auVar279._8_4_ = fVar203 * auVar30._8_4_;
  auVar279._12_4_ = fVar203 * auVar30._12_4_;
  auVar382._0_4_ = fVar203 * (ray->dir).field_0.m128[0];
  auVar382._4_4_ = fVar203 * (ray->dir).field_0.m128[1];
  auVar382._8_4_ = fVar203 * (ray->dir).field_0.m128[2];
  auVar382._12_4_ = fVar203 * (ray->dir).field_0.m128[3];
  _local_8c0 = vcvtdq2ps_avx(auVar217);
  auVar218._16_16_ = auVar121;
  auVar218._0_16_ = auVar183;
  auVar130 = vcvtdq2ps_avx(auVar218);
  auStack_8d0 = auVar120;
  _local_8e0 = auVar153;
  auVar244._16_16_ = auVar159;
  auVar244._0_16_ = auVar115;
  auVar168 = vcvtdq2ps_avx(auVar244);
  auVar245._16_16_ = auVar33;
  auVar245._0_16_ = auVar156;
  auVar24 = vcvtdq2ps_avx(auVar245);
  auVar432._16_16_ = auVar35;
  auVar432._0_16_ = auVar34;
  auVar366._16_16_ = auVar37;
  auVar366._0_16_ = auVar36;
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1c + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1c + 10)));
  auVar422._16_16_ = auVar209;
  auVar422._0_16_ = auVar30;
  auVar30 = vshufps_avx(auVar382,auVar382,0x55);
  auVar209 = vshufps_avx(auVar382,auVar382,0xaa);
  fVar203 = auVar209._0_4_;
  fVar225 = auVar209._4_4_;
  fVar226 = auVar209._8_4_;
  fVar227 = auVar209._12_4_;
  fVar228 = auVar30._0_4_;
  fVar229 = auVar30._4_4_;
  fVar230 = auVar30._8_4_;
  fVar232 = auVar30._12_4_;
  auVar115 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar108 + 0x16)) *
                           *(float *)(prim + lVar108 + 0x1a)));
  _local_9c0 = ZEXT1632(auVar115);
  auVar25 = vcvtdq2ps_avx(_local_8a0);
  auVar26 = vcvtdq2ps_avx(_local_8e0);
  auVar27 = vcvtdq2ps_avx(auVar432);
  auVar28 = vcvtdq2ps_avx(auVar366);
  auVar29 = vcvtdq2ps_avx(auVar422);
  auVar30 = vshufps_avx(auVar382,auVar382,0);
  fVar251 = auVar30._0_4_;
  fVar252 = auVar30._4_4_;
  fVar253 = auVar30._8_4_;
  fVar254 = auVar30._12_4_;
  auVar433._0_4_ = fVar251 * auVar25._0_4_ + fVar228 * local_8c0._0_4_ + fVar203 * auVar130._0_4_;
  auVar433._4_4_ = fVar252 * auVar25._4_4_ + fVar229 * local_8c0._4_4_ + fVar225 * auVar130._4_4_;
  auVar433._8_4_ = fVar253 * auVar25._8_4_ + fVar230 * local_8c0._8_4_ + fVar226 * auVar130._8_4_;
  auVar433._12_4_ =
       fVar254 * auVar25._12_4_ + fVar232 * local_8c0._12_4_ + fVar227 * auVar130._12_4_;
  auVar433._16_4_ =
       fVar251 * auVar25._16_4_ + fVar228 * local_8c0._16_4_ + fVar203 * auVar130._16_4_;
  auVar433._20_4_ =
       fVar252 * auVar25._20_4_ + fVar229 * local_8c0._20_4_ + fVar225 * auVar130._20_4_;
  auVar433._24_4_ =
       fVar253 * auVar25._24_4_ + fVar230 * local_8c0._24_4_ + fVar226 * auVar130._24_4_;
  auVar433._28_4_ = fVar232 + 0.0;
  auVar423._0_4_ = fVar251 * auVar26._0_4_ + fVar228 * auVar168._0_4_ + fVar203 * auVar24._0_4_;
  auVar423._4_4_ = fVar252 * auVar26._4_4_ + fVar229 * auVar168._4_4_ + fVar225 * auVar24._4_4_;
  auVar423._8_4_ = fVar253 * auVar26._8_4_ + fVar230 * auVar168._8_4_ + fVar226 * auVar24._8_4_;
  auVar423._12_4_ = fVar254 * auVar26._12_4_ + fVar232 * auVar168._12_4_ + fVar227 * auVar24._12_4_;
  auVar423._16_4_ = fVar251 * auVar26._16_4_ + fVar228 * auVar168._16_4_ + fVar203 * auVar24._16_4_;
  auVar423._20_4_ = fVar252 * auVar26._20_4_ + fVar229 * auVar168._20_4_ + fVar225 * auVar24._20_4_;
  auVar423._24_4_ = fVar253 * auVar26._24_4_ + fVar230 * auVar168._24_4_ + fVar226 * auVar24._24_4_;
  auVar423._28_4_ = 0;
  auVar383._0_4_ = fVar251 * auVar27._0_4_ + fVar228 * auVar28._0_4_ + fVar203 * auVar29._0_4_;
  auVar383._4_4_ = fVar252 * auVar27._4_4_ + fVar229 * auVar28._4_4_ + fVar225 * auVar29._4_4_;
  auVar383._8_4_ = fVar253 * auVar27._8_4_ + fVar230 * auVar28._8_4_ + fVar226 * auVar29._8_4_;
  auVar383._12_4_ = fVar254 * auVar27._12_4_ + fVar232 * auVar28._12_4_ + fVar227 * auVar29._12_4_;
  auVar383._16_4_ = fVar251 * auVar27._16_4_ + fVar228 * auVar28._16_4_ + fVar203 * auVar29._16_4_;
  auVar383._20_4_ = fVar252 * auVar27._20_4_ + fVar229 * auVar28._20_4_ + fVar225 * auVar29._20_4_;
  auVar383._24_4_ = fVar253 * auVar27._24_4_ + fVar230 * auVar28._24_4_ + fVar226 * auVar29._24_4_;
  auVar383._28_4_ = fVar232 + fVar227 + 0.0;
  auVar30 = vshufps_avx(auVar279,auVar279,0x55);
  auVar209 = vshufps_avx(auVar279,auVar279,0xaa);
  fVar251 = auVar209._0_4_;
  fVar252 = auVar209._4_4_;
  fVar253 = auVar209._8_4_;
  fVar254 = auVar209._12_4_;
  fVar228 = auVar30._0_4_;
  fVar229 = auVar30._4_4_;
  fVar230 = auVar30._8_4_;
  fVar232 = auVar30._12_4_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar105 * 7 + 6);
  auVar30 = vpmovsxwd_avx(auVar30);
  fVar231 = auVar130._28_4_ + 0.0;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *(ulong *)(prim + uVar105 * 7 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar209);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar105 * 0xb + 6);
  auVar31 = vpmovsxwd_avx(auVar31);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar105 * 0xb + 0xe);
  auVar32 = vpmovsxwd_avx(auVar32);
  auVar183 = vshufps_avx(auVar279,auVar279,0);
  fVar203 = auVar183._0_4_;
  fVar225 = auVar183._4_4_;
  fVar226 = auVar183._8_4_;
  fVar227 = auVar183._12_4_;
  auVar190._0_4_ = auVar25._0_4_ * fVar203 + fVar228 * local_8c0._0_4_ + fVar251 * auVar130._0_4_;
  auVar190._4_4_ = auVar25._4_4_ * fVar225 + fVar229 * local_8c0._4_4_ + fVar252 * auVar130._4_4_;
  auVar190._8_4_ = auVar25._8_4_ * fVar226 + fVar230 * local_8c0._8_4_ + fVar253 * auVar130._8_4_;
  auVar190._12_4_ =
       auVar25._12_4_ * fVar227 + fVar232 * local_8c0._12_4_ + fVar254 * auVar130._12_4_;
  auVar190._16_4_ =
       auVar25._16_4_ * fVar203 + fVar228 * local_8c0._16_4_ + fVar251 * auVar130._16_4_;
  auVar190._20_4_ =
       auVar25._20_4_ * fVar225 + fVar229 * local_8c0._20_4_ + fVar252 * auVar130._20_4_;
  auVar190._24_4_ =
       auVar25._24_4_ * fVar226 + fVar230 * local_8c0._24_4_ + fVar253 * auVar130._24_4_;
  auVar190._28_4_ = fVar232 + fVar231;
  auVar160._0_4_ = auVar26._0_4_ * fVar203 + auVar168._0_4_ * fVar228 + fVar251 * auVar24._0_4_;
  auVar160._4_4_ = auVar26._4_4_ * fVar225 + auVar168._4_4_ * fVar229 + fVar252 * auVar24._4_4_;
  auVar160._8_4_ = auVar26._8_4_ * fVar226 + auVar168._8_4_ * fVar230 + fVar253 * auVar24._8_4_;
  auVar160._12_4_ = auVar26._12_4_ * fVar227 + auVar168._12_4_ * fVar232 + fVar254 * auVar24._12_4_;
  auVar160._16_4_ = auVar26._16_4_ * fVar203 + auVar168._16_4_ * fVar228 + fVar251 * auVar24._16_4_;
  auVar160._20_4_ = auVar26._20_4_ * fVar225 + auVar168._20_4_ * fVar229 + fVar252 * auVar24._20_4_;
  auVar160._24_4_ = auVar26._24_4_ * fVar226 + auVar168._24_4_ * fVar230 + fVar253 * auVar24._24_4_;
  auVar160._28_4_ = fVar232 + auVar168._28_4_ + auVar24._28_4_;
  auVar261._8_4_ = 0x7fffffff;
  auVar261._0_8_ = 0x7fffffff7fffffff;
  auVar261._12_4_ = 0x7fffffff;
  auVar261._16_4_ = 0x7fffffff;
  auVar261._20_4_ = 0x7fffffff;
  auVar261._24_4_ = 0x7fffffff;
  auVar261._28_4_ = 0x7fffffff;
  auVar405._0_4_ = auVar28._0_4_ * fVar228 + fVar251 * auVar29._0_4_ + fVar203 * auVar27._0_4_;
  auVar405._4_4_ = auVar28._4_4_ * fVar229 + fVar252 * auVar29._4_4_ + fVar225 * auVar27._4_4_;
  auVar405._8_4_ = auVar28._8_4_ * fVar230 + fVar253 * auVar29._8_4_ + fVar226 * auVar27._8_4_;
  auVar405._12_4_ = auVar28._12_4_ * fVar232 + fVar254 * auVar29._12_4_ + fVar227 * auVar27._12_4_;
  auVar405._16_4_ = auVar28._16_4_ * fVar228 + fVar251 * auVar29._16_4_ + fVar203 * auVar27._16_4_;
  auVar405._20_4_ = auVar28._20_4_ * fVar229 + fVar252 * auVar29._20_4_ + fVar225 * auVar27._20_4_;
  auVar405._24_4_ = auVar28._24_4_ * fVar230 + fVar253 * auVar29._24_4_ + fVar226 * auVar27._24_4_;
  auVar405._28_4_ = fVar232 + fVar254 + fVar231;
  auVar130 = vandps_avx(auVar433,auVar261);
  auVar318._8_4_ = 0x219392ef;
  auVar318._0_8_ = 0x219392ef219392ef;
  auVar318._12_4_ = 0x219392ef;
  auVar318._16_4_ = 0x219392ef;
  auVar318._20_4_ = 0x219392ef;
  auVar318._24_4_ = 0x219392ef;
  auVar318._28_4_ = 0x219392ef;
  auVar130 = vcmpps_avx(auVar130,auVar318,1);
  auVar168 = vblendvps_avx(auVar433,auVar318,auVar130);
  auVar130 = vandps_avx(auVar423,auVar261);
  auVar130 = vcmpps_avx(auVar130,auVar318,1);
  auVar24 = vblendvps_avx(auVar423,auVar318,auVar130);
  auVar130 = vandps_avx(auVar383,auVar261);
  auVar130 = vcmpps_avx(auVar130,auVar318,1);
  auVar25 = vrcpps_avx(auVar168);
  auVar130 = vblendvps_avx(auVar383,auVar318,auVar130);
  auVar384._8_4_ = 0x3f800000;
  auVar384._0_8_ = 0x3f8000003f800000;
  auVar384._12_4_ = 0x3f800000;
  auVar384._16_4_ = 0x3f800000;
  auVar384._20_4_ = 0x3f800000;
  auVar384._24_4_ = 0x3f800000;
  auVar384._28_4_ = 0x3f800000;
  fVar203 = auVar25._0_4_;
  fVar225 = auVar25._4_4_;
  auVar26._4_4_ = auVar168._4_4_ * fVar225;
  auVar26._0_4_ = auVar168._0_4_ * fVar203;
  fVar226 = auVar25._8_4_;
  auVar26._8_4_ = auVar168._8_4_ * fVar226;
  fVar227 = auVar25._12_4_;
  auVar26._12_4_ = auVar168._12_4_ * fVar227;
  fVar228 = auVar25._16_4_;
  auVar26._16_4_ = auVar168._16_4_ * fVar228;
  fVar229 = auVar25._20_4_;
  auVar26._20_4_ = auVar168._20_4_ * fVar229;
  fVar230 = auVar25._24_4_;
  auVar26._24_4_ = auVar168._24_4_ * fVar230;
  auVar26._28_4_ = auVar168._28_4_;
  auVar27 = vsubps_avx(auVar384,auVar26);
  fVar203 = fVar203 + fVar203 * auVar27._0_4_;
  fVar225 = fVar225 + fVar225 * auVar27._4_4_;
  fVar226 = fVar226 + fVar226 * auVar27._8_4_;
  fVar227 = fVar227 + fVar227 * auVar27._12_4_;
  fVar228 = fVar228 + fVar228 * auVar27._16_4_;
  fVar229 = fVar229 + fVar229 * auVar27._20_4_;
  fVar230 = fVar230 + fVar230 * auVar27._24_4_;
  auVar26 = vrcpps_avx(auVar24);
  fVar232 = auVar26._0_4_;
  fVar251 = auVar26._4_4_;
  auVar168._4_4_ = fVar251 * auVar24._4_4_;
  auVar168._0_4_ = fVar232 * auVar24._0_4_;
  fVar252 = auVar26._8_4_;
  auVar168._8_4_ = fVar252 * auVar24._8_4_;
  fVar253 = auVar26._12_4_;
  auVar168._12_4_ = fVar253 * auVar24._12_4_;
  fVar254 = auVar26._16_4_;
  auVar168._16_4_ = fVar254 * auVar24._16_4_;
  fVar231 = auVar26._20_4_;
  auVar168._20_4_ = fVar231 * auVar24._20_4_;
  fVar255 = auVar26._24_4_;
  auVar168._24_4_ = fVar255 * auVar24._24_4_;
  auVar168._28_4_ = auVar24._28_4_;
  auVar24 = vsubps_avx(auVar384,auVar168);
  auVar168 = vrcpps_avx(auVar130);
  fVar232 = fVar232 + fVar232 * auVar24._0_4_;
  fVar251 = fVar251 + fVar251 * auVar24._4_4_;
  fVar252 = fVar252 + fVar252 * auVar24._8_4_;
  fVar253 = fVar253 + fVar253 * auVar24._12_4_;
  fVar254 = fVar254 + fVar254 * auVar24._16_4_;
  fVar231 = fVar231 + fVar231 * auVar24._20_4_;
  fVar255 = fVar255 + fVar255 * auVar24._24_4_;
  fVar256 = auVar168._0_4_;
  fVar272 = auVar168._4_4_;
  auVar28._4_4_ = fVar272 * auVar130._4_4_;
  auVar28._0_4_ = fVar256 * auVar130._0_4_;
  fVar273 = auVar168._8_4_;
  auVar28._8_4_ = fVar273 * auVar130._8_4_;
  fVar274 = auVar168._12_4_;
  auVar28._12_4_ = fVar274 * auVar130._12_4_;
  fVar275 = auVar168._16_4_;
  auVar28._16_4_ = fVar275 * auVar130._16_4_;
  fVar276 = auVar168._20_4_;
  auVar28._20_4_ = fVar276 * auVar130._20_4_;
  fVar277 = auVar168._24_4_;
  auVar28._24_4_ = fVar277 * auVar130._24_4_;
  auVar28._28_4_ = auVar130._28_4_;
  auVar130 = vsubps_avx(auVar384,auVar28);
  fVar256 = fVar256 + fVar256 * auVar130._0_4_;
  fVar272 = fVar272 + fVar272 * auVar130._4_4_;
  fVar273 = fVar273 + fVar273 * auVar130._8_4_;
  fVar274 = fVar274 + fVar274 * auVar130._12_4_;
  fVar275 = fVar275 + fVar275 * auVar130._16_4_;
  fVar276 = fVar276 + fVar276 * auVar130._20_4_;
  fVar277 = fVar277 + fVar277 * auVar130._24_4_;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *(ulong *)(prim + uVar105 * 9 + 6);
  auVar183 = vpmovsxwd_avx(auVar183);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + uVar105 * 9 + 0xe);
  auVar121 = vpmovsxwd_avx(auVar121);
  auVar130._16_16_ = auVar209;
  auVar130._0_16_ = auVar30;
  auVar301._16_16_ = auVar32;
  auVar301._0_16_ = auVar31;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = *(ulong *)(prim + uVar105 * 0xd + 6);
  auVar30 = vpmovsxwd_avx(auVar153);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + uVar105 * 0xd + 0xe);
  auVar209 = vpmovsxwd_avx(auVar120);
  auVar31 = vpermilps_avx(auVar115,0);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar168 = vcvtdq2ps_avx(auVar301);
  auVar168 = vsubps_avx(auVar168,auVar130);
  fVar287 = auVar31._0_4_;
  fVar288 = auVar31._4_4_;
  fVar290 = auVar31._8_4_;
  fVar291 = auVar31._12_4_;
  auVar302._0_4_ = auVar130._0_4_ + fVar287 * auVar168._0_4_;
  auVar302._4_4_ = auVar130._4_4_ + fVar288 * auVar168._4_4_;
  auVar302._8_4_ = auVar130._8_4_ + fVar290 * auVar168._8_4_;
  auVar302._12_4_ = auVar130._12_4_ + fVar291 * auVar168._12_4_;
  auVar302._16_4_ = auVar130._16_4_ + fVar287 * auVar168._16_4_;
  auVar302._20_4_ = auVar130._20_4_ + fVar288 * auVar168._20_4_;
  auVar302._24_4_ = auVar130._24_4_ + fVar290 * auVar168._24_4_;
  auVar302._28_4_ = auVar130._28_4_ + auVar168._28_4_;
  auVar131._16_16_ = auVar121;
  auVar131._0_16_ = auVar183;
  auVar130 = vcvtdq2ps_avx(auVar131);
  auVar319._16_16_ = auVar209;
  auVar319._0_16_ = auVar30;
  auVar168 = vcvtdq2ps_avx(auVar319);
  auVar168 = vsubps_avx(auVar168,auVar130);
  auVar320._0_4_ = auVar168._0_4_ * fVar287 + auVar130._0_4_;
  auVar320._4_4_ = auVar168._4_4_ * fVar288 + auVar130._4_4_;
  auVar320._8_4_ = auVar168._8_4_ * fVar290 + auVar130._8_4_;
  auVar320._12_4_ = auVar168._12_4_ * fVar291 + auVar130._12_4_;
  auVar320._16_4_ = auVar168._16_4_ * fVar287 + auVar130._16_4_;
  auVar320._20_4_ = auVar168._20_4_ * fVar288 + auVar130._20_4_;
  auVar320._24_4_ = auVar168._24_4_ * fVar290 + auVar130._24_4_;
  auVar320._28_4_ = auVar168._28_4_ + auVar130._28_4_;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *(ulong *)(prim + uVar105 * 0x12 + 6);
  auVar30 = vpmovsxwd_avx(auVar115);
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + uVar105 * 0x12 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar159);
  auVar132._16_16_ = auVar209;
  auVar132._0_16_ = auVar30;
  auVar130 = vcvtdq2ps_avx(auVar132);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *(ulong *)(prim + uVar105 * 0x16 + 6);
  auVar30 = vpmovsxwd_avx(auVar156);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar105 * 0x16 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar33);
  auVar356._16_16_ = auVar209;
  auVar356._0_16_ = auVar30;
  auVar168 = vcvtdq2ps_avx(auVar356);
  auVar168 = vsubps_avx(auVar168,auVar130);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar105 * 0x14 + 6);
  auVar30 = vpmovsxwd_avx(auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar105 * 0x14 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar35);
  auVar357._0_4_ = auVar168._0_4_ * fVar287 + auVar130._0_4_;
  auVar357._4_4_ = auVar168._4_4_ * fVar288 + auVar130._4_4_;
  auVar357._8_4_ = auVar168._8_4_ * fVar290 + auVar130._8_4_;
  auVar357._12_4_ = auVar168._12_4_ * fVar291 + auVar130._12_4_;
  auVar357._16_4_ = auVar168._16_4_ * fVar287 + auVar130._16_4_;
  auVar357._20_4_ = auVar168._20_4_ * fVar288 + auVar130._20_4_;
  auVar357._24_4_ = auVar168._24_4_ * fVar290 + auVar130._24_4_;
  auVar357._28_4_ = auVar168._28_4_ + auVar130._28_4_;
  auVar133._16_16_ = auVar209;
  auVar133._0_16_ = auVar30;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar105 * 0x18 + 6);
  auVar30 = vpmovsxwd_avx(auVar36);
  auVar130 = vcvtdq2ps_avx(auVar133);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar105 * 0x18 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar37);
  auVar367._16_16_ = auVar209;
  auVar367._0_16_ = auVar30;
  auVar168 = vcvtdq2ps_avx(auVar367);
  auVar168 = vsubps_avx(auVar168,auVar130);
  auVar368._0_4_ = auVar168._0_4_ * fVar287 + auVar130._0_4_;
  auVar368._4_4_ = auVar168._4_4_ * fVar288 + auVar130._4_4_;
  auVar368._8_4_ = auVar168._8_4_ * fVar290 + auVar130._8_4_;
  auVar368._12_4_ = auVar168._12_4_ * fVar291 + auVar130._12_4_;
  auVar368._16_4_ = auVar168._16_4_ * fVar287 + auVar130._16_4_;
  auVar368._20_4_ = auVar168._20_4_ * fVar288 + auVar130._20_4_;
  auVar368._24_4_ = auVar168._24_4_ * fVar290 + auVar130._24_4_;
  auVar368._28_4_ = auVar168._28_4_ + auVar130._28_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar105 * 0x1d + 6);
  auVar30 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar105 * 0x1d + 0xe);
  auVar209 = vpmovsxwd_avx(auVar11);
  auVar134._16_16_ = auVar209;
  auVar134._0_16_ = auVar30;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar105 * 0x21 + 6);
  auVar30 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar105 * 0x21 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar13);
  auVar385._16_16_ = auVar209;
  auVar385._0_16_ = auVar30;
  auVar130 = vcvtdq2ps_avx(auVar134);
  auVar168 = vcvtdq2ps_avx(auVar385);
  auVar168 = vsubps_avx(auVar168,auVar130);
  auVar135._0_4_ = auVar168._0_4_ * fVar287 + auVar130._0_4_;
  auVar135._4_4_ = auVar168._4_4_ * fVar288 + auVar130._4_4_;
  auVar135._8_4_ = auVar168._8_4_ * fVar290 + auVar130._8_4_;
  auVar135._12_4_ = auVar168._12_4_ * fVar291 + auVar130._12_4_;
  auVar135._16_4_ = auVar168._16_4_ * fVar287 + auVar130._16_4_;
  auVar135._20_4_ = auVar168._20_4_ * fVar288 + auVar130._20_4_;
  auVar135._24_4_ = auVar168._24_4_ * fVar290 + auVar130._24_4_;
  auVar135._28_4_ = auVar168._28_4_ + auVar130._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar105 * 0x1f + 6);
  auVar30 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar105 * 0x1f + 0xe);
  auVar209 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar105 * 0x23 + 6);
  auVar31 = vpmovsxwd_avx(auVar16);
  auVar386._16_16_ = auVar209;
  auVar386._0_16_ = auVar30;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar105 * 0x23 + 0xe);
  auVar30 = vpmovsxwd_avx(auVar17);
  auVar416._16_16_ = auVar30;
  auVar416._0_16_ = auVar31;
  auVar130 = vcvtdq2ps_avx(auVar386);
  auVar168 = vcvtdq2ps_avx(auVar416);
  auVar168 = vsubps_avx(auVar168,auVar130);
  auVar387._0_4_ = auVar130._0_4_ + auVar168._0_4_ * fVar287;
  auVar387._4_4_ = auVar130._4_4_ + auVar168._4_4_ * fVar288;
  auVar387._8_4_ = auVar130._8_4_ + auVar168._8_4_ * fVar290;
  auVar387._12_4_ = auVar130._12_4_ + auVar168._12_4_ * fVar291;
  auVar387._16_4_ = auVar130._16_4_ + auVar168._16_4_ * fVar287;
  auVar387._20_4_ = auVar130._20_4_ + auVar168._20_4_ * fVar288;
  auVar387._24_4_ = auVar130._24_4_ + auVar168._24_4_ * fVar290;
  auVar387._28_4_ = auVar130._28_4_ + fVar291;
  auVar130 = vsubps_avx(auVar302,auVar190);
  auVar280._0_4_ = fVar203 * auVar130._0_4_;
  auVar280._4_4_ = fVar225 * auVar130._4_4_;
  auVar280._8_4_ = fVar226 * auVar130._8_4_;
  auVar280._12_4_ = fVar227 * auVar130._12_4_;
  auVar29._16_4_ = fVar228 * auVar130._16_4_;
  auVar29._0_16_ = auVar280;
  auVar29._20_4_ = fVar229 * auVar130._20_4_;
  auVar29._24_4_ = fVar230 * auVar130._24_4_;
  auVar29._28_4_ = auVar130._28_4_;
  auVar130 = vsubps_avx(auVar320,auVar190);
  auVar204._0_4_ = fVar203 * auVar130._0_4_;
  auVar204._4_4_ = fVar225 * auVar130._4_4_;
  auVar204._8_4_ = fVar226 * auVar130._8_4_;
  auVar204._12_4_ = fVar227 * auVar130._12_4_;
  auVar38._16_4_ = fVar228 * auVar130._16_4_;
  auVar38._0_16_ = auVar204;
  auVar38._20_4_ = fVar229 * auVar130._20_4_;
  auVar38._24_4_ = fVar230 * auVar130._24_4_;
  auVar38._28_4_ = auVar25._28_4_ + auVar27._28_4_;
  auVar130 = vsubps_avx(auVar357,auVar160);
  auVar181._0_4_ = fVar232 * auVar130._0_4_;
  auVar181._4_4_ = fVar251 * auVar130._4_4_;
  auVar181._8_4_ = fVar252 * auVar130._8_4_;
  auVar181._12_4_ = fVar253 * auVar130._12_4_;
  auVar25._16_4_ = fVar254 * auVar130._16_4_;
  auVar25._0_16_ = auVar181;
  auVar25._20_4_ = fVar231 * auVar130._20_4_;
  auVar25._24_4_ = fVar255 * auVar130._24_4_;
  auVar25._28_4_ = auVar130._28_4_;
  auVar130 = vsubps_avx(auVar368,auVar160);
  auVar233._0_4_ = fVar232 * auVar130._0_4_;
  auVar233._4_4_ = fVar251 * auVar130._4_4_;
  auVar233._8_4_ = fVar252 * auVar130._8_4_;
  auVar233._12_4_ = fVar253 * auVar130._12_4_;
  auVar27._16_4_ = fVar254 * auVar130._16_4_;
  auVar27._0_16_ = auVar233;
  auVar27._20_4_ = fVar231 * auVar130._20_4_;
  auVar27._24_4_ = fVar255 * auVar130._24_4_;
  auVar27._28_4_ = auVar26._28_4_ + auVar24._28_4_;
  auVar168 = vsubps_avx(auVar135,auVar405);
  auVar151._0_4_ = fVar256 * auVar168._0_4_;
  auVar151._4_4_ = fVar272 * auVar168._4_4_;
  auVar151._8_4_ = fVar273 * auVar168._8_4_;
  auVar151._12_4_ = fVar274 * auVar168._12_4_;
  auVar24._16_4_ = fVar275 * auVar168._16_4_;
  auVar24._0_16_ = auVar151;
  auVar24._20_4_ = fVar276 * auVar168._20_4_;
  auVar24._24_4_ = fVar277 * auVar168._24_4_;
  auVar24._28_4_ = auVar130._28_4_;
  auVar130 = vsubps_avx(auVar387,auVar405);
  auVar116._0_4_ = fVar256 * auVar130._0_4_;
  auVar116._4_4_ = fVar272 * auVar130._4_4_;
  auVar116._8_4_ = fVar273 * auVar130._8_4_;
  auVar116._12_4_ = fVar274 * auVar130._12_4_;
  auVar322._16_4_ = fVar275 * auVar130._16_4_;
  auVar322._0_16_ = auVar116;
  auVar322._20_4_ = fVar276 * auVar130._20_4_;
  auVar322._24_4_ = fVar277 * auVar130._24_4_;
  auVar322._28_4_ = auVar130._28_4_;
  auVar30 = vpminsd_avx(auVar29._16_16_,auVar38._16_16_);
  auVar209 = vpminsd_avx(auVar280,auVar204);
  auVar321._16_16_ = auVar30;
  auVar321._0_16_ = auVar209;
  auVar30 = vpminsd_avx(auVar25._16_16_,auVar27._16_16_);
  auVar209 = vpminsd_avx(auVar181,auVar233);
  auVar358._16_16_ = auVar30;
  auVar358._0_16_ = auVar209;
  auVar130 = vmaxps_avx(auVar321,auVar358);
  auVar30 = vpminsd_avx(auVar24._16_16_,auVar322._16_16_);
  auVar209 = vpminsd_avx(auVar151,auVar116);
  auVar417._16_16_ = auVar30;
  auVar417._0_16_ = auVar209;
  uVar7 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar424._4_4_ = uVar7;
  auVar424._0_4_ = uVar7;
  auVar424._8_4_ = uVar7;
  auVar424._12_4_ = uVar7;
  auVar424._16_4_ = uVar7;
  auVar424._20_4_ = uVar7;
  auVar424._24_4_ = uVar7;
  auVar424._28_4_ = uVar7;
  auVar168 = vmaxps_avx(auVar417,auVar424);
  auVar130 = vmaxps_avx(auVar130,auVar168);
  local_3a0._4_4_ = auVar130._4_4_ * 0.99999964;
  local_3a0._0_4_ = auVar130._0_4_ * 0.99999964;
  local_3a0._8_4_ = auVar130._8_4_ * 0.99999964;
  local_3a0._12_4_ = auVar130._12_4_ * 0.99999964;
  local_3a0._16_4_ = auVar130._16_4_ * 0.99999964;
  local_3a0._20_4_ = auVar130._20_4_ * 0.99999964;
  local_3a0._24_4_ = auVar130._24_4_ * 0.99999964;
  local_3a0._28_4_ = auVar130._28_4_;
  auVar409 = ZEXT3264(local_3a0);
  auVar30 = vpmaxsd_avx(auVar29._16_16_,auVar38._16_16_);
  auVar373 = ZEXT1664(auVar30);
  auVar390 = ZEXT464((uint)(byte)PVar18);
  auVar209 = vpmaxsd_avx(auVar280,auVar204);
  auVar219._16_16_ = auVar30;
  auVar219._0_16_ = auVar209;
  auVar30 = vpmaxsd_avx(auVar25._16_16_,auVar27._16_16_);
  auVar209 = vpmaxsd_avx(auVar181,auVar233);
  auVar191._16_16_ = auVar30;
  auVar191._0_16_ = auVar209;
  auVar130 = vminps_avx(auVar219,auVar191);
  auVar30 = vpmaxsd_avx(auVar24._16_16_,auVar322._16_16_);
  auVar209 = vpmaxsd_avx(auVar151,auVar116);
  fVar203 = ray->tfar;
  auVar161._4_4_ = fVar203;
  auVar161._0_4_ = fVar203;
  auVar161._8_4_ = fVar203;
  auVar161._12_4_ = fVar203;
  auVar161._16_4_ = fVar203;
  auVar161._20_4_ = fVar203;
  auVar161._24_4_ = fVar203;
  auVar161._28_4_ = fVar203;
  auVar136._16_16_ = auVar30;
  auVar136._0_16_ = auVar209;
  auVar168 = vminps_avx(auVar136,auVar161);
  auVar130 = vminps_avx(auVar130,auVar168);
  auVar323._4_4_ = auVar130._4_4_ * 1.0000004;
  auVar323._0_4_ = auVar130._0_4_ * 1.0000004;
  auVar323._8_4_ = auVar130._8_4_ * 1.0000004;
  auVar323._12_4_ = auVar130._12_4_ * 1.0000004;
  auVar323._16_4_ = auVar130._16_4_ * 1.0000004;
  auVar323._20_4_ = auVar130._20_4_ * 1.0000004;
  auVar323._24_4_ = auVar130._24_4_ * 1.0000004;
  auVar323._28_4_ = auVar130._28_4_;
  auVar130 = vcmpps_avx(local_3a0,auVar323,2);
  auVar30 = vpshufd_avx(ZEXT416((uint)(byte)PVar18),0);
  auVar162._16_16_ = auVar30;
  auVar162._0_16_ = auVar30;
  auVar168 = vcvtdq2ps_avx(auVar162);
  auVar168 = vcmpps_avx(_DAT_01f7b060,auVar168,1);
  auVar130 = vandps_avx(auVar130,auVar168);
  auVar163._16_16_ = mm_lookupmask_ps._240_16_;
  auVar163._0_16_ = mm_lookupmask_ps._240_16_;
  uVar110 = vmovmskps_avx(auVar130);
  local_560 = vblendps_avx(auVar163,ZEXT832(0) << 0x20,0x80);
LAB_00acb7b1:
  local_868 = (ulong)uVar110;
  if (local_868 == 0) {
LAB_00ace0d5:
    return local_868 != 0;
  }
  lVar108 = 0;
  if (local_868 != 0) {
    for (; (uVar110 >> lVar108 & 1) == 0; lVar108 = lVar108 + 1) {
    }
  }
  uVar110 = *(uint *)(prim + 2);
  local_9c8 = (ulong)*(uint *)(prim + lVar108 * 4 + 6);
  pGVar19 = (context->scene->geometries).items[uVar110].ptr;
  uVar105 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                            local_9c8 *
                            pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar203 = (pGVar19->time_range).lower;
  fVar203 = pGVar19->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar203) / ((pGVar19->time_range).upper - fVar203));
  auVar30 = vroundss_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),9);
  auVar30 = vminss_avx(auVar30,ZEXT416((uint)(pGVar19->fnumTimeSegments + -1.0)));
  auVar30 = vmaxss_avx(ZEXT816(0) << 0x20,auVar30);
  fVar203 = fVar203 - auVar30._0_4_;
  _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar111 = (long)(int)auVar30._0_4_ * 0x38;
  lVar108 = *(long *)(_Var20 + 0x10 + lVar111);
  lVar21 = *(long *)(_Var20 + 0x38 + lVar111);
  lVar22 = *(long *)(_Var20 + 0x48 + lVar111);
  auVar30 = vshufps_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),0);
  pfVar1 = (float *)(lVar21 + uVar105 * lVar22);
  fVar228 = auVar30._0_4_;
  fVar229 = auVar30._4_4_;
  fVar230 = auVar30._8_4_;
  fVar232 = auVar30._12_4_;
  pfVar2 = (float *)(lVar21 + (uVar105 + 1) * lVar22);
  pfVar3 = (float *)(lVar21 + (uVar105 + 2) * lVar22);
  pfVar4 = (float *)(lVar21 + lVar22 * (uVar105 + 3));
  lVar21 = *(long *)(_Var20 + lVar111);
  auVar30 = vshufps_avx(ZEXT416((uint)(1.0 - fVar203)),ZEXT416((uint)(1.0 - fVar203)),0);
  pfVar5 = (float *)(lVar21 + lVar108 * uVar105);
  fVar203 = auVar30._0_4_;
  fVar225 = auVar30._4_4_;
  fVar226 = auVar30._8_4_;
  fVar227 = auVar30._12_4_;
  pfVar6 = (float *)(lVar21 + lVar108 * (uVar105 + 1));
  auVar182._0_4_ = fVar228 * *pfVar1 + fVar203 * *pfVar5;
  auVar182._4_4_ = fVar229 * pfVar1[1] + fVar225 * pfVar5[1];
  auVar182._8_4_ = fVar230 * pfVar1[2] + fVar226 * pfVar5[2];
  auVar182._12_4_ = fVar232 * pfVar1[3] + fVar227 * pfVar5[3];
  pfVar1 = (float *)(lVar21 + lVar108 * (uVar105 + 2));
  auVar205._0_4_ = fVar203 * *pfVar6 + fVar228 * *pfVar2;
  auVar205._4_4_ = fVar225 * pfVar6[1] + fVar229 * pfVar2[1];
  auVar205._8_4_ = fVar226 * pfVar6[2] + fVar230 * pfVar2[2];
  auVar205._12_4_ = fVar227 * pfVar6[3] + fVar232 * pfVar2[3];
  auVar234._0_4_ = fVar203 * *pfVar1 + fVar228 * *pfVar3;
  auVar234._4_4_ = fVar225 * pfVar1[1] + fVar229 * pfVar3[1];
  auVar234._8_4_ = fVar226 * pfVar1[2] + fVar230 * pfVar3[2];
  auVar234._12_4_ = fVar227 * pfVar1[3] + fVar232 * pfVar3[3];
  pfVar1 = (float *)(lVar21 + lVar108 * (uVar105 + 3));
  auVar257._0_4_ = fVar203 * *pfVar1 + fVar228 * *pfVar4;
  auVar257._4_4_ = fVar225 * pfVar1[1] + fVar229 * pfVar4[1];
  auVar257._8_4_ = fVar226 * pfVar1[2] + fVar230 * pfVar4[2];
  auVar257._12_4_ = fVar227 * pfVar1[3] + fVar232 * pfVar4[3];
  auVar117._0_4_ = (auVar182._0_4_ + auVar205._0_4_ + auVar234._0_4_ + auVar257._0_4_) * 0.25;
  auVar117._4_4_ = (auVar182._4_4_ + auVar205._4_4_ + auVar234._4_4_ + auVar257._4_4_) * 0.25;
  auVar117._8_4_ = (auVar182._8_4_ + auVar205._8_4_ + auVar234._8_4_ + auVar257._8_4_) * 0.25;
  auVar117._12_4_ = (auVar182._12_4_ + auVar205._12_4_ + auVar234._12_4_ + auVar257._12_4_) * 0.25;
  aVar8 = (ray->org).field_0.field_1;
  aVar9 = (ray->dir).field_0.field_1;
  auVar30 = vsubps_avx(auVar117,(undefined1  [16])aVar8);
  auVar30 = vdpps_avx(auVar30,(undefined1  [16])aVar9,0x7f);
  auVar209 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
  auVar31 = vrcpss_avx(auVar209,auVar209);
  auVar362 = ZEXT464(0x40000000);
  fVar203 = auVar30._0_4_ * auVar31._0_4_ * (2.0 - auVar31._0_4_ * auVar209._0_4_);
  local_880 = ZEXT416((uint)fVar203);
  auVar209 = vshufps_avx(local_880,ZEXT416((uint)fVar203),0);
  fVar203 = aVar9.x;
  fVar225 = aVar9.y;
  fVar226 = aVar9.z;
  aVar178 = aVar9.field_3;
  auVar281._0_4_ = aVar8.x + fVar203 * auVar209._0_4_;
  auVar281._4_4_ = aVar8.y + fVar225 * auVar209._4_4_;
  auVar281._8_4_ = aVar8.z + fVar226 * auVar209._8_4_;
  auVar281._12_4_ = aVar8.field_3.w + aVar178.w * auVar209._12_4_;
  auVar30 = vblendps_avx(auVar281,_DAT_01f45a50,8);
  auVar32 = vsubps_avx(auVar182,auVar30);
  auVar304 = ZEXT1664(auVar32);
  auVar121 = vsubps_avx(auVar234,auVar30);
  auVar183 = vsubps_avx(auVar205,auVar30);
  auVar153 = vsubps_avx(auVar257,auVar30);
  auVar271 = ZEXT1664(auVar153);
  auVar30 = vshufps_avx(auVar32,auVar32,0);
  auVar31 = vshufps_avx(auVar32,auVar32,0x55);
  register0x00001290 = auVar31;
  _local_1e0 = auVar31;
  auVar31 = vshufps_avx(auVar32,auVar32,0xaa);
  register0x00001290 = auVar31;
  _local_200 = auVar31;
  _local_9c0 = auVar32;
  auVar31 = vshufps_avx(auVar32,auVar32,0xff);
  register0x00001290 = auVar31;
  _local_220 = auVar31;
  auVar31 = vshufps_avx(auVar183,auVar183,0);
  register0x00001290 = auVar31;
  _local_240 = auVar31;
  auVar31 = vshufps_avx(auVar183,auVar183,0x55);
  register0x00001290 = auVar31;
  _local_260 = auVar31;
  auVar31 = vshufps_avx(auVar183,auVar183,0xaa);
  register0x00001290 = auVar31;
  _local_280 = auVar31;
  auVar152._0_4_ = fVar203 * fVar203;
  auVar152._4_4_ = fVar225 * fVar225;
  auVar152._8_4_ = fVar226 * fVar226;
  auVar152._12_4_ = aVar178.w * aVar178.w;
  auVar31 = vshufps_avx(auVar152,auVar152,0xaa);
  auVar32 = vshufps_avx(auVar152,auVar152,0x55);
  _local_8c0 = auVar183;
  auVar183 = vshufps_avx(auVar183,auVar183,0xff);
  register0x000012d0 = auVar183;
  _local_440 = auVar183;
  auVar183 = vshufps_avx(auVar152,auVar152,0);
  local_2a0._0_4_ = auVar183._0_4_ + auVar32._0_4_ + auVar31._0_4_;
  local_2a0._4_4_ = auVar183._4_4_ + auVar32._4_4_ + auVar31._4_4_;
  local_2a0._8_4_ = auVar183._8_4_ + auVar32._8_4_ + auVar31._8_4_;
  local_2a0._12_4_ = auVar183._12_4_ + auVar32._12_4_ + auVar31._12_4_;
  local_2a0._16_4_ = auVar183._0_4_ + auVar32._0_4_ + auVar31._0_4_;
  local_2a0._20_4_ = auVar183._4_4_ + auVar32._4_4_ + auVar31._4_4_;
  local_2a0._24_4_ = auVar183._8_4_ + auVar32._8_4_ + auVar31._8_4_;
  local_2a0._28_4_ = auVar183._12_4_ + auVar32._12_4_ + auVar31._12_4_;
  auVar284 = ZEXT3264(local_2a0);
  auVar31 = vshufps_avx(auVar121,auVar121,0);
  register0x00001250 = auVar31;
  _local_460 = auVar31;
  auVar31 = vshufps_avx(auVar121,auVar121,0x55);
  register0x00001250 = auVar31;
  _local_480 = auVar31;
  auVar31 = vshufps_avx(auVar121,auVar121,0xaa);
  register0x00001250 = auVar31;
  _local_4a0 = auVar31;
  _local_8a0 = auVar121;
  auVar31 = vshufps_avx(auVar121,auVar121,0xff);
  register0x00001250 = auVar31;
  _local_4c0 = auVar31;
  auVar31 = vshufps_avx(auVar153,auVar153,0);
  register0x00001250 = auVar31;
  _local_4e0 = auVar31;
  auVar31 = vshufps_avx(auVar153,auVar153,0x55);
  register0x00001250 = auVar31;
  _local_500 = auVar31;
  auVar31 = vshufps_avx(auVar153,auVar153,0xaa);
  register0x00001250 = auVar31;
  _local_520 = auVar31;
  _local_8e0 = auVar153;
  auVar31 = vshufps_avx(auVar153,auVar153,0xff);
  register0x00001250 = auVar31;
  _local_540 = auVar31;
  register0x00001210 = auVar209;
  _local_740 = auVar209;
  uVar105 = 0;
  bVar113 = 0;
  local_bc4 = 1;
  local_680 = (ray->dir).field_0.m128[0];
  local_800 = (ray->dir).field_0.m128[1];
  local_820 = (ray->dir).field_0.m128[2];
  auVar137._8_4_ = 0x7fffffff;
  auVar137._0_8_ = 0x7fffffff7fffffff;
  auVar137._12_4_ = 0x7fffffff;
  auVar137._16_4_ = 0x7fffffff;
  auVar137._20_4_ = 0x7fffffff;
  auVar137._24_4_ = 0x7fffffff;
  auVar137._28_4_ = 0x7fffffff;
  local_580 = vandps_avx(local_2a0,auVar137);
  local_650 = ZEXT816(0x3f80000000000000);
  fStack_81c = local_820;
  fStack_818 = local_820;
  fStack_814 = local_820;
  fStack_810 = local_820;
  fStack_80c = local_820;
  fStack_808 = local_820;
  fStack_804 = local_820;
  fStack_7fc = local_800;
  fStack_7f8 = local_800;
  fStack_7f4 = local_800;
  fStack_7f0 = local_800;
  fStack_7ec = local_800;
  fStack_7e8 = local_800;
  fStack_7e4 = local_800;
  fStack_67c = local_680;
  fStack_678 = local_680;
  fStack_674 = local_680;
  fStack_670 = local_680;
  fStack_66c = local_680;
  fStack_668 = local_680;
  fStack_664 = local_680;
  do {
    auVar246._8_4_ = 0x3f800000;
    auVar246._0_8_ = 0x3f8000003f800000;
    auVar246._12_4_ = 0x3f800000;
    auVar246._16_4_ = 0x3f800000;
    auVar246._20_4_ = 0x3f800000;
    auVar246._24_4_ = 0x3f800000;
    auVar246._28_4_ = 0x3f800000;
    auVar209 = vmovshdup_avx(local_650);
    auVar32 = vsubps_avx(auVar209,local_650);
    auVar209 = vshufps_avx(local_650,local_650,0);
    auVar31 = vshufps_avx(auVar32,auVar32,0);
    fVar150 = auVar31._0_4_;
    fVar176 = auVar31._4_4_;
    fVar177 = auVar31._8_4_;
    fVar179 = auVar31._12_4_;
    fVar180 = auVar209._0_4_;
    auVar220._0_4_ = fVar180 + fVar150 * 0.0;
    fVar200 = auVar209._4_4_;
    auVar220._4_4_ = fVar200 + fVar176 * 0.14285715;
    fVar201 = auVar209._8_4_;
    auVar220._8_4_ = fVar201 + fVar177 * 0.2857143;
    fVar202 = auVar209._12_4_;
    auVar220._12_4_ = fVar202 + fVar179 * 0.42857146;
    auVar220._16_4_ = fVar180 + fVar150 * 0.5714286;
    auVar220._20_4_ = fVar200 + fVar176 * 0.71428573;
    auVar220._24_4_ = fVar201 + fVar177 * 0.8571429;
    auVar220._28_4_ = fVar202 + fVar179;
    auVar130 = vsubps_avx(auVar246,auVar220);
    fVar225 = auVar130._0_4_;
    fVar226 = auVar130._4_4_;
    fVar227 = auVar130._8_4_;
    fVar228 = auVar130._12_4_;
    fVar229 = auVar130._16_4_;
    fVar230 = auVar130._20_4_;
    fVar232 = auVar130._24_4_;
    fVar231 = fVar225 * fVar225 * fVar225;
    fVar256 = fVar226 * fVar226 * fVar226;
    fVar273 = fVar227 * fVar227 * fVar227;
    fVar287 = fVar228 * fVar228 * fVar228;
    fVar290 = fVar229 * fVar229 * fVar229;
    fVar293 = fVar230 * fVar230 * fVar230;
    fVar296 = fVar232 * fVar232 * fVar232;
    fVar299 = auVar220._0_4_ * auVar220._0_4_ * auVar220._0_4_;
    fVar305 = auVar220._4_4_ * auVar220._4_4_ * auVar220._4_4_;
    fVar306 = auVar220._8_4_ * auVar220._8_4_ * auVar220._8_4_;
    fVar307 = auVar220._12_4_ * auVar220._12_4_ * auVar220._12_4_;
    fVar308 = auVar220._16_4_ * auVar220._16_4_ * auVar220._16_4_;
    fVar309 = auVar220._20_4_ * auVar220._20_4_ * auVar220._20_4_;
    fVar310 = auVar220._24_4_ * auVar220._24_4_ * auVar220._24_4_;
    fVar203 = auVar271._28_4_;
    fVar251 = auVar220._0_4_ * fVar225;
    fVar252 = auVar220._4_4_ * fVar226;
    fVar253 = auVar220._8_4_ * fVar227;
    fVar254 = auVar220._12_4_ * fVar228;
    fVar275 = auVar220._16_4_ * fVar229;
    fVar276 = auVar220._20_4_ * fVar230;
    fVar277 = auVar220._24_4_ * fVar232;
    fVar255 = auVar373._28_4_ + auVar409._28_4_;
    fVar354 = auVar304._28_4_ + fVar203 + fVar255;
    fVar363 = fVar255 + auVar284._28_4_ + auVar390._28_4_ + auVar362._28_4_;
    fVar255 = fVar231 * 0.16666667;
    fVar272 = fVar256 * 0.16666667;
    fVar274 = fVar273 * 0.16666667;
    fVar288 = fVar287 * 0.16666667;
    fVar291 = fVar290 * 0.16666667;
    fVar294 = fVar293 * 0.16666667;
    fVar297 = fVar296 * 0.16666667;
    fVar311 = (fVar299 + fVar231 * 4.0 + fVar225 * fVar251 * 12.0 + auVar220._0_4_ * fVar251 * 6.0)
              * 0.16666667;
    fVar327 = (fVar305 + fVar256 * 4.0 + fVar226 * fVar252 * 12.0 + auVar220._4_4_ * fVar252 * 6.0)
              * 0.16666667;
    fVar332 = (fVar306 + fVar273 * 4.0 + fVar227 * fVar253 * 12.0 + auVar220._8_4_ * fVar253 * 6.0)
              * 0.16666667;
    fVar337 = (fVar307 + fVar287 * 4.0 + fVar228 * fVar254 * 12.0 + auVar220._12_4_ * fVar254 * 6.0)
              * 0.16666667;
    fVar342 = (fVar308 + fVar290 * 4.0 + fVar229 * fVar275 * 12.0 + auVar220._16_4_ * fVar275 * 6.0)
              * 0.16666667;
    fVar346 = (fVar309 + fVar293 * 4.0 + fVar230 * fVar276 * 12.0 + auVar220._20_4_ * fVar276 * 6.0)
              * 0.16666667;
    fVar350 = (fVar310 + fVar296 * 4.0 + fVar232 * fVar277 * 12.0 + auVar220._24_4_ * fVar277 * 6.0)
              * 0.16666667;
    fVar231 = (fVar299 * 4.0 + fVar231 + auVar220._0_4_ * fVar251 * 12.0 + fVar225 * fVar251 * 6.0)
              * 0.16666667;
    fVar256 = (fVar305 * 4.0 + fVar256 + auVar220._4_4_ * fVar252 * 12.0 + fVar226 * fVar252 * 6.0)
              * 0.16666667;
    fVar273 = (fVar306 * 4.0 + fVar273 + auVar220._8_4_ * fVar253 * 12.0 + fVar227 * fVar253 * 6.0)
              * 0.16666667;
    fVar287 = (fVar307 * 4.0 + fVar287 + auVar220._12_4_ * fVar254 * 12.0 + fVar228 * fVar254 * 6.0)
              * 0.16666667;
    fVar290 = (fVar308 * 4.0 + fVar290 + auVar220._16_4_ * fVar275 * 12.0 + fVar229 * fVar275 * 6.0)
              * 0.16666667;
    fVar293 = (fVar309 * 4.0 + fVar293 + auVar220._20_4_ * fVar276 * 12.0 + fVar230 * fVar276 * 6.0)
              * 0.16666667;
    fVar296 = (fVar310 * 4.0 + fVar296 + auVar220._24_4_ * fVar277 * 12.0 + fVar232 * fVar277 * 6.0)
              * 0.16666667;
    fVar299 = fVar299 * 0.16666667;
    fVar305 = fVar305 * 0.16666667;
    fVar306 = fVar306 * 0.16666667;
    fVar307 = fVar307 * 0.16666667;
    fVar308 = fVar308 * 0.16666667;
    fVar309 = fVar309 * 0.16666667;
    fVar310 = fVar310 * 0.16666667;
    fVar403 = auVar390._28_4_ + 12.0;
    fVar364 = fVar363 + 12.166667;
    fVar146 = auVar30._0_4_;
    fVar147 = auVar30._4_4_;
    fVar148 = auVar30._8_4_;
    local_920 = fVar146 * fVar255 +
                fVar311 * (float)local_240._0_4_ +
                fVar299 * (float)local_4e0._0_4_ + fVar231 * (float)local_460._0_4_;
    fStack_91c = fVar147 * fVar272 +
                 fVar327 * (float)local_240._4_4_ +
                 fVar305 * (float)local_4e0._4_4_ + fVar256 * (float)local_460._4_4_;
    fStack_918 = fVar148 * fVar274 +
                 fVar332 * fStack_238 + fVar306 * fStack_4d8 + fVar273 * fStack_458;
    fStack_914 = auVar30._12_4_ * fVar288 +
                 fVar337 * fStack_234 + fVar307 * fStack_4d4 + fVar287 * fStack_454;
    fStack_910 = fVar146 * fVar291 +
                 fVar342 * fStack_230 + fVar308 * fStack_4d0 + fVar290 * fStack_450;
    fStack_90c = fVar147 * fVar294 +
                 fVar346 * fStack_22c + fVar309 * fStack_4cc + fVar293 * fStack_44c;
    fStack_908 = fVar148 * fVar297 +
                 fVar350 * fStack_228 + fVar310 * fStack_4c8 + fVar296 * fStack_448;
    fStack_904 = fVar354 + fVar364;
    fVar312 = (float)local_1e0._0_4_ * fVar255 +
              (float)local_260._0_4_ * fVar311 +
              fVar299 * (float)local_500._0_4_ + fVar231 * (float)local_480._0_4_;
    fVar328 = (float)local_1e0._4_4_ * fVar272 +
              (float)local_260._4_4_ * fVar327 +
              fVar305 * (float)local_500._4_4_ + fVar256 * (float)local_480._4_4_;
    fVar333 = fStack_1d8 * fVar274 +
              fStack_258 * fVar332 + fVar306 * fStack_4f8 + fVar273 * fStack_478;
    fVar338 = fStack_1d4 * fVar288 +
              fStack_254 * fVar337 + fVar307 * fStack_4f4 + fVar287 * fStack_474;
    fVar343 = fStack_1d0 * fVar291 +
              fStack_250 * fVar342 + fVar308 * fStack_4f0 + fVar290 * fStack_470;
    fVar347 = fStack_1cc * fVar294 +
              fStack_24c * fVar346 + fVar309 * fStack_4ec + fVar293 * fStack_46c;
    fVar351 = fStack_1c8 * fVar297 +
              fStack_248 * fVar350 + fVar310 * fStack_4e8 + fVar296 * fStack_468;
    fVar355 = fStack_904 + fVar403 + 12.166667;
    fVar313 = (float)local_200._0_4_ * fVar255 +
              (float)local_280._0_4_ * fVar311 +
              fVar299 * (float)local_520._0_4_ + fVar231 * (float)local_4a0._0_4_;
    fVar329 = (float)local_200._4_4_ * fVar272 +
              (float)local_280._4_4_ * fVar327 +
              fVar305 * (float)local_520._4_4_ + fVar256 * (float)local_4a0._4_4_;
    fVar334 = fStack_1f8 * fVar274 +
              fStack_278 * fVar332 + fVar306 * fStack_518 + fVar273 * fStack_498;
    fVar339 = fStack_1f4 * fVar288 +
              fStack_274 * fVar337 + fVar307 * fStack_514 + fVar287 * fStack_494;
    fStack_8f0 = fStack_1f0 * fVar291 +
                 fStack_270 * fVar342 + fVar308 * fStack_510 + fVar290 * fStack_490;
    fStack_8ec = fStack_1ec * fVar294 +
                 fStack_26c * fVar346 + fVar309 * fStack_50c + fVar293 * fStack_48c;
    fStack_8e8 = fStack_1e8 * fVar297 +
                 fStack_268 * fVar350 + fVar310 * fStack_508 + fVar296 * fStack_488;
    fStack_8e4 = fVar355 + fVar403 + auVar409._28_4_ + 12.0;
    local_b80._0_4_ =
         (float)local_220._0_4_ * fVar255 +
         fVar311 * (float)local_440._0_4_ +
         fVar231 * (float)local_4c0._0_4_ + fVar299 * (float)local_540._0_4_;
    local_b80._4_4_ =
         (float)local_220._4_4_ * fVar272 +
         fVar327 * (float)local_440._4_4_ +
         fVar256 * (float)local_4c0._4_4_ + fVar305 * (float)local_540._4_4_;
    fStack_b78 = fStack_218 * fVar274 +
                 fVar332 * fStack_438 + fVar273 * fStack_4b8 + fVar306 * fStack_538;
    fStack_b74 = fStack_214 * fVar288 +
                 fVar337 * fStack_434 + fVar287 * fStack_4b4 + fVar307 * fStack_534;
    fStack_b70 = fStack_210 * fVar291 +
                 fVar342 * fStack_430 + fVar290 * fStack_4b0 + fVar308 * fStack_530;
    fStack_b6c = fStack_20c * fVar294 +
                 fVar346 * fStack_42c + fVar293 * fStack_4ac + fVar309 * fStack_52c;
    fStack_b68 = fStack_208 * fVar297 +
                 fVar350 * fStack_428 + fVar296 * fStack_4a8 + fVar310 * fStack_528;
    fStack_b64 = auVar284._28_4_ + fVar354 + fVar363 + auVar304._28_4_;
    auVar39._4_4_ = auVar220._4_4_ * -auVar220._4_4_;
    auVar39._0_4_ = auVar220._0_4_ * -auVar220._0_4_;
    auVar39._8_4_ = auVar220._8_4_ * -auVar220._8_4_;
    auVar39._12_4_ = auVar220._12_4_ * -auVar220._12_4_;
    auVar39._16_4_ = auVar220._16_4_ * -auVar220._16_4_;
    auVar39._20_4_ = auVar220._20_4_ * -auVar220._20_4_;
    auVar39._24_4_ = auVar220._24_4_ * -auVar220._24_4_;
    auVar39._28_4_ = auVar220._28_4_;
    auVar40._4_4_ = fVar252 * 4.0;
    auVar40._0_4_ = fVar251 * 4.0;
    auVar40._8_4_ = fVar253 * 4.0;
    auVar40._12_4_ = fVar254 * 4.0;
    auVar40._16_4_ = fVar275 * 4.0;
    auVar40._20_4_ = fVar276 * 4.0;
    auVar40._24_4_ = fVar277 * 4.0;
    auVar40._28_4_ = fVar203;
    auVar130 = vsubps_avx(auVar39,auVar40);
    fVar296 = fVar225 * -fVar225 * 0.5;
    fVar297 = fVar226 * -fVar226 * 0.5;
    fVar299 = fVar227 * -fVar227 * 0.5;
    fVar305 = fVar228 * -fVar228 * 0.5;
    fVar306 = fVar229 * -fVar229 * 0.5;
    fVar307 = fVar230 * -fVar230 * 0.5;
    fVar308 = fVar232 * -fVar232 * 0.5;
    fVar273 = auVar130._0_4_ * 0.5;
    fVar274 = auVar130._4_4_ * 0.5;
    fVar287 = auVar130._8_4_ * 0.5;
    fVar290 = auVar130._12_4_ * 0.5;
    fVar291 = auVar130._16_4_ * 0.5;
    fVar293 = auVar130._20_4_ * 0.5;
    fVar294 = auVar130._24_4_ * 0.5;
    fVar231 = (fVar225 * fVar225 + fVar251 * 4.0) * 0.5;
    fVar255 = (fVar226 * fVar226 + fVar252 * 4.0) * 0.5;
    fVar256 = (fVar227 * fVar227 + fVar253 * 4.0) * 0.5;
    fVar272 = (fVar228 * fVar228 + fVar254 * 4.0) * 0.5;
    fVar275 = (fVar229 * fVar229 + fVar275 * 4.0) * 0.5;
    fVar276 = (fVar230 * fVar230 + fVar276 * 4.0) * 0.5;
    fVar277 = (fVar232 * fVar232 + fVar277 * 4.0) * 0.5;
    fVar225 = auVar220._0_4_ * auVar220._0_4_ * 0.5;
    fVar226 = auVar220._4_4_ * auVar220._4_4_ * 0.5;
    fVar227 = auVar220._8_4_ * auVar220._8_4_ * 0.5;
    fVar232 = auVar220._12_4_ * auVar220._12_4_ * 0.5;
    fVar251 = auVar220._16_4_ * auVar220._16_4_ * 0.5;
    fVar252 = auVar220._20_4_ * auVar220._20_4_ * 0.5;
    fVar254 = auVar220._24_4_ * auVar220._24_4_ * 0.5;
    fVar288 = auVar130._28_4_ + fVar202 + fVar203 + fVar364 + fVar203;
    auVar209 = vpermilps_avx(ZEXT416((uint)(auVar32._0_4_ * 0.04761905)),0);
    fVar228 = auVar209._0_4_;
    fVar314 = fVar228 * (fVar146 * fVar296 +
                        (float)local_240._0_4_ * fVar273 +
                        fVar231 * (float)local_460._0_4_ + fVar225 * (float)local_4e0._0_4_);
    fVar229 = auVar209._4_4_;
    fVar330 = fVar229 * (fVar147 * fVar297 +
                        (float)local_240._4_4_ * fVar274 +
                        fVar255 * (float)local_460._4_4_ + fVar226 * (float)local_4e0._4_4_);
    auVar41._4_4_ = fVar330;
    auVar41._0_4_ = fVar314;
    fVar230 = auVar209._8_4_;
    fVar335 = fVar230 * (fVar148 * fVar299 +
                        fStack_238 * fVar287 + fVar256 * fStack_458 + fVar227 * fStack_4d8);
    auVar41._8_4_ = fVar335;
    fVar253 = auVar209._12_4_;
    fVar340 = fVar253 * (auVar30._12_4_ * fVar305 +
                        fStack_234 * fVar290 + fVar272 * fStack_454 + fVar232 * fStack_4d4);
    auVar41._12_4_ = fVar340;
    fVar344 = fVar228 * (fVar146 * fVar306 +
                        fStack_230 * fVar291 + fVar275 * fStack_450 + fVar251 * fStack_4d0);
    auVar41._16_4_ = fVar344;
    fVar348 = fVar229 * (fVar147 * fVar307 +
                        fStack_22c * fVar293 + fVar276 * fStack_44c + fVar252 * fStack_4cc);
    auVar41._20_4_ = fVar348;
    fVar352 = fVar230 * (fVar148 * fVar308 +
                        fStack_228 * fVar294 + fVar277 * fStack_448 + fVar254 * fStack_4c8);
    auVar41._24_4_ = fVar352;
    auVar41._28_4_ = fStack_8e4 + fVar364;
    fVar365 = fVar228 * ((float)local_1e0._0_4_ * fVar296 +
                        (float)local_260._0_4_ * fVar273 +
                        fVar231 * (float)local_480._0_4_ + fVar225 * (float)local_500._0_4_);
    fVar374 = fVar229 * ((float)local_1e0._4_4_ * fVar297 +
                        (float)local_260._4_4_ * fVar274 +
                        fVar255 * (float)local_480._4_4_ + fVar226 * (float)local_500._4_4_);
    auVar42._4_4_ = fVar374;
    auVar42._0_4_ = fVar365;
    fVar375 = fVar230 * (fStack_1d8 * fVar299 +
                        fStack_258 * fVar287 + fVar256 * fStack_478 + fVar227 * fStack_4f8);
    auVar42._8_4_ = fVar375;
    fVar376 = fVar253 * (fStack_1d4 * fVar305 +
                        fStack_254 * fVar290 + fVar272 * fStack_474 + fVar232 * fStack_4f4);
    auVar42._12_4_ = fVar376;
    fVar377 = fVar228 * (fStack_1d0 * fVar306 +
                        fStack_250 * fVar291 + fVar275 * fStack_470 + fVar251 * fStack_4f0);
    auVar42._16_4_ = fVar377;
    fVar378 = fVar229 * (fStack_1cc * fVar307 +
                        fStack_24c * fVar293 + fVar276 * fStack_46c + fVar252 * fStack_4ec);
    auVar42._20_4_ = fVar378;
    fVar379 = fVar230 * (fStack_1c8 * fVar308 +
                        fStack_248 * fVar294 + fVar277 * fStack_468 + fVar254 * fStack_4e8);
    auVar42._24_4_ = fVar379;
    auVar42._28_4_ = uStack_1e4;
    fVar380 = fVar228 * ((float)local_200._0_4_ * fVar296 +
                        fVar225 * (float)local_520._0_4_ + fVar231 * (float)local_4a0._0_4_ +
                        (float)local_280._0_4_ * fVar273);
    fVar391 = fVar229 * ((float)local_200._4_4_ * fVar297 +
                        fVar226 * (float)local_520._4_4_ + fVar255 * (float)local_4a0._4_4_ +
                        (float)local_280._4_4_ * fVar274);
    local_aa0._4_4_ = fVar391;
    local_aa0._0_4_ = fVar380;
    fVar393 = fVar230 * (fStack_1f8 * fVar299 +
                        fVar227 * fStack_518 + fVar256 * fStack_498 + fStack_278 * fVar287);
    local_aa0._8_4_ = fVar393;
    fVar395 = fVar253 * (fStack_1f4 * fVar305 +
                        fVar232 * fStack_514 + fVar272 * fStack_494 + fStack_274 * fVar290);
    local_aa0._12_4_ = fVar395;
    fVar397 = fVar228 * (fStack_1f0 * fVar306 +
                        fVar251 * fStack_510 + fVar275 * fStack_490 + fStack_270 * fVar291);
    local_aa0._16_4_ = fVar397;
    fVar399 = fVar229 * (fStack_1ec * fVar307 +
                        fVar252 * fStack_50c + fVar276 * fStack_48c + fStack_26c * fVar293);
    local_aa0._20_4_ = fVar399;
    fVar401 = fVar230 * (fStack_1e8 * fVar308 +
                        fVar254 * fStack_508 + fVar277 * fStack_488 + fStack_268 * fVar294);
    local_aa0._24_4_ = fVar401;
    local_aa0._28_4_ = fStack_204;
    fVar231 = fVar228 * ((float)local_220._0_4_ * fVar296 +
                        fVar273 * (float)local_440._0_4_ +
                        fVar225 * (float)local_540._0_4_ + fVar231 * (float)local_4c0._0_4_);
    fVar273 = fVar229 * ((float)local_220._4_4_ * fVar297 +
                        fVar274 * (float)local_440._4_4_ +
                        fVar226 * (float)local_540._4_4_ + fVar255 * (float)local_4c0._4_4_);
    auVar43._4_4_ = fVar273;
    auVar43._0_4_ = fVar231;
    fVar274 = fVar230 * (fStack_218 * fVar299 +
                        fVar287 * fStack_438 + fVar227 * fStack_538 + fVar256 * fStack_4b8);
    auVar43._8_4_ = fVar274;
    fVar253 = fVar253 * (fStack_214 * fVar305 +
                        fVar290 * fStack_434 + fVar232 * fStack_534 + fVar272 * fStack_4b4);
    auVar43._12_4_ = fVar253;
    fVar228 = fVar228 * (fStack_210 * fVar306 +
                        fVar291 * fStack_430 + fVar251 * fStack_530 + fVar275 * fStack_4b0);
    auVar43._16_4_ = fVar228;
    fVar229 = fVar229 * (fStack_20c * fVar307 +
                        fVar293 * fStack_42c + fVar252 * fStack_52c + fVar276 * fStack_4ac);
    auVar43._20_4_ = fVar229;
    fVar230 = fVar230 * (fStack_208 * fVar308 +
                        fVar294 * fStack_428 + fVar254 * fStack_528 + fVar277 * fStack_4a8);
    auVar43._24_4_ = fVar230;
    auVar43._28_4_ = fVar288;
    auVar95._4_4_ = fVar328;
    auVar95._0_4_ = fVar312;
    auVar95._8_4_ = fVar333;
    auVar95._12_4_ = fVar338;
    auVar95._16_4_ = fVar343;
    auVar95._20_4_ = fVar347;
    auVar95._24_4_ = fVar351;
    auVar95._28_4_ = fVar355;
    auVar130 = vperm2f128_avx(auVar95,auVar95,1);
    auVar130 = vshufps_avx(auVar130,auVar95,0x30);
    auVar25 = vshufps_avx(auVar95,auVar130,0x29);
    auVar100._4_4_ = fVar329;
    auVar100._0_4_ = fVar313;
    auVar100._8_4_ = fVar334;
    auVar100._12_4_ = fVar339;
    auVar100._16_4_ = fStack_8f0;
    auVar100._20_4_ = fStack_8ec;
    auVar100._24_4_ = fStack_8e8;
    auVar100._28_4_ = fStack_8e4;
    auVar130 = vperm2f128_avx(auVar100,auVar100,1);
    auVar130 = vshufps_avx(auVar130,auVar100,0x30);
    local_940 = vshufps_avx(auVar100,auVar130,0x29);
    auVar168 = vsubps_avx(_local_b80,auVar43);
    auVar130 = vperm2f128_avx(auVar168,auVar168,1);
    auVar130 = vshufps_avx(auVar130,auVar168,0x30);
    auVar26 = vshufps_avx(auVar168,auVar130,0x29);
    local_320 = vsubps_avx(auVar25,auVar95);
    local_300 = vsubps_avx(local_940,auVar100);
    fVar225 = local_320._0_4_;
    fVar232 = local_320._4_4_;
    auVar44._4_4_ = fVar391 * fVar232;
    auVar44._0_4_ = fVar380 * fVar225;
    fVar255 = local_320._8_4_;
    auVar44._8_4_ = fVar393 * fVar255;
    fVar276 = local_320._12_4_;
    auVar44._12_4_ = fVar395 * fVar276;
    fVar293 = local_320._16_4_;
    auVar44._16_4_ = fVar397 * fVar293;
    fVar306 = local_320._20_4_;
    auVar44._20_4_ = fVar399 * fVar306;
    fVar327 = local_320._24_4_;
    auVar44._24_4_ = fVar401 * fVar327;
    auVar44._28_4_ = auVar168._28_4_;
    fVar226 = local_300._0_4_;
    fVar251 = local_300._4_4_;
    auVar45._4_4_ = fVar374 * fVar251;
    auVar45._0_4_ = fVar365 * fVar226;
    fVar256 = local_300._8_4_;
    auVar45._8_4_ = fVar375 * fVar256;
    fVar277 = local_300._12_4_;
    auVar45._12_4_ = fVar376 * fVar277;
    fVar294 = local_300._16_4_;
    auVar45._16_4_ = fVar377 * fVar294;
    fVar307 = local_300._20_4_;
    auVar45._20_4_ = fVar378 * fVar307;
    fVar332 = local_300._24_4_;
    auVar45._24_4_ = fVar379 * fVar332;
    auVar45._28_4_ = auVar130._28_4_;
    auVar24 = vsubps_avx(auVar45,auVar44);
    auVar97._4_4_ = fStack_91c;
    auVar97._0_4_ = local_920;
    auVar97._8_4_ = fStack_918;
    auVar97._12_4_ = fStack_914;
    auVar97._16_4_ = fStack_910;
    auVar97._20_4_ = fStack_90c;
    auVar97._24_4_ = fStack_908;
    auVar97._28_4_ = fStack_904;
    auVar130 = vperm2f128_avx(auVar97,auVar97,1);
    auVar130 = vshufps_avx(auVar130,auVar97,0x30);
    local_ac0 = vshufps_avx(auVar97,auVar130,0x29);
    local_340 = vsubps_avx(local_ac0,auVar97);
    auVar46._4_4_ = fVar330 * fVar251;
    auVar46._0_4_ = fVar314 * fVar226;
    auVar46._8_4_ = fVar335 * fVar256;
    auVar46._12_4_ = fVar340 * fVar277;
    auVar46._16_4_ = fVar344 * fVar294;
    auVar46._20_4_ = fVar348 * fVar307;
    auVar46._24_4_ = fVar352 * fVar332;
    auVar46._28_4_ = auVar130._28_4_;
    fVar227 = local_340._0_4_;
    fVar252 = local_340._4_4_;
    auVar47._4_4_ = fVar391 * fVar252;
    auVar47._0_4_ = fVar380 * fVar227;
    fVar272 = local_340._8_4_;
    auVar47._8_4_ = fVar393 * fVar272;
    fVar287 = local_340._12_4_;
    auVar47._12_4_ = fVar395 * fVar287;
    fVar296 = local_340._16_4_;
    auVar47._16_4_ = fVar397 * fVar296;
    fVar308 = local_340._20_4_;
    auVar47._20_4_ = fVar399 * fVar308;
    fVar337 = local_340._24_4_;
    auVar47._24_4_ = fVar401 * fVar337;
    auVar47._28_4_ = local_940._28_4_;
    auVar27 = vsubps_avx(auVar47,auVar46);
    auVar48._4_4_ = fVar374 * fVar252;
    auVar48._0_4_ = fVar365 * fVar227;
    auVar48._8_4_ = fVar375 * fVar272;
    auVar48._12_4_ = fVar376 * fVar287;
    auVar48._16_4_ = fVar377 * fVar296;
    auVar48._20_4_ = fVar378 * fVar308;
    auVar48._24_4_ = fVar379 * fVar337;
    auVar48._28_4_ = local_940._28_4_;
    auVar49._4_4_ = fVar330 * fVar232;
    auVar49._0_4_ = fVar314 * fVar225;
    auVar49._8_4_ = fVar335 * fVar255;
    auVar49._12_4_ = fVar340 * fVar276;
    auVar49._16_4_ = fVar344 * fVar293;
    auVar49._20_4_ = fVar348 * fVar306;
    auVar49._24_4_ = fVar352 * fVar327;
    auVar49._28_4_ = fVar364;
    auVar28 = vsubps_avx(auVar49,auVar48);
    fVar203 = auVar28._28_4_;
    fVar254 = auVar27._28_4_ + fVar203;
    auVar221._0_4_ = fVar227 * fVar227 + fVar225 * fVar225 + fVar226 * fVar226;
    auVar221._4_4_ = fVar252 * fVar252 + fVar232 * fVar232 + fVar251 * fVar251;
    auVar221._8_4_ = fVar272 * fVar272 + fVar255 * fVar255 + fVar256 * fVar256;
    auVar221._12_4_ = fVar287 * fVar287 + fVar276 * fVar276 + fVar277 * fVar277;
    auVar221._16_4_ = fVar296 * fVar296 + fVar293 * fVar293 + fVar294 * fVar294;
    auVar221._20_4_ = fVar308 * fVar308 + fVar306 * fVar306 + fVar307 * fVar307;
    auVar221._24_4_ = fVar337 * fVar337 + fVar327 * fVar327 + fVar332 * fVar332;
    auVar221._28_4_ = fVar203 + fVar203 + fVar254;
    auVar130 = vrcpps_avx(auVar221);
    fVar275 = auVar130._0_4_;
    fVar290 = auVar130._4_4_;
    auVar50._4_4_ = fVar290 * auVar221._4_4_;
    auVar50._0_4_ = fVar275 * auVar221._0_4_;
    fVar291 = auVar130._8_4_;
    auVar50._8_4_ = fVar291 * auVar221._8_4_;
    fVar297 = auVar130._12_4_;
    auVar50._12_4_ = fVar297 * auVar221._12_4_;
    fVar299 = auVar130._16_4_;
    auVar50._16_4_ = fVar299 * auVar221._16_4_;
    fVar305 = auVar130._20_4_;
    auVar50._20_4_ = fVar305 * auVar221._20_4_;
    fVar309 = auVar130._24_4_;
    auVar50._24_4_ = fVar309 * auVar221._24_4_;
    auVar50._28_4_ = fVar364;
    auVar406._8_4_ = 0x3f800000;
    auVar406._0_8_ = 0x3f8000003f800000;
    auVar406._12_4_ = 0x3f800000;
    auVar406._16_4_ = 0x3f800000;
    auVar406._20_4_ = 0x3f800000;
    auVar406._24_4_ = 0x3f800000;
    auVar406._28_4_ = 0x3f800000;
    auVar29 = vsubps_avx(auVar406,auVar50);
    fVar275 = auVar29._0_4_ * fVar275 + fVar275;
    fVar290 = auVar29._4_4_ * fVar290 + fVar290;
    fVar291 = auVar29._8_4_ * fVar291 + fVar291;
    fVar297 = auVar29._12_4_ * fVar297 + fVar297;
    fVar299 = auVar29._16_4_ * fVar299 + fVar299;
    fVar305 = auVar29._20_4_ * fVar305 + fVar305;
    fVar309 = auVar29._24_4_ * fVar309 + fVar309;
    auVar168 = vperm2f128_avx(auVar42,auVar42,1);
    auVar168 = vshufps_avx(auVar168,auVar42,0x30);
    local_980 = vshufps_avx(auVar42,auVar168,0x29);
    auVar168 = vperm2f128_avx(local_aa0,local_aa0,1);
    auVar168 = vshufps_avx(auVar168,local_aa0,0x30);
    local_7a0 = vshufps_avx(local_aa0,auVar168,0x29);
    fVar381 = local_7a0._0_4_;
    fVar392 = local_7a0._4_4_;
    auVar51._4_4_ = fVar392 * fVar232;
    auVar51._0_4_ = fVar381 * fVar225;
    fVar394 = local_7a0._8_4_;
    auVar51._8_4_ = fVar394 * fVar255;
    fVar396 = local_7a0._12_4_;
    auVar51._12_4_ = fVar396 * fVar276;
    fVar398 = local_7a0._16_4_;
    auVar51._16_4_ = fVar398 * fVar293;
    fVar400 = local_7a0._20_4_;
    auVar51._20_4_ = fVar400 * fVar306;
    fVar402 = local_7a0._24_4_;
    auVar51._24_4_ = fVar402 * fVar327;
    auVar51._28_4_ = auVar168._28_4_;
    fVar404 = local_980._0_4_;
    fVar410 = local_980._4_4_;
    auVar52._4_4_ = fVar410 * fVar251;
    auVar52._0_4_ = fVar404 * fVar226;
    fVar411 = local_980._8_4_;
    auVar52._8_4_ = fVar411 * fVar256;
    fVar412 = local_980._12_4_;
    auVar52._12_4_ = fVar412 * fVar277;
    fVar413 = local_980._16_4_;
    auVar52._16_4_ = fVar413 * fVar294;
    fVar414 = local_980._20_4_;
    auVar52._20_4_ = fVar414 * fVar307;
    fVar415 = local_980._24_4_;
    auVar52._24_4_ = fVar415 * fVar332;
    auVar52._28_4_ = uStack_1e4;
    auVar38 = vsubps_avx(auVar52,auVar51);
    auVar168 = vperm2f128_avx(auVar41,auVar41,1);
    auVar168 = vshufps_avx(auVar168,auVar41,0x30);
    local_9a0 = vshufps_avx(auVar41,auVar168,0x29);
    fVar315 = local_9a0._0_4_;
    fVar331 = local_9a0._4_4_;
    auVar53._4_4_ = fVar331 * fVar251;
    auVar53._0_4_ = fVar315 * fVar226;
    fVar336 = local_9a0._8_4_;
    auVar53._8_4_ = fVar336 * fVar256;
    fVar341 = local_9a0._12_4_;
    auVar53._12_4_ = fVar341 * fVar277;
    fVar345 = local_9a0._16_4_;
    auVar53._16_4_ = fVar345 * fVar294;
    fVar349 = local_9a0._20_4_;
    auVar53._20_4_ = fVar349 * fVar307;
    fVar353 = local_9a0._24_4_;
    auVar53._24_4_ = fVar353 * fVar332;
    auVar53._28_4_ = auVar168._28_4_;
    auVar54._4_4_ = fVar392 * fVar252;
    auVar54._0_4_ = fVar381 * fVar227;
    auVar54._8_4_ = fVar394 * fVar272;
    auVar54._12_4_ = fVar396 * fVar287;
    auVar54._16_4_ = fVar398 * fVar296;
    auVar54._20_4_ = fVar400 * fVar308;
    uVar112 = local_7a0._28_4_;
    auVar54._24_4_ = fVar402 * fVar337;
    auVar54._28_4_ = uVar112;
    auVar168 = vsubps_avx(auVar54,auVar53);
    auVar55._4_4_ = fVar410 * fVar252;
    auVar55._0_4_ = fVar404 * fVar227;
    auVar55._8_4_ = fVar411 * fVar272;
    auVar55._12_4_ = fVar412 * fVar287;
    auVar55._16_4_ = fVar413 * fVar296;
    auVar55._20_4_ = fVar414 * fVar308;
    auVar55._24_4_ = fVar415 * fVar337;
    auVar55._28_4_ = uVar112;
    auVar56._4_4_ = fVar331 * fVar232;
    auVar56._0_4_ = fVar315 * fVar225;
    auVar56._8_4_ = fVar336 * fVar255;
    auVar56._12_4_ = fVar341 * fVar276;
    auVar56._16_4_ = fVar345 * fVar293;
    auVar56._20_4_ = fVar349 * fVar306;
    auVar56._24_4_ = fVar353 * fVar327;
    auVar56._28_4_ = local_980._28_4_;
    auVar322 = vsubps_avx(auVar56,auVar55);
    fVar203 = auVar322._28_4_;
    fVar311 = auVar168._28_4_ + fVar203;
    auVar57._4_4_ =
         (auVar24._4_4_ * auVar24._4_4_ +
         auVar27._4_4_ * auVar27._4_4_ + auVar28._4_4_ * auVar28._4_4_) * fVar290;
    auVar57._0_4_ =
         (auVar24._0_4_ * auVar24._0_4_ +
         auVar27._0_4_ * auVar27._0_4_ + auVar28._0_4_ * auVar28._0_4_) * fVar275;
    auVar57._8_4_ =
         (auVar24._8_4_ * auVar24._8_4_ +
         auVar27._8_4_ * auVar27._8_4_ + auVar28._8_4_ * auVar28._8_4_) * fVar291;
    auVar57._12_4_ =
         (auVar24._12_4_ * auVar24._12_4_ +
         auVar27._12_4_ * auVar27._12_4_ + auVar28._12_4_ * auVar28._12_4_) * fVar297;
    auVar57._16_4_ =
         (auVar24._16_4_ * auVar24._16_4_ +
         auVar27._16_4_ * auVar27._16_4_ + auVar28._16_4_ * auVar28._16_4_) * fVar299;
    auVar57._20_4_ =
         (auVar24._20_4_ * auVar24._20_4_ +
         auVar27._20_4_ * auVar27._20_4_ + auVar28._20_4_ * auVar28._20_4_) * fVar305;
    auVar57._24_4_ =
         (auVar24._24_4_ * auVar24._24_4_ +
         auVar27._24_4_ * auVar27._24_4_ + auVar28._24_4_ * auVar28._24_4_) * fVar309;
    auVar57._28_4_ = auVar24._28_4_ + fVar254;
    auVar58._4_4_ =
         (auVar38._4_4_ * auVar38._4_4_ +
         auVar168._4_4_ * auVar168._4_4_ + auVar322._4_4_ * auVar322._4_4_) * fVar290;
    auVar58._0_4_ =
         (auVar38._0_4_ * auVar38._0_4_ +
         auVar168._0_4_ * auVar168._0_4_ + auVar322._0_4_ * auVar322._0_4_) * fVar275;
    auVar58._8_4_ =
         (auVar38._8_4_ * auVar38._8_4_ +
         auVar168._8_4_ * auVar168._8_4_ + auVar322._8_4_ * auVar322._8_4_) * fVar291;
    auVar58._12_4_ =
         (auVar38._12_4_ * auVar38._12_4_ +
         auVar168._12_4_ * auVar168._12_4_ + auVar322._12_4_ * auVar322._12_4_) * fVar297;
    auVar58._16_4_ =
         (auVar38._16_4_ * auVar38._16_4_ +
         auVar168._16_4_ * auVar168._16_4_ + auVar322._16_4_ * auVar322._16_4_) * fVar299;
    auVar58._20_4_ =
         (auVar38._20_4_ * auVar38._20_4_ +
         auVar168._20_4_ * auVar168._20_4_ + auVar322._20_4_ * auVar322._20_4_) * fVar305;
    auVar58._24_4_ =
         (auVar38._24_4_ * auVar38._24_4_ +
         auVar168._24_4_ * auVar168._24_4_ + auVar322._24_4_ * auVar322._24_4_) * fVar309;
    auVar58._28_4_ = auVar29._28_4_ + auVar130._28_4_;
    auVar130 = vmaxps_avx(auVar57,auVar58);
    auVar168 = vperm2f128_avx(_local_b80,_local_b80,1);
    auVar168 = vshufps_avx(auVar168,_local_b80,0x30);
    auVar27 = vshufps_avx(_local_b80,auVar168,0x29);
    auVar192._0_4_ = (float)local_b80._0_4_ + fVar231;
    auVar192._4_4_ = (float)local_b80._4_4_ + fVar273;
    auVar192._8_4_ = fStack_b78 + fVar274;
    auVar192._12_4_ = fStack_b74 + fVar253;
    auVar192._16_4_ = fStack_b70 + fVar228;
    auVar192._20_4_ = fStack_b6c + fVar229;
    auVar192._24_4_ = fStack_b68 + fVar230;
    auVar192._28_4_ = fStack_b64 + fVar288;
    auVar168 = vmaxps_avx(_local_b80,auVar192);
    auVar24 = vmaxps_avx(auVar26,auVar27);
    auVar168 = vmaxps_avx(auVar168,auVar24);
    auVar24 = vrsqrtps_avx(auVar221);
    fVar228 = auVar24._0_4_;
    fVar229 = auVar24._4_4_;
    fVar230 = auVar24._8_4_;
    fVar253 = auVar24._12_4_;
    fVar254 = auVar24._16_4_;
    fVar231 = auVar24._20_4_;
    fVar273 = auVar24._24_4_;
    auVar59._4_4_ = fVar229 * fVar229 * fVar229 * auVar221._4_4_ * 0.5;
    auVar59._0_4_ = fVar228 * fVar228 * fVar228 * auVar221._0_4_ * 0.5;
    auVar59._8_4_ = fVar230 * fVar230 * fVar230 * auVar221._8_4_ * 0.5;
    auVar59._12_4_ = fVar253 * fVar253 * fVar253 * auVar221._12_4_ * 0.5;
    auVar59._16_4_ = fVar254 * fVar254 * fVar254 * auVar221._16_4_ * 0.5;
    auVar59._20_4_ = fVar231 * fVar231 * fVar231 * auVar221._20_4_ * 0.5;
    auVar59._24_4_ = fVar273 * fVar273 * fVar273 * auVar221._24_4_ * 0.5;
    auVar59._28_4_ = auVar221._28_4_;
    auVar60._4_4_ = fVar229 * 1.5;
    auVar60._0_4_ = fVar228 * 1.5;
    auVar60._8_4_ = fVar230 * 1.5;
    auVar60._12_4_ = fVar253 * 1.5;
    auVar60._16_4_ = fVar254 * 1.5;
    auVar60._20_4_ = fVar231 * 1.5;
    auVar60._24_4_ = fVar273 * 1.5;
    auVar60._28_4_ = auVar24._28_4_;
    local_5a0 = vsubps_avx(auVar60,auVar59);
    auVar96._4_4_ = fVar328;
    auVar96._0_4_ = fVar312;
    auVar96._8_4_ = fVar333;
    auVar96._12_4_ = fVar338;
    auVar96._16_4_ = fVar343;
    auVar96._20_4_ = fVar347;
    auVar96._24_4_ = fVar351;
    auVar96._28_4_ = fVar355;
    local_7c0 = vsubps_avx(ZEXT832(0) << 0x20,auVar96);
    local_7e0 = vsubps_avx(ZEXT832(0) << 0x20,auVar100);
    fVar421 = local_7e0._0_4_;
    fVar426 = local_7e0._4_4_;
    fVar427 = local_7e0._8_4_;
    fVar428 = local_7e0._12_4_;
    fVar429 = local_7e0._16_4_;
    fVar430 = local_7e0._20_4_;
    fVar431 = local_7e0._24_4_;
    fVar228 = local_7c0._0_4_;
    fVar253 = local_7c0._4_4_;
    fVar273 = local_7c0._8_4_;
    fVar288 = local_7c0._12_4_;
    fVar297 = local_7c0._16_4_;
    fVar309 = local_7c0._20_4_;
    fVar342 = local_7c0._24_4_;
    auVar322 = ZEXT832(0) << 0x20;
    auVar28 = vsubps_avx(auVar322,auVar97);
    fVar229 = auVar28._0_4_;
    fVar254 = auVar28._4_4_;
    fVar274 = auVar28._8_4_;
    fVar290 = auVar28._12_4_;
    fVar299 = auVar28._16_4_;
    fVar310 = auVar28._20_4_;
    fVar346 = auVar28._24_4_;
    auVar359._0_4_ = local_680 * fVar229 + local_800 * fVar228 + fVar421 * local_820;
    auVar359._4_4_ = fStack_67c * fVar254 + fStack_7fc * fVar253 + fVar426 * fStack_81c;
    auVar359._8_4_ = fStack_678 * fVar274 + fStack_7f8 * fVar273 + fVar427 * fStack_818;
    auVar359._12_4_ = fStack_674 * fVar290 + fStack_7f4 * fVar288 + fVar428 * fStack_814;
    auVar359._16_4_ = fStack_670 * fVar299 + fStack_7f0 * fVar297 + fVar429 * fStack_810;
    auVar359._20_4_ = fStack_66c * fVar310 + fStack_7ec * fVar309 + fVar430 * fStack_80c;
    auVar359._24_4_ = fStack_668 * fVar346 + fStack_7e8 * fVar342 + fVar431 * fStack_808;
    auVar359._28_4_ = fVar311 + auVar38._28_4_ + fVar311 + auVar24._28_4_;
    auVar369._0_4_ = fVar229 * fVar229 + fVar228 * fVar228 + fVar421 * fVar421;
    auVar369._4_4_ = fVar254 * fVar254 + fVar253 * fVar253 + fVar426 * fVar426;
    auVar369._8_4_ = fVar274 * fVar274 + fVar273 * fVar273 + fVar427 * fVar427;
    auVar369._12_4_ = fVar290 * fVar290 + fVar288 * fVar288 + fVar428 * fVar428;
    auVar369._16_4_ = fVar299 * fVar299 + fVar297 * fVar297 + fVar429 * fVar429;
    auVar369._20_4_ = fVar310 * fVar310 + fVar309 * fVar309 + fVar430 * fVar430;
    auVar369._24_4_ = fVar346 * fVar346 + fVar342 * fVar342 + fVar431 * fVar431;
    auVar369._28_4_ = fVar203 + fVar203 + fVar311;
    fVar230 = local_5a0._0_4_;
    fVar231 = local_5a0._4_4_;
    fVar275 = local_5a0._8_4_;
    fVar291 = local_5a0._12_4_;
    fVar305 = local_5a0._16_4_;
    fVar311 = local_5a0._20_4_;
    fVar350 = local_5a0._24_4_;
    fVar354 = local_300._28_4_;
    local_5c0 = local_680 * fVar230 * fVar227 +
                fVar225 * fVar230 * local_800 + fVar230 * fVar226 * local_820;
    fStack_5bc = fStack_67c * fVar231 * fVar252 +
                 fVar232 * fVar231 * fStack_7fc + fVar231 * fVar251 * fStack_81c;
    fStack_5b8 = fStack_678 * fVar275 * fVar272 +
                 fVar255 * fVar275 * fStack_7f8 + fVar275 * fVar256 * fStack_818;
    fStack_5b4 = fStack_674 * fVar291 * fVar287 +
                 fVar276 * fVar291 * fStack_7f4 + fVar291 * fVar277 * fStack_814;
    fStack_5b0 = fStack_670 * fVar305 * fVar296 +
                 fVar293 * fVar305 * fStack_7f0 + fVar305 * fVar294 * fStack_810;
    fStack_5ac = fStack_66c * fVar311 * fVar308 +
                 fVar306 * fVar311 * fStack_7ec + fVar311 * fVar307 * fStack_80c;
    fStack_5a8 = fStack_668 * fVar350 * fVar337 +
                 fVar327 * fVar350 * fStack_7e8 + fVar350 * fVar332 * fStack_808;
    fVar203 = fStack_664 + fVar354 + fStack_804;
    auVar407._0_4_ =
         fVar229 * fVar230 * fVar227 + fVar225 * fVar230 * fVar228 + fVar421 * fVar230 * fVar226;
    auVar407._4_4_ =
         fVar254 * fVar231 * fVar252 + fVar232 * fVar231 * fVar253 + fVar426 * fVar231 * fVar251;
    auVar407._8_4_ =
         fVar274 * fVar275 * fVar272 + fVar255 * fVar275 * fVar273 + fVar427 * fVar275 * fVar256;
    auVar407._12_4_ =
         fVar290 * fVar291 * fVar287 + fVar276 * fVar291 * fVar288 + fVar428 * fVar291 * fVar277;
    auVar407._16_4_ =
         fVar299 * fVar305 * fVar296 + fVar293 * fVar305 * fVar297 + fVar429 * fVar305 * fVar294;
    auVar407._20_4_ =
         fVar310 * fVar311 * fVar308 + fVar306 * fVar311 * fVar309 + fVar430 * fVar311 * fVar307;
    auVar407._24_4_ =
         fVar346 * fVar350 * fVar337 + fVar327 * fVar350 * fVar342 + fVar431 * fVar350 * fVar332;
    auVar407._28_4_ = fVar354 + fVar203;
    auVar61._4_4_ = fStack_5bc * auVar407._4_4_;
    auVar61._0_4_ = local_5c0 * auVar407._0_4_;
    auVar61._8_4_ = fStack_5b8 * auVar407._8_4_;
    auVar61._12_4_ = fStack_5b4 * auVar407._12_4_;
    auVar61._16_4_ = fStack_5b0 * auVar407._16_4_;
    auVar61._20_4_ = fStack_5ac * auVar407._20_4_;
    auVar61._24_4_ = fStack_5a8 * auVar407._24_4_;
    auVar61._28_4_ = fVar203;
    auVar24 = vsubps_avx(auVar359,auVar61);
    auVar62._4_4_ = auVar407._4_4_ * auVar407._4_4_;
    auVar62._0_4_ = auVar407._0_4_ * auVar407._0_4_;
    auVar62._8_4_ = auVar407._8_4_ * auVar407._8_4_;
    auVar62._12_4_ = auVar407._12_4_ * auVar407._12_4_;
    auVar62._16_4_ = auVar407._16_4_ * auVar407._16_4_;
    auVar62._20_4_ = auVar407._20_4_ * auVar407._20_4_;
    auVar62._24_4_ = auVar407._24_4_ * auVar407._24_4_;
    auVar62._28_4_ = fVar354;
    auVar29 = vsubps_avx(auVar369,auVar62);
    local_2e0 = vsqrtps_avx(auVar130);
    fVar203 = (local_2e0._0_4_ + auVar168._0_4_) * 1.0000002;
    fVar363 = (local_2e0._4_4_ + auVar168._4_4_) * 1.0000002;
    fVar403 = (local_2e0._8_4_ + auVar168._8_4_) * 1.0000002;
    fVar146 = (local_2e0._12_4_ + auVar168._12_4_) * 1.0000002;
    fVar147 = (local_2e0._16_4_ + auVar168._16_4_) * 1.0000002;
    fVar148 = (local_2e0._20_4_ + auVar168._20_4_) * 1.0000002;
    fVar149 = (local_2e0._24_4_ + auVar168._24_4_) * 1.0000002;
    auVar63._4_4_ = fVar363 * fVar363;
    auVar63._0_4_ = fVar203 * fVar203;
    auVar63._8_4_ = fVar403 * fVar403;
    auVar63._12_4_ = fVar146 * fVar146;
    auVar63._16_4_ = fVar147 * fVar147;
    auVar63._20_4_ = fVar148 * fVar148;
    auVar63._24_4_ = fVar149 * fVar149;
    auVar63._28_4_ = local_2e0._28_4_ + auVar168._28_4_;
    auVar360._0_4_ = auVar24._0_4_ + auVar24._0_4_;
    auVar360._4_4_ = auVar24._4_4_ + auVar24._4_4_;
    auVar360._8_4_ = auVar24._8_4_ + auVar24._8_4_;
    auVar360._12_4_ = auVar24._12_4_ + auVar24._12_4_;
    auVar360._16_4_ = auVar24._16_4_ + auVar24._16_4_;
    auVar360._20_4_ = auVar24._20_4_ + auVar24._20_4_;
    auVar360._24_4_ = auVar24._24_4_ + auVar24._24_4_;
    fVar203 = auVar24._28_4_;
    auVar360._28_4_ = fVar203 + fVar203;
    auVar168 = vsubps_avx(auVar29,auVar63);
    auVar64._4_4_ = fStack_5bc * fStack_5bc;
    auVar64._0_4_ = local_5c0 * local_5c0;
    auVar64._8_4_ = fStack_5b8 * fStack_5b8;
    auVar64._12_4_ = fStack_5b4 * fStack_5b4;
    auVar64._16_4_ = fStack_5b0 * fStack_5b0;
    auVar64._20_4_ = fStack_5ac * fStack_5ac;
    auVar64._24_4_ = fStack_5a8 * fStack_5a8;
    auVar64._28_4_ = fVar203;
    auVar304 = ZEXT3264(local_2a0);
    auVar24 = vsubps_avx(local_2a0,auVar64);
    auVar65._4_4_ = auVar360._4_4_ * auVar360._4_4_;
    auVar65._0_4_ = auVar360._0_4_ * auVar360._0_4_;
    auVar65._8_4_ = auVar360._8_4_ * auVar360._8_4_;
    auVar65._12_4_ = auVar360._12_4_ * auVar360._12_4_;
    auVar65._16_4_ = auVar360._16_4_ * auVar360._16_4_;
    auVar65._20_4_ = auVar360._20_4_ * auVar360._20_4_;
    auVar65._24_4_ = auVar360._24_4_ * auVar360._24_4_;
    auVar65._28_4_ = auVar29._28_4_;
    fVar203 = auVar24._0_4_;
    local_2c0 = fVar203 * 4.0;
    fVar363 = auVar24._4_4_;
    fStack_2bc = fVar363 * 4.0;
    fVar403 = auVar24._8_4_;
    fStack_2b8 = fVar403 * 4.0;
    fVar146 = auVar24._12_4_;
    fStack_2b4 = fVar146 * 4.0;
    fVar147 = auVar24._16_4_;
    fStack_2b0 = fVar147 * 4.0;
    fVar148 = auVar24._20_4_;
    fStack_2ac = fVar148 * 4.0;
    fVar149 = auVar24._24_4_;
    fStack_2a8 = fVar149 * 4.0;
    uStack_2a4 = 0x40800000;
    auVar66._4_4_ = auVar168._4_4_ * fStack_2bc;
    auVar66._0_4_ = auVar168._0_4_ * local_2c0;
    auVar66._8_4_ = auVar168._8_4_ * fStack_2b8;
    auVar66._12_4_ = auVar168._12_4_ * fStack_2b4;
    auVar66._16_4_ = auVar168._16_4_ * fStack_2b0;
    auVar66._20_4_ = auVar168._20_4_ * fStack_2ac;
    auVar66._24_4_ = auVar168._24_4_ * fStack_2a8;
    auVar66._28_4_ = 0x40800000;
    auVar38 = vsubps_avx(auVar65,auVar66);
    auVar130 = vcmpps_avx(auVar38,auVar322,5);
    auVar164._8_4_ = 0x7fffffff;
    auVar164._0_8_ = 0x7fffffff7fffffff;
    auVar164._12_4_ = 0x7fffffff;
    auVar164._16_4_ = 0x7fffffff;
    auVar164._20_4_ = 0x7fffffff;
    auVar164._24_4_ = 0x7fffffff;
    auVar164._28_4_ = 0x7fffffff;
    local_400 = vandps_avx(auVar64,auVar164);
    local_380._0_4_ = fVar203 + fVar203;
    local_380._4_4_ = fVar363 + fVar363;
    local_380._8_4_ = fVar403 + fVar403;
    local_380._12_4_ = fVar146 + fVar146;
    local_380._16_4_ = fVar147 + fVar147;
    local_380._20_4_ = fVar148 + fVar148;
    local_380._24_4_ = fVar149 + fVar149;
    local_380._28_4_ = auVar24._28_4_ + auVar24._28_4_;
    local_960 = vandps_avx(auVar24,auVar164);
    uVar106 = CONCAT44(auVar360._4_4_,auVar360._0_4_);
    local_360._0_8_ = uVar106 ^ 0x8000000080000000;
    local_360._8_4_ = -auVar360._8_4_;
    local_360._12_4_ = -auVar360._12_4_;
    local_360._16_4_ = -auVar360._16_4_;
    local_360._20_4_ = -auVar360._20_4_;
    local_360._24_4_ = -auVar360._24_4_;
    local_360._28_4_ = -auVar360._28_4_;
    if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar130 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar130 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar130 >> 0x7f,0) == '\0') &&
          (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar130 >> 0xbf,0) == '\0') &&
        (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar130[0x1f])
    {
      auVar361._8_4_ = 0x7f800000;
      auVar361._0_8_ = 0x7f8000007f800000;
      auVar361._12_4_ = 0x7f800000;
      auVar361._16_4_ = 0x7f800000;
      auVar361._20_4_ = 0x7f800000;
      auVar361._24_4_ = 0x7f800000;
      auVar361._28_4_ = 0x7f800000;
      auVar138._8_4_ = 0xff800000;
      auVar138._0_8_ = 0xff800000ff800000;
      auVar138._12_4_ = 0xff800000;
      auVar138._16_4_ = 0xff800000;
      auVar138._20_4_ = 0xff800000;
      auVar138._24_4_ = 0xff800000;
      auVar138._28_4_ = 0xff800000;
    }
    else {
      auVar131 = vsqrtps_avx(auVar38);
      auVar323 = vrcpps_avx(local_380);
      auVar304 = ZEXT864(0) << 0x20;
      auVar24 = vcmpps_avx(auVar38,auVar322,5);
      fVar203 = auVar323._0_4_;
      fVar363 = auVar323._4_4_;
      auVar67._4_4_ = local_380._4_4_ * fVar363;
      auVar67._0_4_ = local_380._0_4_ * fVar203;
      fVar403 = auVar323._8_4_;
      auVar67._8_4_ = local_380._8_4_ * fVar403;
      fVar146 = auVar323._12_4_;
      auVar67._12_4_ = local_380._12_4_ * fVar146;
      fVar147 = auVar323._16_4_;
      auVar67._16_4_ = local_380._16_4_ * fVar147;
      fVar148 = auVar323._20_4_;
      auVar67._20_4_ = local_380._20_4_ * fVar148;
      fVar149 = auVar323._24_4_;
      auVar67._24_4_ = local_380._24_4_ * fVar149;
      auVar67._28_4_ = auVar38._28_4_;
      auVar165._8_4_ = 0x3f800000;
      auVar165._0_8_ = 0x3f8000003f800000;
      auVar165._12_4_ = 0x3f800000;
      auVar165._16_4_ = 0x3f800000;
      auVar165._20_4_ = 0x3f800000;
      auVar165._24_4_ = 0x3f800000;
      auVar165._28_4_ = 0x3f800000;
      auVar38 = vsubps_avx(auVar165,auVar67);
      fVar203 = fVar203 + fVar203 * auVar38._0_4_;
      fVar363 = fVar363 + fVar363 * auVar38._4_4_;
      fVar403 = fVar403 + fVar403 * auVar38._8_4_;
      fVar146 = fVar146 + fVar146 * auVar38._12_4_;
      fVar147 = fVar147 + fVar147 * auVar38._16_4_;
      fVar148 = fVar148 + fVar148 * auVar38._20_4_;
      fVar149 = fVar149 + fVar149 * auVar38._24_4_;
      auVar322 = vsubps_avx(local_360,auVar131);
      fVar278 = auVar322._0_4_ * fVar203;
      fVar285 = auVar322._4_4_ * fVar363;
      auVar68._4_4_ = fVar285;
      auVar68._0_4_ = fVar278;
      fVar286 = auVar322._8_4_ * fVar403;
      auVar68._8_4_ = fVar286;
      fVar289 = auVar322._12_4_ * fVar146;
      auVar68._12_4_ = fVar289;
      fVar292 = auVar322._16_4_ * fVar147;
      auVar68._16_4_ = fVar292;
      fVar295 = auVar322._20_4_ * fVar148;
      auVar68._20_4_ = fVar295;
      fVar298 = auVar322._24_4_ * fVar149;
      auVar68._24_4_ = fVar298;
      auVar68._28_4_ = auVar322._28_4_;
      auVar322 = vsubps_avx(auVar131,auVar360);
      fVar203 = auVar322._0_4_ * fVar203;
      fVar363 = auVar322._4_4_ * fVar363;
      auVar69._4_4_ = fVar363;
      auVar69._0_4_ = fVar203;
      fVar403 = auVar322._8_4_ * fVar403;
      auVar69._8_4_ = fVar403;
      fVar146 = auVar322._12_4_ * fVar146;
      auVar69._12_4_ = fVar146;
      fVar147 = auVar322._16_4_ * fVar147;
      auVar69._16_4_ = fVar147;
      fVar148 = auVar322._20_4_ * fVar148;
      auVar69._20_4_ = fVar148;
      fVar149 = auVar322._24_4_ * fVar149;
      auVar69._24_4_ = fVar149;
      auVar69._28_4_ = auVar323._28_4_ + auVar38._28_4_;
      local_3e0 = fVar230 * (auVar407._0_4_ + local_5c0 * fVar278);
      fStack_3dc = fVar231 * (auVar407._4_4_ + fStack_5bc * fVar285);
      fStack_3d8 = fVar275 * (auVar407._8_4_ + fStack_5b8 * fVar286);
      fStack_3d4 = fVar291 * (auVar407._12_4_ + fStack_5b4 * fVar289);
      fStack_3d0 = fVar305 * (auVar407._16_4_ + fStack_5b0 * fVar292);
      fStack_3cc = fVar311 * (auVar407._20_4_ + fStack_5ac * fVar295);
      fStack_3c8 = fVar350 * (auVar407._24_4_ + fStack_5a8 * fVar298);
      uStack_3c4 = 0x3f800000;
      local_3c0 = fVar230 * (auVar407._0_4_ + local_5c0 * fVar203);
      fStack_3bc = fVar231 * (auVar407._4_4_ + fStack_5bc * fVar363);
      fStack_3b8 = fVar275 * (auVar407._8_4_ + fStack_5b8 * fVar403);
      fStack_3b4 = fVar291 * (auVar407._12_4_ + fStack_5b4 * fVar146);
      fStack_3b0 = fVar305 * (auVar407._16_4_ + fStack_5b0 * fVar147);
      fStack_3ac = fVar311 * (auVar407._20_4_ + fStack_5ac * fVar148);
      fStack_3a8 = fVar350 * (auVar407._24_4_ + fStack_5a8 * fVar149);
      uStack_3a4 = 0x3f800000;
      auVar262._8_4_ = 0x7f800000;
      auVar262._0_8_ = 0x7f8000007f800000;
      auVar262._12_4_ = 0x7f800000;
      auVar262._16_4_ = 0x7f800000;
      auVar262._20_4_ = 0x7f800000;
      auVar262._24_4_ = 0x7f800000;
      auVar262._28_4_ = 0x7f800000;
      auVar361 = vblendvps_avx(auVar262,auVar68,auVar24);
      auVar263._8_4_ = 0xff800000;
      auVar263._0_8_ = 0xff800000ff800000;
      auVar263._12_4_ = 0xff800000;
      auVar263._16_4_ = 0xff800000;
      auVar263._20_4_ = 0xff800000;
      auVar263._24_4_ = 0xff800000;
      auVar263._28_4_ = 0xff800000;
      auVar138 = vblendvps_avx(auVar263,auVar69,auVar24);
      auVar38 = vmaxps_avx(local_580,local_400);
      auVar70._4_4_ = auVar38._4_4_ * 1.9073486e-06;
      auVar70._0_4_ = auVar38._0_4_ * 1.9073486e-06;
      auVar70._8_4_ = auVar38._8_4_ * 1.9073486e-06;
      auVar70._12_4_ = auVar38._12_4_ * 1.9073486e-06;
      auVar70._16_4_ = auVar38._16_4_ * 1.9073486e-06;
      auVar70._20_4_ = auVar38._20_4_ * 1.9073486e-06;
      auVar70._24_4_ = auVar38._24_4_ * 1.9073486e-06;
      auVar70._28_4_ = auVar38._28_4_;
      auVar38 = vcmpps_avx(local_960,auVar70,1);
      auVar322 = auVar24 & auVar38;
      if ((((((((auVar322 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar322 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar322 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar322 >> 0x7f,0) != '\0') ||
            (auVar322 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar322 >> 0xbf,0) != '\0') ||
          (auVar322 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar322[0x1f] < '\0') {
        auVar130 = vandps_avx(auVar38,auVar24);
        auVar209 = vpackssdw_avx(auVar130._0_16_,auVar130._16_16_);
        auVar38 = vcmpps_avx(auVar168,ZEXT832(0) << 0x20,2);
        auVar326._8_4_ = 0xff800000;
        auVar326._0_8_ = 0xff800000ff800000;
        auVar326._12_4_ = 0xff800000;
        auVar326._16_4_ = 0xff800000;
        auVar326._20_4_ = 0xff800000;
        auVar326._24_4_ = 0xff800000;
        auVar326._28_4_ = 0xff800000;
        auVar389._8_4_ = 0x7f800000;
        auVar389._0_8_ = 0x7f8000007f800000;
        auVar389._12_4_ = 0x7f800000;
        auVar389._16_4_ = 0x7f800000;
        auVar389._20_4_ = 0x7f800000;
        auVar389._24_4_ = 0x7f800000;
        auVar389._28_4_ = 0x7f800000;
        auVar168 = vblendvps_avx(auVar389,auVar326,auVar38);
        auVar31 = vpmovsxwd_avx(auVar209);
        auVar209 = vpunpckhwd_avx(auVar209,auVar209);
        auVar270._16_16_ = auVar209;
        auVar270._0_16_ = auVar31;
        auVar361 = vblendvps_avx(auVar361,auVar168,auVar270);
        auVar168 = vblendvps_avx(auVar326,auVar389,auVar38);
        auVar304 = ZEXT3264(auVar168);
        auVar138 = vblendvps_avx(auVar138,auVar168,auVar270);
        auVar198._0_8_ = auVar130._0_8_ ^ 0xffffffffffffffff;
        auVar198._8_4_ = auVar130._8_4_ ^ 0xffffffff;
        auVar198._12_4_ = auVar130._12_4_ ^ 0xffffffff;
        auVar198._16_4_ = auVar130._16_4_ ^ 0xffffffff;
        auVar198._20_4_ = auVar130._20_4_ ^ 0xffffffff;
        auVar198._24_4_ = auVar130._24_4_ ^ 0xffffffff;
        auVar198._28_4_ = auVar130._28_4_ ^ 0xffffffff;
        auVar130 = vorps_avx(auVar38,auVar198);
        auVar130 = vandps_avx(auVar24,auVar130);
      }
    }
    auVar388._4_4_ = fStack_81c;
    auVar388._0_4_ = local_820;
    auVar388._8_4_ = fStack_818;
    auVar388._12_4_ = fStack_814;
    auVar388._16_4_ = fStack_810;
    auVar388._20_4_ = fStack_80c;
    auVar388._24_4_ = fStack_808;
    auVar388._28_4_ = fStack_804;
    auVar38 = local_560 & auVar130;
    auVar408 = auVar407;
    auVar168 = local_960;
    auVar24 = local_400;
    if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar38 >> 0x7f,0) == '\0') &&
          (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar38 >> 0xbf,0) == '\0') &&
        (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar38[0x1f]) {
LAB_00acc5a4:
      auVar390 = ZEXT3264(auVar388);
      auVar373 = ZEXT3264(auVar24);
      auVar362 = ZEXT3264(auVar361);
      auVar284 = ZEXT3264(auVar168);
      auVar409 = ZEXT3264(auVar408);
      auVar271 = ZEXT3264(local_560);
    }
    else {
      fStack_5a4 = fStack_664 + fVar354 + fStack_804;
      auVar209 = ZEXT416((uint)((ray->org).field_0.m128[3] - (float)local_880._0_4_));
      auVar209 = vshufps_avx(auVar209,auVar209,0);
      auVar264._16_16_ = auVar209;
      auVar264._0_16_ = auVar209;
      auVar38 = vmaxps_avx(auVar264,auVar361);
      auVar209 = ZEXT416((uint)(ray->tfar - (float)local_880._0_4_));
      auVar209 = vshufps_avx(auVar209,auVar209,0);
      auVar265._16_16_ = auVar209;
      auVar265._0_16_ = auVar209;
      auVar322 = vminps_avx(auVar265,auVar138);
      fVar149 = auVar28._28_4_;
      auVar361._4_4_ = fStack_67c;
      auVar361._0_4_ = local_680;
      auVar361._8_4_ = fStack_678;
      auVar361._12_4_ = fStack_674;
      auVar361._16_4_ = fStack_670;
      auVar361._20_4_ = fStack_66c;
      auVar361._24_4_ = fStack_668;
      auVar361._28_4_ = fStack_664;
      auVar166._0_4_ = local_680 * fVar314 + local_800 * fVar365 + local_820 * fVar380;
      auVar166._4_4_ = fStack_67c * fVar330 + fStack_7fc * fVar374 + fStack_81c * fVar391;
      auVar166._8_4_ = fStack_678 * fVar335 + fStack_7f8 * fVar375 + fStack_818 * fVar393;
      auVar166._12_4_ = fStack_674 * fVar340 + fStack_7f4 * fVar376 + fStack_814 * fVar395;
      auVar166._16_4_ = fStack_670 * fVar344 + fStack_7f0 * fVar377 + fStack_810 * fVar397;
      auVar166._20_4_ = fStack_66c * fVar348 + fStack_7ec * fVar378 + fStack_80c * fVar399;
      auVar166._24_4_ = fStack_668 * fVar352 + fStack_7e8 * fVar379 + fStack_808 * fVar401;
      auVar166._28_4_ = fVar149 + fVar149 + fStack_204;
      auVar168 = vrcpps_avx(auVar166);
      fVar203 = auVar168._0_4_;
      fVar354 = auVar168._4_4_;
      auVar71._4_4_ = auVar166._4_4_ * fVar354;
      auVar71._0_4_ = auVar166._0_4_ * fVar203;
      fVar363 = auVar168._8_4_;
      auVar71._8_4_ = auVar166._8_4_ * fVar363;
      fVar403 = auVar168._12_4_;
      auVar71._12_4_ = auVar166._12_4_ * fVar403;
      fVar146 = auVar168._16_4_;
      auVar71._16_4_ = auVar166._16_4_ * fVar146;
      fVar147 = auVar168._20_4_;
      auVar71._20_4_ = auVar166._20_4_ * fVar147;
      fVar148 = auVar168._24_4_;
      auVar71._24_4_ = auVar166._24_4_ * fVar148;
      auVar71._28_4_ = fStack_8e4 + fVar364;
      auVar418._8_4_ = 0x3f800000;
      auVar418._0_8_ = 0x3f8000003f800000;
      auVar418._12_4_ = 0x3f800000;
      auVar418._16_4_ = 0x3f800000;
      auVar418._20_4_ = 0x3f800000;
      auVar418._24_4_ = 0x3f800000;
      auVar418._28_4_ = 0x3f800000;
      auVar24 = vsubps_avx(auVar418,auVar71);
      auVar303._8_4_ = 0x7fffffff;
      auVar303._0_8_ = 0x7fffffff7fffffff;
      auVar303._12_4_ = 0x7fffffff;
      auVar303._16_4_ = 0x7fffffff;
      auVar303._20_4_ = 0x7fffffff;
      auVar303._24_4_ = 0x7fffffff;
      auVar303._28_4_ = 0x7fffffff;
      auVar168 = vandps_avx(auVar166,auVar303);
      auVar370._8_4_ = 0x219392ef;
      auVar370._0_8_ = 0x219392ef219392ef;
      auVar370._12_4_ = 0x219392ef;
      auVar370._16_4_ = 0x219392ef;
      auVar370._20_4_ = 0x219392ef;
      auVar370._24_4_ = 0x219392ef;
      auVar370._28_4_ = 0x219392ef;
      auVar168 = vcmpps_avx(auVar168,auVar370,1);
      auVar388._8_4_ = 0x80000000;
      auVar388._0_8_ = 0x8000000080000000;
      auVar388._12_4_ = 0x80000000;
      auVar388._16_4_ = 0x80000000;
      auVar388._20_4_ = 0x80000000;
      auVar388._24_4_ = 0x80000000;
      auVar388._28_4_ = 0x80000000;
      auVar72._4_4_ =
           (fVar354 + fVar354 * auVar24._4_4_) *
           -(fVar330 * fVar254 + fVar374 * fVar253 + fVar391 * fVar426);
      auVar72._0_4_ =
           (fVar203 + fVar203 * auVar24._0_4_) *
           -(fVar314 * fVar229 + fVar365 * fVar228 + fVar380 * fVar421);
      auVar72._8_4_ =
           (fVar363 + fVar363 * auVar24._8_4_) *
           -(fVar335 * fVar274 + fVar375 * fVar273 + fVar393 * fVar427);
      auVar72._12_4_ =
           (fVar403 + fVar403 * auVar24._12_4_) *
           -(fVar340 * fVar290 + fVar376 * fVar288 + fVar395 * fVar428);
      auVar72._16_4_ =
           (fVar146 + fVar146 * auVar24._16_4_) *
           -(fVar344 * fVar299 + fVar377 * fVar297 + fVar397 * fVar429);
      auVar72._20_4_ =
           (fVar147 + fVar147 * auVar24._20_4_) *
           -(fVar348 * fVar310 + fVar378 * fVar309 + fVar399 * fVar430);
      auVar72._24_4_ =
           (fVar148 + fVar148 * auVar24._24_4_) *
           -(fVar352 * fVar346 + fVar379 * fVar342 + fVar401 * fVar431);
      auVar72._28_4_ = -(fVar149 + local_380._28_4_ + auVar209._12_4_);
      auVar24 = vcmpps_avx(auVar166,ZEXT832(0) << 0x20,1);
      auVar28 = vorps_avx(auVar168,auVar24);
      auVar24 = vcmpps_avx(auVar166,ZEXT832(0) << 0x20,6);
      auVar24 = vorps_avx(auVar168,auVar24);
      auVar408._8_4_ = 0xff800000;
      auVar408._0_8_ = 0xff800000ff800000;
      auVar408._12_4_ = 0xff800000;
      auVar408._16_4_ = 0xff800000;
      auVar408._20_4_ = 0xff800000;
      auVar408._24_4_ = 0xff800000;
      auVar408._28_4_ = 0xff800000;
      auVar168 = vblendvps_avx(auVar72,auVar408,auVar28);
      auVar425._8_4_ = 0x7f800000;
      auVar425._0_8_ = 0x7f8000007f800000;
      auVar425._12_4_ = 0x7f800000;
      auVar425._16_4_ = 0x7f800000;
      auVar425._20_4_ = 0x7f800000;
      auVar425._24_4_ = 0x7f800000;
      auVar425._28_4_ = 0x7f800000;
      auVar24 = vblendvps_avx(auVar72,auVar425,auVar24);
      auVar28 = vmaxps_avx(auVar38,auVar168);
      auVar24 = vminps_avx(auVar322,auVar24);
      auVar323 = ZEXT832(0) << 0x20;
      auVar168 = vsubps_avx(auVar323,auVar25);
      auVar25 = vsubps_avx(auVar323,local_940);
      auVar73._4_4_ = auVar25._4_4_ * -fVar392;
      auVar73._0_4_ = auVar25._0_4_ * -fVar381;
      auVar73._8_4_ = auVar25._8_4_ * -fVar394;
      auVar73._12_4_ = auVar25._12_4_ * -fVar396;
      auVar73._16_4_ = auVar25._16_4_ * -fVar398;
      auVar73._20_4_ = auVar25._20_4_ * -fVar400;
      auVar73._24_4_ = auVar25._24_4_ * -fVar402;
      auVar73._28_4_ = auVar25._28_4_;
      auVar74._4_4_ = fVar410 * auVar168._4_4_;
      auVar74._0_4_ = fVar404 * auVar168._0_4_;
      auVar74._8_4_ = fVar411 * auVar168._8_4_;
      auVar74._12_4_ = fVar412 * auVar168._12_4_;
      auVar74._16_4_ = fVar413 * auVar168._16_4_;
      auVar74._20_4_ = fVar414 * auVar168._20_4_;
      auVar74._24_4_ = fVar415 * auVar168._24_4_;
      auVar74._28_4_ = auVar168._28_4_;
      auVar168 = vsubps_avx(auVar73,auVar74);
      auVar25 = vsubps_avx(auVar323,local_ac0);
      auVar75._4_4_ = fVar331 * auVar25._4_4_;
      auVar75._0_4_ = fVar315 * auVar25._0_4_;
      auVar75._8_4_ = fVar336 * auVar25._8_4_;
      auVar75._12_4_ = fVar341 * auVar25._12_4_;
      auVar75._16_4_ = fVar345 * auVar25._16_4_;
      auVar75._20_4_ = fVar349 * auVar25._20_4_;
      uVar7 = auVar25._28_4_;
      auVar75._24_4_ = fVar353 * auVar25._24_4_;
      auVar75._28_4_ = uVar7;
      auVar25 = vsubps_avx(auVar168,auVar75);
      auVar76._4_4_ = fStack_81c * -fVar392;
      auVar76._0_4_ = local_820 * -fVar381;
      auVar76._8_4_ = fStack_818 * -fVar394;
      auVar76._12_4_ = fStack_814 * -fVar396;
      auVar76._16_4_ = fStack_810 * -fVar398;
      auVar76._20_4_ = fStack_80c * -fVar400;
      auVar76._24_4_ = fStack_808 * -fVar402;
      auVar76._28_4_ = uVar112 ^ 0x80000000;
      auVar419._8_4_ = 0x3f800000;
      auVar419._0_8_ = 0x3f8000003f800000;
      auVar419._12_4_ = 0x3f800000;
      auVar419._16_4_ = 0x3f800000;
      auVar419._20_4_ = 0x3f800000;
      auVar419._24_4_ = 0x3f800000;
      auVar419._28_4_ = 0x3f800000;
      auVar77._4_4_ = fStack_7fc * fVar410;
      auVar77._0_4_ = local_800 * fVar404;
      auVar77._8_4_ = fStack_7f8 * fVar411;
      auVar77._12_4_ = fStack_7f4 * fVar412;
      auVar77._16_4_ = fStack_7f0 * fVar413;
      auVar77._20_4_ = fStack_7ec * fVar414;
      auVar77._24_4_ = fStack_7e8 * fVar415;
      auVar77._28_4_ = uVar7;
      auVar168 = vsubps_avx(auVar76,auVar77);
      auVar78._4_4_ = fStack_67c * fVar331;
      auVar78._0_4_ = local_680 * fVar315;
      auVar78._8_4_ = fStack_678 * fVar336;
      auVar78._12_4_ = fStack_674 * fVar341;
      auVar78._16_4_ = fStack_670 * fVar345;
      auVar78._20_4_ = fStack_66c * fVar349;
      auVar78._24_4_ = fStack_668 * fVar353;
      auVar78._28_4_ = uVar7;
      auVar38 = vsubps_avx(auVar168,auVar78);
      auVar168 = vrcpps_avx(auVar38);
      fVar203 = auVar168._0_4_;
      fVar228 = auVar168._4_4_;
      auVar79._4_4_ = auVar38._4_4_ * fVar228;
      auVar79._0_4_ = auVar38._0_4_ * fVar203;
      fVar229 = auVar168._8_4_;
      auVar79._8_4_ = auVar38._8_4_ * fVar229;
      fVar253 = auVar168._12_4_;
      auVar79._12_4_ = auVar38._12_4_ * fVar253;
      fVar254 = auVar168._16_4_;
      auVar79._16_4_ = auVar38._16_4_ * fVar254;
      fVar273 = auVar168._20_4_;
      auVar79._20_4_ = auVar38._20_4_ * fVar273;
      fVar274 = auVar168._24_4_;
      auVar79._24_4_ = auVar38._24_4_ * fVar274;
      auVar79._28_4_ = local_980._28_4_;
      auVar322 = vsubps_avx(auVar419,auVar79);
      auVar168 = vandps_avx(auVar38,auVar303);
      auVar139._8_4_ = 0x219392ef;
      auVar139._0_8_ = 0x219392ef219392ef;
      auVar139._12_4_ = 0x219392ef;
      auVar139._16_4_ = 0x219392ef;
      auVar139._20_4_ = 0x219392ef;
      auVar139._24_4_ = 0x219392ef;
      auVar139._28_4_ = 0x219392ef;
      auVar168 = vcmpps_avx(auVar168,auVar139,1);
      auVar80._4_4_ = (fVar228 + fVar228 * auVar322._4_4_) * -auVar25._4_4_;
      auVar80._0_4_ = (fVar203 + fVar203 * auVar322._0_4_) * -auVar25._0_4_;
      auVar80._8_4_ = (fVar229 + fVar229 * auVar322._8_4_) * -auVar25._8_4_;
      auVar80._12_4_ = (fVar253 + fVar253 * auVar322._12_4_) * -auVar25._12_4_;
      auVar80._16_4_ = (fVar254 + fVar254 * auVar322._16_4_) * -auVar25._16_4_;
      auVar80._20_4_ = (fVar273 + fVar273 * auVar322._20_4_) * -auVar25._20_4_;
      auVar80._24_4_ = (fVar274 + fVar274 * auVar322._24_4_) * -auVar25._24_4_;
      auVar80._28_4_ = auVar25._28_4_ ^ 0x80000000;
      auVar25 = vcmpps_avx(auVar38,auVar323,1);
      auVar25 = vorps_avx(auVar168,auVar25);
      auVar25 = vblendvps_avx(auVar80,auVar408,auVar25);
      local_760 = vmaxps_avx(auVar28,auVar25);
      auVar304 = ZEXT3264(local_760);
      auVar25 = vcmpps_avx(auVar38,ZEXT832(0) << 0x20,6);
      auVar25 = vorps_avx(auVar168,auVar25);
      auVar25 = vblendvps_avx(auVar80,auVar425,auVar25);
      auVar130 = vandps_avx(auVar130,local_560);
      local_620 = vminps_avx(auVar24,auVar25);
      auVar25 = vcmpps_avx(local_760,local_620,2);
      auVar28 = auVar130 & auVar25;
      if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar28 >> 0x7f,0) == '\0') &&
            (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar28 >> 0xbf,0) == '\0') &&
          (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar28[0x1f])
      goto LAB_00acc5a4;
      auVar168 = vminps_avx(_local_b80,auVar192);
      auVar24 = vminps_avx(auVar26,auVar27);
      auVar168 = vminps_avx(auVar168,auVar24);
      auVar24 = vsubps_avx(auVar168,local_2e0);
      auVar130 = vandps_avx(auVar25,auVar130);
      auVar101._4_4_ = fStack_3dc;
      auVar101._0_4_ = local_3e0;
      auVar101._8_4_ = fStack_3d8;
      auVar101._12_4_ = fStack_3d4;
      auVar101._16_4_ = fStack_3d0;
      auVar101._20_4_ = fStack_3cc;
      auVar101._24_4_ = fStack_3c8;
      auVar101._28_4_ = uStack_3c4;
      auVar168 = vminps_avx(auVar101,auVar419);
      auVar304 = ZEXT864(0) << 0x20;
      auVar168 = vmaxps_avx(auVar168,ZEXT832(0) << 0x20);
      local_1a0[0] = fVar180 + fVar150 * (auVar168._0_4_ + 0.0) * 0.125;
      local_1a0[1] = fVar200 + fVar176 * (auVar168._4_4_ + 1.0) * 0.125;
      local_1a0[2] = fVar201 + fVar177 * (auVar168._8_4_ + 2.0) * 0.125;
      local_1a0[3] = fVar202 + fVar179 * (auVar168._12_4_ + 3.0) * 0.125;
      fStack_190 = fVar180 + fVar150 * (auVar168._16_4_ + 4.0) * 0.125;
      fStack_18c = fVar200 + fVar176 * (auVar168._20_4_ + 5.0) * 0.125;
      fStack_188 = fVar201 + fVar177 * (auVar168._24_4_ + 6.0) * 0.125;
      fStack_184 = fVar202 + auVar168._28_4_ + 7.0;
      auVar102._4_4_ = fStack_3bc;
      auVar102._0_4_ = local_3c0;
      auVar102._8_4_ = fStack_3b8;
      auVar102._12_4_ = fStack_3b4;
      auVar102._16_4_ = fStack_3b0;
      auVar102._20_4_ = fStack_3ac;
      auVar102._24_4_ = fStack_3a8;
      auVar102._28_4_ = uStack_3a4;
      auVar168 = vminps_avx(auVar102,auVar419);
      auVar168 = vmaxps_avx(auVar168,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar180 + fVar150 * (auVar168._0_4_ + 0.0) * 0.125;
      local_1c0[1] = fVar200 + fVar176 * (auVar168._4_4_ + 1.0) * 0.125;
      local_1c0[2] = fVar201 + fVar177 * (auVar168._8_4_ + 2.0) * 0.125;
      local_1c0[3] = fVar202 + fVar179 * (auVar168._12_4_ + 3.0) * 0.125;
      fStack_1b0 = fVar180 + fVar150 * (auVar168._16_4_ + 4.0) * 0.125;
      fStack_1ac = fVar200 + fVar176 * (auVar168._20_4_ + 5.0) * 0.125;
      fStack_1a8 = fVar201 + fVar177 * (auVar168._24_4_ + 6.0) * 0.125;
      fStack_1a4 = fVar202 + auVar168._28_4_ + 7.0;
      auVar81._4_4_ = auVar24._4_4_ * 0.99999976;
      auVar81._0_4_ = auVar24._0_4_ * 0.99999976;
      auVar81._8_4_ = auVar24._8_4_ * 0.99999976;
      auVar81._12_4_ = auVar24._12_4_ * 0.99999976;
      auVar81._16_4_ = auVar24._16_4_ * 0.99999976;
      auVar81._20_4_ = auVar24._20_4_ * 0.99999976;
      auVar81._24_4_ = auVar24._24_4_ * 0.99999976;
      auVar81._28_4_ = 0x3f7ffffc;
      auVar168 = vmaxps_avx(ZEXT832(0) << 0x20,auVar81);
      auVar82._4_4_ = auVar168._4_4_ * auVar168._4_4_;
      auVar82._0_4_ = auVar168._0_4_ * auVar168._0_4_;
      auVar82._8_4_ = auVar168._8_4_ * auVar168._8_4_;
      auVar82._12_4_ = auVar168._12_4_ * auVar168._12_4_;
      auVar82._16_4_ = auVar168._16_4_ * auVar168._16_4_;
      auVar82._20_4_ = auVar168._20_4_ * auVar168._20_4_;
      auVar82._24_4_ = auVar168._24_4_ * auVar168._24_4_;
      auVar82._28_4_ = auVar168._28_4_;
      local_a20 = vsubps_avx(auVar29,auVar82);
      auVar83._4_4_ = local_a20._4_4_ * fStack_2bc;
      auVar83._0_4_ = local_a20._0_4_ * local_2c0;
      auVar83._8_4_ = local_a20._8_4_ * fStack_2b8;
      auVar83._12_4_ = local_a20._12_4_ * fStack_2b4;
      auVar83._16_4_ = local_a20._16_4_ * fStack_2b0;
      auVar83._20_4_ = local_a20._20_4_ * fStack_2ac;
      auVar83._24_4_ = local_a20._24_4_ * fStack_2a8;
      auVar83._28_4_ = auVar168._28_4_;
      auVar25 = vsubps_avx(auVar65,auVar83);
      local_a80 = vcmpps_avx(auVar25,ZEXT832(0) << 0x20,5);
      auVar168 = local_a80;
      if ((((((((local_a80 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_a80 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_a80 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_a80 >> 0x7f,0) == '\0') &&
            (local_a80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_a80 >> 0xbf,0) == '\0') &&
          (local_a80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_a80[0x1f]) {
        auVar284 = ZEXT864(0) << 0x20;
        auVar271 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar243 = SUB6428(ZEXT864(0),0) << 0x20;
        _local_b60 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar362 = ZEXT864(0) << 0x20;
        auVar324._8_4_ = 0x7f800000;
        auVar324._0_8_ = 0x7f8000007f800000;
        auVar324._12_4_ = 0x7f800000;
        auVar324._16_4_ = 0x7f800000;
        auVar324._20_4_ = 0x7f800000;
        auVar324._24_4_ = 0x7f800000;
        auVar324._28_4_ = 0x7f800000;
        auVar371._8_4_ = 0xff800000;
        auVar371._0_8_ = 0xff800000ff800000;
        auVar371._12_4_ = 0xff800000;
        auVar371._16_4_ = 0xff800000;
        auVar371._20_4_ = 0xff800000;
        auVar371._24_4_ = 0xff800000;
        auVar371._28_4_ = 0xff800000;
        local_a80 = auVar41;
        local_a20 = auVar42;
      }
      else {
        auVar26 = vrcpps_avx(local_380);
        fVar203 = auVar26._0_4_;
        fVar228 = auVar26._4_4_;
        auVar84._4_4_ = local_380._4_4_ * fVar228;
        auVar84._0_4_ = local_380._0_4_ * fVar203;
        fVar229 = auVar26._8_4_;
        auVar84._8_4_ = local_380._8_4_ * fVar229;
        fVar253 = auVar26._12_4_;
        auVar84._12_4_ = local_380._12_4_ * fVar253;
        fVar254 = auVar26._16_4_;
        auVar84._16_4_ = local_380._16_4_ * fVar254;
        fVar273 = auVar26._20_4_;
        auVar84._20_4_ = local_380._20_4_ * fVar273;
        fVar274 = auVar26._24_4_;
        auVar84._24_4_ = local_380._24_4_ * fVar274;
        auVar84._28_4_ = auVar24._28_4_;
        auVar27 = vsubps_avx(auVar419,auVar84);
        auVar24 = vsqrtps_avx(auVar25);
        fVar203 = fVar203 + fVar203 * auVar27._0_4_;
        fVar228 = fVar228 + fVar228 * auVar27._4_4_;
        fVar229 = fVar229 + fVar229 * auVar27._8_4_;
        fVar253 = fVar253 + fVar253 * auVar27._12_4_;
        fVar254 = fVar254 + fVar254 * auVar27._16_4_;
        fVar273 = fVar273 + fVar273 * auVar27._20_4_;
        fVar274 = fVar274 + fVar274 * auVar27._24_4_;
        auVar28 = vsubps_avx(local_360,auVar24);
        fVar346 = auVar28._0_4_ * fVar203;
        fVar354 = auVar28._4_4_ * fVar228;
        auVar85._4_4_ = fVar354;
        auVar85._0_4_ = fVar346;
        fVar363 = auVar28._8_4_ * fVar229;
        auVar85._8_4_ = fVar363;
        fVar403 = auVar28._12_4_ * fVar253;
        auVar85._12_4_ = fVar403;
        fVar146 = auVar28._16_4_ * fVar254;
        auVar85._16_4_ = fVar146;
        fVar147 = auVar28._20_4_ * fVar273;
        auVar85._20_4_ = fVar147;
        fVar148 = auVar28._24_4_ * fVar274;
        auVar85._24_4_ = fVar148;
        auVar85._28_4_ = 0x7f800000;
        auVar28 = vsubps_avx(auVar24,auVar360);
        fVar203 = auVar28._0_4_ * fVar203;
        fVar228 = auVar28._4_4_ * fVar228;
        auVar86._4_4_ = fVar228;
        auVar86._0_4_ = fVar203;
        fVar229 = auVar28._8_4_ * fVar229;
        auVar86._8_4_ = fVar229;
        fVar253 = auVar28._12_4_ * fVar253;
        auVar86._12_4_ = fVar253;
        fVar254 = auVar28._16_4_ * fVar254;
        auVar86._16_4_ = fVar254;
        fVar273 = auVar28._20_4_ * fVar273;
        auVar86._20_4_ = fVar273;
        fVar274 = auVar28._24_4_ * fVar274;
        auVar86._24_4_ = fVar274;
        auVar86._28_4_ = 0x3f800000;
        fVar288 = (fVar346 * local_5c0 + auVar407._0_4_) * fVar230;
        fVar290 = (fVar354 * fStack_5bc + auVar407._4_4_) * fVar231;
        fVar297 = (fVar363 * fStack_5b8 + auVar407._8_4_) * fVar275;
        fVar299 = (fVar403 * fStack_5b4 + auVar407._12_4_) * fVar291;
        fVar309 = (fVar146 * fStack_5b0 + auVar407._16_4_) * fVar305;
        fVar310 = (fVar147 * fStack_5ac + auVar407._20_4_) * fVar311;
        fVar342 = (fVar148 * fStack_5a8 + auVar407._24_4_) * fVar350;
        auVar247._0_4_ = local_920 + fVar227 * fVar288;
        auVar247._4_4_ = fStack_91c + fVar252 * fVar290;
        auVar247._8_4_ = fStack_918 + fVar272 * fVar297;
        auVar247._12_4_ = fStack_914 + fVar287 * fVar299;
        auVar247._16_4_ = fStack_910 + fVar296 * fVar309;
        auVar247._20_4_ = fStack_90c + fVar308 * fVar310;
        auVar247._24_4_ = fStack_908 + fVar337 * fVar342;
        auVar247._28_4_ = fStack_904 + auVar28._28_4_;
        auVar87._4_4_ = fStack_67c * fVar354;
        auVar87._0_4_ = local_680 * fVar346;
        auVar87._8_4_ = fStack_678 * fVar363;
        auVar87._12_4_ = fStack_674 * fVar403;
        auVar87._16_4_ = fStack_670 * fVar146;
        auVar87._20_4_ = fStack_66c * fVar147;
        auVar87._24_4_ = fStack_668 * fVar148;
        auVar87._28_4_ = auVar24._28_4_;
        local_940 = vsubps_avx(auVar87,auVar247);
        auVar266._0_4_ = fVar312 + fVar225 * fVar288;
        auVar266._4_4_ = fVar328 + fVar232 * fVar290;
        auVar266._8_4_ = fVar333 + fVar255 * fVar297;
        auVar266._12_4_ = fVar338 + fVar276 * fVar299;
        auVar266._16_4_ = fVar343 + fVar293 * fVar309;
        auVar266._20_4_ = fVar347 + fVar306 * fVar310;
        auVar266._24_4_ = fVar351 + fVar327 * fVar342;
        auVar266._28_4_ = fVar355 + auVar24._28_4_;
        auVar88._4_4_ = fStack_7fc * fVar354;
        auVar88._0_4_ = local_800 * fVar346;
        auVar88._8_4_ = fStack_7f8 * fVar363;
        auVar88._12_4_ = fStack_7f4 * fVar403;
        auVar88._16_4_ = fStack_7f0 * fVar146;
        auVar88._20_4_ = fStack_7ec * fVar147;
        auVar88._24_4_ = fStack_7e8 * fVar148;
        auVar88._28_4_ = 0x3e000000;
        auVar24 = vsubps_avx(auVar88,auVar266);
        _local_b60 = auVar24._0_28_;
        auVar222._0_4_ = fVar313 + fVar226 * fVar288;
        auVar222._4_4_ = fVar329 + fVar251 * fVar290;
        auVar222._8_4_ = fVar334 + fVar256 * fVar297;
        auVar222._12_4_ = fVar339 + fVar277 * fVar299;
        auVar222._16_4_ = fStack_8f0 + fVar294 * fVar309;
        auVar222._20_4_ = fStack_8ec + fVar307 * fVar310;
        auVar222._24_4_ = fStack_8e8 + fVar332 * fVar342;
        auVar222._28_4_ = fStack_8e4 + auVar26._28_4_ + auVar27._28_4_ + auVar407._28_4_;
        auVar89._4_4_ = fStack_81c * fVar354;
        auVar89._0_4_ = local_820 * fVar346;
        auVar89._8_4_ = fStack_818 * fVar363;
        auVar89._12_4_ = fStack_814 * fVar403;
        auVar89._16_4_ = fStack_810 * fVar146;
        auVar89._20_4_ = fStack_80c * fVar147;
        auVar89._24_4_ = fStack_808 * fVar148;
        auVar89._28_4_ = auVar266._28_4_;
        auVar24 = vsubps_avx(auVar89,auVar222);
        auVar362 = ZEXT3264(auVar24);
        fVar230 = (fVar203 * local_5c0 + auVar407._0_4_) * fVar230;
        fVar231 = (fVar228 * fStack_5bc + auVar407._4_4_) * fVar231;
        fVar275 = (fVar229 * fStack_5b8 + auVar407._8_4_) * fVar275;
        fVar291 = (fVar253 * fStack_5b4 + auVar407._12_4_) * fVar291;
        fVar305 = (fVar254 * fStack_5b0 + auVar407._16_4_) * fVar305;
        fVar311 = (fVar273 * fStack_5ac + auVar407._20_4_) * fVar311;
        fVar350 = (fVar274 * fStack_5a8 + auVar407._24_4_) * fVar350;
        auVar223._0_4_ = local_920 + fVar227 * fVar230;
        auVar223._4_4_ = fStack_91c + fVar252 * fVar231;
        auVar223._8_4_ = fStack_918 + fVar272 * fVar275;
        auVar223._12_4_ = fStack_914 + fVar287 * fVar291;
        auVar223._16_4_ = fStack_910 + fVar296 * fVar305;
        auVar223._20_4_ = fStack_90c + fVar308 * fVar311;
        auVar223._24_4_ = fStack_908 + fVar337 * fVar350;
        auVar223._28_4_ = fStack_904 + auVar222._28_4_ + auVar407._28_4_;
        auVar90._4_4_ = fVar228 * fStack_67c;
        auVar90._0_4_ = fVar203 * local_680;
        auVar90._8_4_ = fVar229 * fStack_678;
        auVar90._12_4_ = fVar253 * fStack_674;
        auVar90._16_4_ = fVar254 * fStack_670;
        auVar90._20_4_ = fVar273 * fStack_66c;
        auVar90._24_4_ = fVar274 * fStack_668;
        auVar90._28_4_ = fStack_664;
        auVar24 = vsubps_avx(auVar90,auVar223);
        auVar304 = ZEXT3264(auVar24);
        auVar283._0_4_ = fVar312 + fVar225 * fVar230;
        auVar283._4_4_ = fVar328 + fVar232 * fVar231;
        auVar283._8_4_ = fVar333 + fVar255 * fVar275;
        auVar283._12_4_ = fVar338 + fVar276 * fVar291;
        auVar283._16_4_ = fVar343 + fVar293 * fVar305;
        auVar283._20_4_ = fVar347 + fVar306 * fVar311;
        auVar283._24_4_ = fVar351 + fVar327 * fVar350;
        auVar283._28_4_ = fVar355 + fStack_664;
        auVar91._4_4_ = fStack_7fc * fVar228;
        auVar91._0_4_ = local_800 * fVar203;
        auVar91._8_4_ = fStack_7f8 * fVar229;
        auVar91._12_4_ = fStack_7f4 * fVar253;
        auVar91._16_4_ = fStack_7f0 * fVar254;
        auVar91._20_4_ = fStack_7ec * fVar273;
        auVar91._24_4_ = fStack_7e8 * fVar274;
        auVar91._28_4_ = fStack_7e4;
        auVar24 = vsubps_avx(auVar91,auVar283);
        auVar284 = ZEXT3264(auVar24);
        auVar267._0_4_ = fVar313 + fVar226 * fVar230;
        auVar267._4_4_ = fVar329 + fVar251 * fVar231;
        auVar267._8_4_ = fVar334 + fVar256 * fVar275;
        auVar267._12_4_ = fVar339 + fVar277 * fVar291;
        auVar267._16_4_ = fStack_8f0 + fVar294 * fVar305;
        auVar267._20_4_ = fStack_8ec + fVar307 * fVar311;
        auVar267._24_4_ = fStack_8e8 + fVar332 * fVar350;
        auVar267._28_4_ = fStack_8e4 + auVar266._28_4_;
        auVar92._4_4_ = fStack_81c * fVar228;
        auVar92._0_4_ = local_820 * fVar203;
        auVar92._8_4_ = fStack_818 * fVar229;
        auVar92._12_4_ = fStack_814 * fVar253;
        auVar92._16_4_ = fStack_810 * fVar254;
        auVar92._20_4_ = fStack_80c * fVar273;
        auVar92._24_4_ = fStack_808 * fVar274;
        auVar92._28_4_ = fStack_7e4;
        auVar24 = vsubps_avx(auVar92,auVar267);
        auVar271 = ZEXT3264(auVar24);
        auVar24 = vcmpps_avx(auVar25,_DAT_01f7b000,5);
        auVar325._8_4_ = 0x7f800000;
        auVar325._0_8_ = 0x7f8000007f800000;
        auVar325._12_4_ = 0x7f800000;
        auVar325._16_4_ = 0x7f800000;
        auVar325._20_4_ = 0x7f800000;
        auVar325._24_4_ = 0x7f800000;
        auVar325._28_4_ = 0x7f800000;
        auVar324 = vblendvps_avx(auVar325,auVar85,auVar24);
        auVar25 = vmaxps_avx(local_580,local_400);
        auVar93._4_4_ = auVar25._4_4_ * 1.9073486e-06;
        auVar93._0_4_ = auVar25._0_4_ * 1.9073486e-06;
        auVar93._8_4_ = auVar25._8_4_ * 1.9073486e-06;
        auVar93._12_4_ = auVar25._12_4_ * 1.9073486e-06;
        auVar93._16_4_ = auVar25._16_4_ * 1.9073486e-06;
        auVar93._20_4_ = auVar25._20_4_ * 1.9073486e-06;
        auVar93._24_4_ = auVar25._24_4_ * 1.9073486e-06;
        auVar93._28_4_ = auVar25._28_4_;
        auVar25 = vcmpps_avx(local_960,auVar93,1);
        auVar372._8_4_ = 0xff800000;
        auVar372._0_8_ = 0xff800000ff800000;
        auVar372._12_4_ = 0xff800000;
        auVar372._16_4_ = 0xff800000;
        auVar372._20_4_ = 0xff800000;
        auVar372._24_4_ = 0xff800000;
        auVar372._28_4_ = 0xff800000;
        auVar371 = vblendvps_avx(auVar372,auVar86,auVar24);
        auVar26 = auVar24 & auVar25;
        if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar26 >> 0x7f,0) != '\0') ||
              (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar26 >> 0xbf,0) != '\0') ||
            (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar26[0x1f] < '\0') {
          auVar168 = vandps_avx(auVar25,auVar24);
          auVar209 = vpackssdw_avx(auVar168._0_16_,auVar168._16_16_);
          auVar26 = vcmpps_avx(local_a20,ZEXT832(0) << 0x20,2);
          auVar175._8_4_ = 0xff800000;
          auVar175._0_8_ = 0xff800000ff800000;
          auVar175._12_4_ = 0xff800000;
          auVar175._16_4_ = 0xff800000;
          auVar175._20_4_ = 0xff800000;
          auVar175._24_4_ = 0xff800000;
          auVar175._28_4_ = 0xff800000;
          auVar224._8_4_ = 0x7f800000;
          auVar224._0_8_ = 0x7f8000007f800000;
          auVar224._12_4_ = 0x7f800000;
          auVar224._16_4_ = 0x7f800000;
          auVar224._20_4_ = 0x7f800000;
          auVar224._24_4_ = 0x7f800000;
          auVar224._28_4_ = 0x7f800000;
          auVar25 = vblendvps_avx(auVar224,auVar175,auVar26);
          auVar31 = vpmovsxwd_avx(auVar209);
          auVar209 = vpunpckhwd_avx(auVar209,auVar209);
          auVar420._16_16_ = auVar209;
          auVar420._0_16_ = auVar31;
          auVar324 = vblendvps_avx(auVar324,auVar25,auVar420);
          auVar25 = vblendvps_avx(auVar175,auVar224,auVar26);
          auVar371 = vblendvps_avx(auVar371,auVar25,auVar420);
          auVar199._0_8_ = auVar168._0_8_ ^ 0xffffffffffffffff;
          auVar199._8_4_ = auVar168._8_4_ ^ 0xffffffff;
          auVar199._12_4_ = auVar168._12_4_ ^ 0xffffffff;
          auVar199._16_4_ = auVar168._16_4_ ^ 0xffffffff;
          auVar199._20_4_ = auVar168._20_4_ ^ 0xffffffff;
          auVar199._24_4_ = auVar168._24_4_ ^ 0xffffffff;
          auVar199._28_4_ = auVar168._28_4_ ^ 0xffffffff;
          auVar168 = vorps_avx(auVar26,auVar199);
          auVar168 = vandps_avx(auVar24,auVar168);
        }
        auVar243 = local_940._0_28_;
      }
      fVar203 = (ray->dir).field_0.m128[0];
      auVar409 = ZEXT3264(CONCAT428(fVar203,CONCAT424(fVar203,CONCAT420(fVar203,CONCAT416(fVar203,
                                                  CONCAT412(fVar203,CONCAT48(fVar203,CONCAT44(
                                                  fVar203,fVar203))))))));
      fVar225 = (ray->dir).field_0.m128[1];
      fVar226 = (ray->dir).field_0.m128[2];
      auVar390 = ZEXT3264(CONCAT428(fVar226,CONCAT424(fVar226,CONCAT420(fVar226,CONCAT416(fVar226,
                                                  CONCAT412(fVar226,CONCAT48(fVar226,CONCAT44(
                                                  fVar226,fVar226))))))));
      local_600 = local_760;
      local_5e0 = vminps_avx(local_620,auVar324);
      local_840 = vmaxps_avx(local_760,auVar371);
      auVar373 = ZEXT3264(local_840);
      _local_640 = local_840;
      auVar24 = vcmpps_avx(local_760,local_5e0,2);
      local_780 = vandps_avx(auVar24,auVar130);
      auVar24 = vcmpps_avx(local_840,local_620,2);
      auVar24 = vandps_avx(auVar24,auVar130);
      auVar25 = vorps_avx(local_780,auVar24);
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0x7f,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0xbf,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar25[0x1f] < '\0') {
        fVar227 = auVar130._28_4_;
        auVar142._0_4_ =
             fVar203 * auVar304._0_4_ + fVar225 * auVar284._0_4_ + fVar226 * auVar271._0_4_;
        auVar142._4_4_ =
             fVar203 * auVar304._4_4_ + fVar225 * auVar284._4_4_ + fVar226 * auVar271._4_4_;
        auVar142._8_4_ =
             fVar203 * auVar304._8_4_ + fVar225 * auVar284._8_4_ + fVar226 * auVar271._8_4_;
        auVar142._12_4_ =
             fVar203 * auVar304._12_4_ + fVar225 * auVar284._12_4_ + fVar226 * auVar271._12_4_;
        auVar142._16_4_ =
             fVar203 * auVar304._16_4_ + fVar225 * auVar284._16_4_ + fVar226 * auVar271._16_4_;
        auVar142._20_4_ =
             fVar203 * auVar304._20_4_ + fVar225 * auVar284._20_4_ + fVar226 * auVar271._20_4_;
        auVar142._24_4_ =
             fVar203 * auVar304._24_4_ + fVar225 * auVar284._24_4_ + fVar226 * auVar271._24_4_;
        auVar142._28_4_ = fVar227 + fVar227 + auVar25._28_4_;
        auVar193._0_8_ = auVar168._0_8_ ^ 0xffffffffffffffff;
        auVar193._8_4_ = auVar168._8_4_ ^ 0xffffffff;
        auVar193._12_4_ = auVar168._12_4_ ^ 0xffffffff;
        auVar193._16_4_ = auVar168._16_4_ ^ 0xffffffff;
        auVar193._20_4_ = auVar168._20_4_ ^ 0xffffffff;
        auVar193._24_4_ = auVar168._24_4_ ^ 0xffffffff;
        auVar193._28_4_ = auVar168._28_4_ ^ 0xffffffff;
        auVar248._8_4_ = 0x7fffffff;
        auVar248._0_8_ = 0x7fffffff7fffffff;
        auVar248._12_4_ = 0x7fffffff;
        auVar248._16_4_ = 0x7fffffff;
        auVar248._20_4_ = 0x7fffffff;
        auVar248._24_4_ = 0x7fffffff;
        auVar248._28_4_ = 0x7fffffff;
        auVar130 = vandps_avx(auVar142,auVar248);
        auVar268._8_4_ = 0x3e99999a;
        auVar268._0_8_ = 0x3e99999a3e99999a;
        auVar268._12_4_ = 0x3e99999a;
        auVar268._16_4_ = 0x3e99999a;
        auVar268._20_4_ = 0x3e99999a;
        auVar268._24_4_ = 0x3e99999a;
        auVar268._28_4_ = 0x3e99999a;
        auVar130 = vcmpps_avx(auVar130,auVar268,1);
        local_6c0 = vorps_avx(auVar130,auVar193);
        auVar143._0_4_ =
             fVar203 * auVar243._0_4_ + fVar225 * (float)local_b60._0_4_ + auVar362._0_4_ * fVar226;
        auVar143._4_4_ =
             fVar203 * auVar243._4_4_ + fVar225 * (float)local_b60._4_4_ + auVar362._4_4_ * fVar226;
        auVar143._8_4_ = fVar203 * auVar243._8_4_ + fVar225 * fStack_b58 + auVar362._8_4_ * fVar226;
        auVar143._12_4_ =
             fVar203 * auVar243._12_4_ + fVar225 * fStack_b54 + auVar362._12_4_ * fVar226;
        auVar143._16_4_ =
             fVar203 * auVar243._16_4_ + fVar225 * fStack_b50 + auVar362._16_4_ * fVar226;
        auVar143._20_4_ =
             fVar203 * auVar243._20_4_ + fVar225 * fStack_b4c + auVar362._20_4_ * fVar226;
        auVar143._24_4_ =
             fVar203 * auVar243._24_4_ + fVar225 * fStack_b48 + auVar362._24_4_ * fVar226;
        auVar143._28_4_ = fVar227 + auVar284._28_4_ + local_6c0._28_4_;
        auVar130 = vandps_avx(auVar143,auVar248);
        auVar130 = vcmpps_avx(auVar130,auVar268,1);
        auVar130 = vorps_avx(auVar130,auVar193);
        auVar169._8_4_ = 3;
        auVar169._0_8_ = 0x300000003;
        auVar169._12_4_ = 3;
        auVar169._16_4_ = 3;
        auVar169._20_4_ = 3;
        auVar169._24_4_ = 3;
        auVar169._28_4_ = 3;
        auVar194._8_4_ = 2;
        auVar194._0_8_ = 0x200000002;
        auVar194._12_4_ = 2;
        auVar194._16_4_ = 2;
        auVar194._20_4_ = 2;
        auVar194._24_4_ = 2;
        auVar194._28_4_ = 2;
        auVar130 = vblendvps_avx(auVar194,auVar169,auVar130);
        local_6e0 = ZEXT432(local_bc4);
        local_700 = vpshufd_avx(ZEXT416(local_bc4),0);
        auVar209 = vpcmpgtd_avx(auVar130._16_16_,local_700);
        auStack_6f0 = auVar65._16_16_;
        auVar31 = vpcmpgtd_avx(auVar130._0_16_,local_700);
        auVar170._16_16_ = auVar209;
        auVar170._0_16_ = auVar31;
        local_6a0 = vblendps_avx(ZEXT1632(auVar31),auVar170,0xf0);
        auVar130 = vandnps_avx(local_6a0,local_780);
        local_860._4_4_ = local_760._4_4_ + (float)local_740._4_4_;
        local_860._0_4_ = local_760._0_4_ + (float)local_740._0_4_;
        fStack_858 = local_760._8_4_ + fStack_738;
        fStack_854 = local_760._12_4_ + fStack_734;
        fStack_850 = local_760._16_4_ + fStack_730;
        fStack_84c = local_760._20_4_ + fStack_72c;
        fStack_848 = local_760._24_4_ + fStack_728;
        fStack_844 = local_760._28_4_ + fStack_724;
        while( true ) {
          local_420 = auVar130;
          if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar130 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar130 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar130 >> 0x7f,0) == '\0') &&
                (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar130 >> 0xbf,0) == '\0') &&
              (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar130[0x1f]) break;
          auVar171._8_4_ = 0x7f800000;
          auVar171._0_8_ = 0x7f8000007f800000;
          auVar171._12_4_ = 0x7f800000;
          auVar171._16_4_ = 0x7f800000;
          auVar171._20_4_ = 0x7f800000;
          auVar171._24_4_ = 0x7f800000;
          auVar171._28_4_ = 0x7f800000;
          auVar168 = vblendvps_avx(auVar171,local_760,auVar130);
          auVar25 = vshufps_avx(auVar168,auVar168,0xb1);
          auVar25 = vminps_avx(auVar168,auVar25);
          auVar26 = vshufpd_avx(auVar25,auVar25,5);
          auVar25 = vminps_avx(auVar25,auVar26);
          auVar26 = vperm2f128_avx(auVar25,auVar25,1);
          auVar25 = vminps_avx(auVar25,auVar26);
          auVar168 = vcmpps_avx(auVar168,auVar25,0);
          auVar25 = auVar130 & auVar168;
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0x7f,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar25 >> 0xbf,0) != '\0') ||
              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar25[0x1f] < '\0') {
            auVar130 = vandps_avx(auVar168,auVar130);
          }
          uVar104 = vmovmskps_avx(auVar130);
          uVar112 = 0;
          if (uVar104 != 0) {
            for (; (uVar104 >> uVar112 & 1) == 0; uVar112 = uVar112 + 1) {
            }
          }
          uVar106 = (ulong)uVar112;
          *(undefined4 *)(local_420 + uVar106 * 4) = 0;
          aVar8 = (ray->dir).field_0.field_1;
          local_900 = aVar8.x;
          fStack_8fc = aVar8.y;
          fStack_8f8 = aVar8.z;
          aStack_8f4 = aVar8.field_3;
          auVar209 = vdpps_avx((undefined1  [16])aVar8,(undefined1  [16])aVar8,0x7f);
          fVar203 = local_1a0[uVar106];
          uVar112 = *(uint *)(local_600 + uVar106 * 4);
          if (auVar209._0_4_ < 0.0) {
            auVar390 = ZEXT1664(auVar390._0_16_);
            auVar409 = ZEXT1664(auVar409._0_16_);
            fVar225 = sqrtf(auVar209._0_4_);
            uVar106 = extraout_RAX;
          }
          else {
            auVar209 = vsqrtss_avx(auVar209,auVar209);
            fVar225 = auVar209._0_4_;
          }
          auVar304 = ZEXT464(uVar112);
          auVar31 = vminps_avx(_local_9c0,_local_8c0);
          auVar209 = vmaxps_avx(_local_9c0,_local_8c0);
          auVar32 = vminps_avx(_local_8a0,_local_8e0);
          auVar183 = vminps_avx(auVar31,auVar32);
          auVar31 = vmaxps_avx(_local_8a0,_local_8e0);
          auVar32 = vmaxps_avx(auVar209,auVar31);
          auVar206._8_4_ = 0x7fffffff;
          auVar206._0_8_ = 0x7fffffff7fffffff;
          auVar206._12_4_ = 0x7fffffff;
          auVar209 = vandps_avx(auVar183,auVar206);
          auVar31 = vandps_avx(auVar32,auVar206);
          auVar209 = vmaxps_avx(auVar209,auVar31);
          auVar31 = vmovshdup_avx(auVar209);
          auVar31 = vmaxss_avx(auVar31,auVar209);
          auVar209 = vshufpd_avx(auVar209,auVar209,1);
          auVar209 = vmaxss_avx(auVar209,auVar31);
          local_920 = auVar209._0_4_ * 1.9073486e-06;
          local_a20._0_4_ = fVar225 * 1.9073486e-06;
          local_960._0_16_ = vshufps_avx(auVar32,auVar32,0xff);
          auVar209 = vinsertps_avx(ZEXT416(uVar112),ZEXT416((uint)fVar203),0x10);
          auVar362 = ZEXT1664(auVar209);
          uVar109 = 0;
          while( true ) {
            auVar209 = auVar362._0_16_;
            bVar103 = (byte)uVar106;
            if (uVar109 == 5) break;
            auVar32 = vmovshdup_avx(auVar209);
            fVar203 = auVar32._0_4_;
            fVar230 = 1.0 - fVar203;
            fVar225 = fVar230 * fVar230;
            fVar226 = fVar230 * fVar225;
            fVar227 = fVar203 * fVar203;
            fVar228 = fVar203 * fVar227;
            fVar229 = fVar203 * fVar230;
            auVar31 = vshufps_avx(ZEXT416((uint)(fVar228 * 0.16666667)),
                                  ZEXT416((uint)(fVar228 * 0.16666667)),0);
            auVar183 = ZEXT416((uint)((fVar228 * 4.0 + fVar226 +
                                      fVar203 * fVar229 * 12.0 + fVar230 * fVar229 * 6.0) *
                                     0.16666667));
            auVar183 = vshufps_avx(auVar183,auVar183,0);
            auVar121 = ZEXT416((uint)((fVar226 * 4.0 + fVar228 +
                                      fVar230 * fVar229 * 12.0 + fVar203 * fVar229 * 6.0) *
                                     0.16666667));
            auVar121 = vshufps_avx(auVar121,auVar121,0);
            auVar153 = vshufps_avx(auVar209,auVar209,0);
            auVar184._0_4_ = auVar153._0_4_ * local_900 + 0.0;
            auVar184._4_4_ = auVar153._4_4_ * fStack_8fc + 0.0;
            auVar184._8_4_ = auVar153._8_4_ * fStack_8f8 + 0.0;
            auVar184._12_4_ = auVar153._12_4_ * aStack_8f4.w + 0.0;
            auVar153 = vshufps_avx(ZEXT416((uint)(fVar226 * 0.16666667)),
                                   ZEXT416((uint)(fVar226 * 0.16666667)),0);
            auVar119._0_4_ =
                 auVar153._0_4_ * (float)local_9c0._0_4_ +
                 auVar121._0_4_ * (float)local_8c0._0_4_ +
                 auVar31._0_4_ * (float)local_8e0._0_4_ + auVar183._0_4_ * (float)local_8a0._0_4_;
            auVar119._4_4_ =
                 auVar153._4_4_ * (float)local_9c0._4_4_ +
                 auVar121._4_4_ * (float)local_8c0._4_4_ +
                 auVar31._4_4_ * (float)local_8e0._4_4_ + auVar183._4_4_ * (float)local_8a0._4_4_;
            auVar119._8_4_ =
                 auVar153._8_4_ * fStack_9b8 +
                 auVar121._8_4_ * fStack_8b8 +
                 auVar31._8_4_ * fStack_8d8 + auVar183._8_4_ * fStack_898;
            auVar119._12_4_ =
                 auVar153._12_4_ * fStack_9b4 +
                 auVar121._12_4_ * fStack_8b4 +
                 auVar31._12_4_ * fStack_8d4 + auVar183._12_4_ * fStack_894;
            local_940._0_16_ = auVar119;
            auVar183 = vsubps_avx(auVar184,auVar119);
            auVar31 = vdpps_avx(auVar183,auVar183,0x7f);
            fVar226 = auVar31._0_4_;
            if (fVar226 < 0.0) {
              local_a80._0_16_ = auVar32;
              local_aa0._0_4_ = fVar227;
              local_ac0._0_4_ = fVar225;
              local_980._0_4_ = fVar229;
              fVar228 = sqrtf(fVar226);
              uVar106 = extraout_RAX_00;
              fVar227 = (float)local_aa0._0_4_;
              fVar229 = (float)local_980._0_4_;
              fVar225 = (float)local_ac0._0_4_;
              fVar203 = (float)local_a80._0_4_;
            }
            else {
              auVar32 = vsqrtss_avx(auVar31,auVar31);
              fVar228 = auVar32._0_4_;
            }
            auVar32 = vshufps_avx(ZEXT416((uint)(fVar227 * 0.5)),ZEXT416((uint)(fVar227 * 0.5)),0);
            auVar121 = ZEXT416((uint)((fVar225 + fVar229 * 4.0) * 0.5));
            auVar121 = vshufps_avx(auVar121,auVar121,0);
            auVar153 = ZEXT416((uint)((fVar203 * -fVar203 - fVar229 * 4.0) * 0.5));
            auVar153 = vshufps_avx(auVar153,auVar153,0);
            auVar120 = ZEXT416((uint)(fVar230 * -fVar230 * 0.5));
            auVar120 = vshufps_avx(auVar120,auVar120,0);
            auVar316._0_4_ =
                 (float)local_9c0._0_4_ * auVar120._0_4_ +
                 (float)local_8c0._0_4_ * auVar153._0_4_ +
                 (float)local_8e0._0_4_ * auVar32._0_4_ + (float)local_8a0._0_4_ * auVar121._0_4_;
            auVar316._4_4_ =
                 (float)local_9c0._4_4_ * auVar120._4_4_ +
                 (float)local_8c0._4_4_ * auVar153._4_4_ +
                 (float)local_8e0._4_4_ * auVar32._4_4_ + (float)local_8a0._4_4_ * auVar121._4_4_;
            auVar316._8_4_ =
                 fStack_9b8 * auVar120._8_4_ +
                 fStack_8b8 * auVar153._8_4_ +
                 fStack_8d8 * auVar32._8_4_ + fStack_898 * auVar121._8_4_;
            auVar316._12_4_ =
                 fStack_9b4 * auVar120._12_4_ +
                 fStack_8b4 * auVar153._12_4_ +
                 fStack_8d4 * auVar32._12_4_ + fStack_894 * auVar121._12_4_;
            auVar32 = vshufps_avx(auVar209,auVar209,0x55);
            auVar121 = ZEXT416((uint)(fVar230 - (fVar203 + fVar203)));
            auVar153 = vshufps_avx(auVar121,auVar121,0);
            auVar121 = ZEXT416((uint)(fVar203 - (fVar230 + fVar230)));
            auVar120 = vshufps_avx(auVar121,auVar121,0);
            auVar115 = vshufps_avx(ZEXT416((uint)fVar230),ZEXT416((uint)fVar230),0);
            auVar121 = vdpps_avx(auVar316,auVar316,0x7f);
            auVar154._0_4_ =
                 (float)local_9c0._0_4_ * auVar115._0_4_ +
                 (float)local_8c0._0_4_ * auVar120._0_4_ +
                 (float)local_8e0._0_4_ * auVar32._0_4_ + (float)local_8a0._0_4_ * auVar153._0_4_;
            auVar154._4_4_ =
                 (float)local_9c0._4_4_ * auVar115._4_4_ +
                 (float)local_8c0._4_4_ * auVar120._4_4_ +
                 (float)local_8e0._4_4_ * auVar32._4_4_ + (float)local_8a0._4_4_ * auVar153._4_4_;
            auVar154._8_4_ =
                 fStack_9b8 * auVar115._8_4_ +
                 fStack_8b8 * auVar120._8_4_ +
                 fStack_8d8 * auVar32._8_4_ + fStack_898 * auVar153._8_4_;
            auVar154._12_4_ =
                 fStack_9b4 * auVar115._12_4_ +
                 fStack_8b4 * auVar120._12_4_ +
                 fStack_8d4 * auVar32._12_4_ + fStack_894 * auVar153._12_4_;
            auVar32 = vblendps_avx(auVar121,_DAT_01f45a50,0xe);
            auVar153 = vrsqrtss_avx(auVar32,auVar32);
            fVar225 = auVar153._0_4_;
            fVar203 = auVar121._0_4_;
            auVar153 = vdpps_avx(auVar316,auVar154,0x7f);
            auVar120 = vshufps_avx(auVar121,auVar121,0);
            auVar155._0_4_ = auVar154._0_4_ * auVar120._0_4_;
            auVar155._4_4_ = auVar154._4_4_ * auVar120._4_4_;
            auVar155._8_4_ = auVar154._8_4_ * auVar120._8_4_;
            auVar155._12_4_ = auVar154._12_4_ * auVar120._12_4_;
            auVar153 = vshufps_avx(auVar153,auVar153,0);
            auVar235._0_4_ = auVar316._0_4_ * auVar153._0_4_;
            auVar235._4_4_ = auVar316._4_4_ * auVar153._4_4_;
            auVar235._8_4_ = auVar316._8_4_ * auVar153._8_4_;
            auVar235._12_4_ = auVar316._12_4_ * auVar153._12_4_;
            auVar115 = vsubps_avx(auVar155,auVar235);
            auVar153 = vrcpss_avx(auVar32,auVar32);
            auVar32 = vmaxss_avx(ZEXT416((uint)local_920),
                                 ZEXT416((uint)(auVar362._0_4_ * (float)local_a20._0_4_)));
            auVar153 = ZEXT416((uint)(auVar153._0_4_ * (2.0 - fVar203 * auVar153._0_4_)));
            auVar153 = vshufps_avx(auVar153,auVar153,0);
            uVar94 = CONCAT44(auVar316._4_4_,auVar316._0_4_);
            auVar258._0_8_ = uVar94 ^ 0x8000000080000000;
            auVar258._8_4_ = -auVar316._8_4_;
            auVar258._12_4_ = -auVar316._12_4_;
            auVar120 = ZEXT416((uint)(fVar225 * 1.5 + fVar203 * -0.5 * fVar225 * fVar225 * fVar225))
            ;
            auVar120 = vshufps_avx(auVar120,auVar120,0);
            auVar207._0_4_ = auVar120._0_4_ * auVar115._0_4_ * auVar153._0_4_;
            auVar207._4_4_ = auVar120._4_4_ * auVar115._4_4_ * auVar153._4_4_;
            auVar207._8_4_ = auVar120._8_4_ * auVar115._8_4_ * auVar153._8_4_;
            auVar207._12_4_ = auVar120._12_4_ * auVar115._12_4_ * auVar153._12_4_;
            auVar282._0_4_ = auVar316._0_4_ * auVar120._0_4_;
            auVar282._4_4_ = auVar316._4_4_ * auVar120._4_4_;
            auVar282._8_4_ = auVar316._8_4_ * auVar120._8_4_;
            auVar282._12_4_ = auVar316._12_4_ * auVar120._12_4_;
            local_a80._0_4_ = auVar32._0_4_;
            if (fVar203 < 0.0) {
              local_aa0._0_4_ = fVar228;
              local_ac0._0_16_ = auVar258;
              local_980._0_16_ = auVar282;
              local_9a0._0_16_ = auVar207;
              fVar225 = sqrtf(fVar203);
              uVar106 = extraout_RAX_01;
              auVar207 = local_9a0._0_16_;
              auVar258 = local_ac0._0_16_;
              auVar282 = local_980._0_16_;
              fVar228 = (float)local_aa0._0_4_;
              fVar203 = (float)local_a80._0_4_;
            }
            else {
              auVar121 = vsqrtss_avx(auVar121,auVar121);
              fVar225 = auVar121._0_4_;
              fVar203 = auVar32._0_4_;
            }
            auVar32 = vdpps_avx(auVar183,auVar282,0x7f);
            fVar225 = (local_920 / fVar225) * (fVar228 + 1.0) + fVar203 + fVar228 * local_920;
            auVar121 = vdpps_avx(auVar258,auVar282,0x7f);
            auVar153 = vdpps_avx(auVar183,auVar207,0x7f);
            auVar98._4_4_ = fStack_8fc;
            auVar98._0_4_ = local_900;
            auVar98._8_4_ = fStack_8f8;
            auVar98._12_4_ = aStack_8f4.a;
            auVar120 = vdpps_avx(auVar98,auVar282,0x7f);
            auVar115 = vdpps_avx(auVar183,auVar258,0x7f);
            fVar227 = auVar121._0_4_ + auVar153._0_4_;
            fVar228 = auVar32._0_4_;
            auVar122._0_4_ = fVar228 * fVar228;
            auVar122._4_4_ = auVar32._4_4_ * auVar32._4_4_;
            auVar122._8_4_ = auVar32._8_4_ * auVar32._8_4_;
            auVar122._12_4_ = auVar32._12_4_ * auVar32._12_4_;
            auVar153 = vsubps_avx(auVar31,auVar122);
            auVar121 = vdpps_avx(auVar183,auVar98,0x7f);
            fVar229 = auVar115._0_4_ - fVar228 * fVar227;
            fVar230 = auVar121._0_4_ - fVar228 * auVar120._0_4_;
            auVar121 = vrsqrtss_avx(auVar153,auVar153);
            fVar232 = auVar153._0_4_;
            fVar228 = auVar121._0_4_;
            fVar228 = fVar228 * 1.5 + fVar232 * -0.5 * fVar228 * fVar228 * fVar228;
            if (fVar232 < 0.0) {
              local_aa0._0_16_ = auVar32;
              local_ac0._0_4_ = fVar225;
              local_980._0_16_ = auVar120;
              local_9a0._0_16_ = ZEXT416((uint)fVar227);
              local_7a0._0_4_ = fVar229;
              local_7c0._0_4_ = fVar230;
              local_7e0._0_4_ = fVar228;
              fVar232 = sqrtf(fVar232);
              uVar106 = extraout_RAX_02;
              fVar228 = (float)local_7e0._0_4_;
              fVar229 = (float)local_7a0._0_4_;
              fVar230 = (float)local_7c0._0_4_;
              auVar120 = local_980._0_16_;
              fVar225 = (float)local_ac0._0_4_;
              auVar32 = local_aa0._0_16_;
              auVar121 = local_9a0._0_16_;
              fVar203 = (float)local_a80._0_4_;
            }
            else {
              auVar121 = vsqrtss_avx(auVar153,auVar153);
              fVar232 = auVar121._0_4_;
              auVar121 = ZEXT416((uint)fVar227);
            }
            auVar409 = ZEXT1664(auVar32);
            auVar390 = ZEXT464((uint)fVar225);
            auVar304 = ZEXT1664(auVar31);
            auVar115 = vpermilps_avx(local_940._0_16_,0xff);
            auVar159 = vshufps_avx(auVar316,auVar316,0xff);
            fVar227 = fVar229 * fVar228 - auVar159._0_4_;
            auVar236._0_8_ = auVar120._0_8_ ^ 0x8000000080000000;
            auVar236._8_4_ = auVar120._8_4_ ^ 0x80000000;
            auVar236._12_4_ = auVar120._12_4_ ^ 0x80000000;
            auVar259._0_4_ = -fVar227;
            auVar259._4_4_ = 0x80000000;
            auVar259._8_4_ = 0x80000000;
            auVar259._12_4_ = 0x80000000;
            auVar153 = vinsertps_avx(auVar259,ZEXT416((uint)(fVar230 * fVar228)),0x1c);
            auVar120 = vmovsldup_avx(ZEXT416((uint)(auVar121._0_4_ * fVar230 * fVar228 -
                                                   auVar120._0_4_ * fVar227)));
            auVar153 = vdivps_avx(auVar153,auVar120);
            auVar121 = vinsertps_avx(auVar121,auVar236,0x10);
            auVar121 = vdivps_avx(auVar121,auVar120);
            auVar120 = vmovsldup_avx(auVar32);
            auVar156 = ZEXT416((uint)(fVar232 - auVar115._0_4_));
            auVar115 = vmovsldup_avx(auVar156);
            auVar185._0_4_ = auVar120._0_4_ * auVar153._0_4_ + auVar115._0_4_ * auVar121._0_4_;
            auVar185._4_4_ = auVar120._4_4_ * auVar153._4_4_ + auVar115._4_4_ * auVar121._4_4_;
            auVar185._8_4_ = auVar120._8_4_ * auVar153._8_4_ + auVar115._8_4_ * auVar121._8_4_;
            auVar185._12_4_ = auVar120._12_4_ * auVar153._12_4_ + auVar115._12_4_ * auVar121._12_4_;
            auVar121 = vsubps_avx(auVar209,auVar185);
            auVar362 = ZEXT1664(auVar121);
            auVar186._8_4_ = 0x7fffffff;
            auVar186._0_8_ = 0x7fffffff7fffffff;
            auVar186._12_4_ = 0x7fffffff;
            auVar209 = vandps_avx(auVar32,auVar186);
            if (auVar209._0_4_ < fVar225) {
              auVar208._8_4_ = 0x7fffffff;
              auVar208._0_8_ = 0x7fffffff7fffffff;
              auVar208._12_4_ = 0x7fffffff;
              auVar209 = vandps_avx(auVar156,auVar208);
              if (auVar209._0_4_ < (float)local_960._0_4_ * 1.9073486e-06 + fVar203 + fVar225) {
                bVar114 = uVar109 < 5;
                fVar203 = auVar121._0_4_ + (float)local_880._0_4_;
                bVar103 = 0;
                if (((ray->org).field_0.m128[3] <= fVar203) &&
                   (fVar227 = ray->tfar, fVar203 <= fVar227)) {
                  auVar209 = vmovshdup_avx(auVar121);
                  bVar103 = 0;
                  fVar228 = auVar209._0_4_;
                  if ((0.0 <= fVar228) && (fVar228 <= 1.0)) {
                    auVar209 = vrsqrtss_avx(auVar31,auVar31);
                    fVar229 = auVar209._0_4_;
                    pGVar19 = (context->scene->geometries).items[uVar110].ptr;
                    if ((pGVar19->mask & ray->mask) == 0) {
                      bVar103 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar103 = 1, pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar209 = ZEXT416((uint)(fVar229 * 1.5 +
                                               fVar226 * -0.5 * fVar229 * fVar229 * fVar229));
                      auVar209 = vshufps_avx(auVar209,auVar209,0);
                      local_b20 = auVar183._0_4_;
                      fStack_b1c = auVar183._4_4_;
                      fStack_b18 = auVar183._8_4_;
                      fStack_b14 = auVar183._12_4_;
                      auVar210._0_4_ = auVar209._0_4_ * local_b20;
                      auVar210._4_4_ = auVar209._4_4_ * fStack_b1c;
                      auVar210._8_4_ = auVar209._8_4_ * fStack_b18;
                      auVar210._12_4_ = auVar209._12_4_ * fStack_b14;
                      auVar123._0_4_ = auVar316._0_4_ + auVar159._0_4_ * auVar210._0_4_;
                      auVar123._4_4_ = auVar316._4_4_ + auVar159._4_4_ * auVar210._4_4_;
                      auVar123._8_4_ = auVar316._8_4_ + auVar159._8_4_ * auVar210._8_4_;
                      auVar123._12_4_ = auVar316._12_4_ + auVar159._12_4_ * auVar210._12_4_;
                      auVar209 = vshufps_avx(auVar210,auVar210,0xc9);
                      auVar183 = vshufps_avx(auVar316,auVar316,0xc9);
                      auVar211._0_4_ = auVar183._0_4_ * auVar210._0_4_;
                      auVar211._4_4_ = auVar183._4_4_ * auVar210._4_4_;
                      auVar211._8_4_ = auVar183._8_4_ * auVar210._8_4_;
                      auVar211._12_4_ = auVar183._12_4_ * auVar210._12_4_;
                      auVar237._0_4_ = auVar316._0_4_ * auVar209._0_4_;
                      auVar237._4_4_ = auVar316._4_4_ * auVar209._4_4_;
                      auVar237._8_4_ = auVar316._8_4_ * auVar209._8_4_;
                      auVar237._12_4_ = auVar316._12_4_ * auVar209._12_4_;
                      auVar153 = vsubps_avx(auVar237,auVar211);
                      auVar209 = vshufps_avx(auVar153,auVar153,0xc9);
                      auVar183 = vshufps_avx(auVar123,auVar123,0xc9);
                      auVar238._0_4_ = auVar183._0_4_ * auVar209._0_4_;
                      auVar238._4_4_ = auVar183._4_4_ * auVar209._4_4_;
                      auVar238._8_4_ = auVar183._8_4_ * auVar209._8_4_;
                      auVar238._12_4_ = auVar183._12_4_ * auVar209._12_4_;
                      auVar209 = vshufps_avx(auVar153,auVar153,0xd2);
                      auVar124._0_4_ = auVar123._0_4_ * auVar209._0_4_;
                      auVar124._4_4_ = auVar123._4_4_ * auVar209._4_4_;
                      auVar124._8_4_ = auVar123._8_4_ * auVar209._8_4_;
                      auVar124._12_4_ = auVar123._12_4_ * auVar209._12_4_;
                      auVar183 = vsubps_avx(auVar238,auVar124);
                      auVar209 = vshufps_avx(auVar183,auVar183,0xe9);
                      local_a00 = vmovlps_avx(auVar209);
                      local_9f8 = auVar183._0_4_;
                      local_9f0 = 0;
                      local_9ec = (undefined4)local_9c8;
                      local_9e4 = context->user->instID[0];
                      local_9e0 = context->user->instPrimID[0];
                      ray->tfar = fVar203;
                      local_720._0_4_ = 0xffffffff;
                      local_a50.valid = (int *)local_720;
                      local_a50.geometryUserPtr = pGVar19->userPtr;
                      local_a50.context = context->user;
                      local_a50.hit = (RTCHitN *)&local_a00;
                      local_a50.N = 1;
                      local_a50.ray = (RTCRayN *)ray;
                      local_9f4 = fVar228;
                      local_9e8 = uVar110;
                      if (pGVar19->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00acd469:
                        p_Var23 = context->args->filter;
                        if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar304 = ZEXT1664(auVar304._0_16_);
                          auVar362 = ZEXT1664(auVar362._0_16_);
                          auVar390 = ZEXT1664(auVar390._0_16_);
                          auVar409 = ZEXT1664(auVar409._0_16_);
                          (*p_Var23)(&local_a50);
                          if (*local_a50.valid == 0) goto LAB_00acd4b1;
                        }
                        bVar103 = 1;
                      }
                      else {
                        auVar304 = ZEXT1664(auVar31);
                        auVar362 = ZEXT1664(auVar121);
                        auVar390 = ZEXT464((uint)fVar225);
                        auVar409 = ZEXT1664(auVar32);
                        (*pGVar19->occlusionFilterN)(&local_a50);
                        if (*local_a50.valid != 0) goto LAB_00acd469;
LAB_00acd4b1:
                        ray->tfar = fVar227;
                        bVar103 = 0;
                      }
                    }
                  }
                }
                goto LAB_00acd25c;
              }
            }
            uVar109 = uVar109 + 1;
          }
          bVar114 = false;
LAB_00acd25c:
          fVar203 = ray->tfar;
          auVar144._4_4_ = fVar203;
          auVar144._0_4_ = fVar203;
          auVar144._8_4_ = fVar203;
          auVar144._12_4_ = fVar203;
          auVar144._16_4_ = fVar203;
          auVar144._20_4_ = fVar203;
          auVar144._24_4_ = fVar203;
          auVar144._28_4_ = fVar203;
          bVar113 = bVar113 | bVar114 & bVar103;
          auVar130 = vcmpps_avx(_local_860,auVar144,2);
          auVar130 = vandps_avx(auVar130,local_420);
          auVar373 = ZEXT3264(local_840);
        }
        auVar172._0_4_ = auVar373._0_4_ + (float)local_740._0_4_;
        auVar172._4_4_ = auVar373._4_4_ + (float)local_740._4_4_;
        auVar172._8_4_ = auVar373._8_4_ + fStack_738;
        auVar172._12_4_ = auVar373._12_4_ + fStack_734;
        auVar172._16_4_ = auVar373._16_4_ + fStack_730;
        auVar172._20_4_ = auVar373._20_4_ + fStack_72c;
        auVar172._24_4_ = auVar373._24_4_ + fStack_728;
        auVar172._28_4_ = auVar373._28_4_ + fStack_724;
        auVar125._0_4_ = ray->tfar;
        auVar125._4_4_ = ray->mask;
        auVar125._8_4_ = ray->id;
        auVar125._12_4_ = ray->flags;
        fVar203 = ray->tfar;
        auVar195._4_4_ = fVar203;
        auVar195._0_4_ = fVar203;
        auVar195._8_4_ = fVar203;
        auVar195._12_4_ = fVar203;
        auVar195._16_4_ = fVar203;
        auVar195._20_4_ = fVar203;
        auVar195._24_4_ = fVar203;
        auVar195._28_4_ = fVar203;
        auVar130 = vcmpps_avx(auVar172,auVar195,2);
        local_840 = vandps_avx(auVar130,auVar24);
        auVar173._8_4_ = 3;
        auVar173._0_8_ = 0x300000003;
        auVar173._12_4_ = 3;
        auVar173._16_4_ = 3;
        auVar173._20_4_ = 3;
        auVar173._24_4_ = 3;
        auVar173._28_4_ = 3;
        auVar196._8_4_ = 2;
        auVar196._0_8_ = 0x200000002;
        auVar196._12_4_ = 2;
        auVar196._16_4_ = 2;
        auVar196._20_4_ = 2;
        auVar196._24_4_ = 2;
        auVar196._28_4_ = 2;
        auVar130 = vblendvps_avx(auVar196,auVar173,local_6c0);
        auVar209 = vpcmpgtd_avx(auVar130._16_16_,local_700);
        auVar31 = vpshufd_avx(local_6e0._0_16_,0);
        auVar31 = vpcmpgtd_avx(auVar130._0_16_,auVar31);
        auVar197._16_16_ = auVar209;
        auVar197._0_16_ = auVar125;
        _local_860 = vblendps_avx(ZEXT1632(auVar31),auVar197,0xf0);
        local_720 = vandnps_avx(_local_860,local_840);
        local_760 = _local_640;
        local_b40._4_4_ = (float)local_740._4_4_ + (float)local_640._4_4_;
        local_b40._0_4_ = (float)local_740._0_4_ + (float)local_640._0_4_;
        fStack_b38 = fStack_738 + fStack_638;
        fStack_b34 = fStack_734 + fStack_634;
        fStack_b30 = fStack_730 + fStack_630;
        fStack_b2c = fStack_72c + fStack_62c;
        fStack_b28 = fStack_728 + fStack_628;
        fStack_b24 = fStack_724 + fStack_624;
        for (; (((((((local_720 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                    (local_720 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (local_720 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  SUB321(local_720 >> 0x7f,0) != '\0') ||
                 (local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                SUB321(local_720 >> 0xbf,0) != '\0') ||
               (local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               local_720[0x1f] < '\0'; local_720 = vandps_avx(auVar130,local_720)) {
          auVar145._8_4_ = 0x7f800000;
          auVar145._0_8_ = 0x7f8000007f800000;
          auVar145._12_4_ = 0x7f800000;
          auVar145._16_4_ = 0x7f800000;
          auVar145._20_4_ = 0x7f800000;
          auVar145._24_4_ = 0x7f800000;
          auVar145._28_4_ = 0x7f800000;
          auVar130 = vblendvps_avx(auVar145,local_760,local_720);
          auVar168 = vshufps_avx(auVar130,auVar130,0xb1);
          auVar168 = vminps_avx(auVar130,auVar168);
          auVar24 = vshufpd_avx(auVar168,auVar168,5);
          auVar168 = vminps_avx(auVar168,auVar24);
          auVar24 = vperm2f128_avx(auVar168,auVar168,1);
          auVar168 = vminps_avx(auVar168,auVar24);
          auVar168 = vcmpps_avx(auVar130,auVar168,0);
          auVar24 = local_720 & auVar168;
          auVar130 = local_720;
          if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar24 >> 0x7f,0) != '\0') ||
                (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar24 >> 0xbf,0) != '\0') ||
              (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar24[0x1f] < '\0') {
            auVar130 = vandps_avx(auVar168,local_720);
          }
          uVar104 = vmovmskps_avx(auVar130);
          uVar112 = 0;
          if (uVar104 != 0) {
            for (; (uVar104 >> uVar112 & 1) == 0; uVar112 = uVar112 + 1) {
            }
          }
          uVar106 = (ulong)uVar112;
          *(undefined4 *)(local_720 + uVar106 * 4) = 0;
          aVar8 = (ray->dir).field_0.field_1;
          local_900 = aVar8.x;
          fStack_8fc = aVar8.y;
          fStack_8f8 = aVar8.z;
          aStack_8f4 = aVar8.field_3;
          auVar209 = vdpps_avx((undefined1  [16])aVar8,(undefined1  [16])aVar8,0x7f);
          fVar203 = local_1c0[uVar106];
          uVar112 = *(uint *)(local_620 + uVar106 * 4);
          if (auVar209._0_4_ < 0.0) {
            auVar304 = ZEXT1664(auVar304._0_16_);
            auVar390 = ZEXT1664(auVar390._0_16_);
            auVar409 = ZEXT1664(auVar409._0_16_);
            fVar225 = sqrtf(auVar209._0_4_);
            uVar106 = extraout_RAX_03;
          }
          else {
            auVar209 = vsqrtss_avx(auVar209,auVar209);
            fVar225 = auVar209._0_4_;
          }
          auVar362 = ZEXT464(uVar112);
          auVar31 = vminps_avx(_local_9c0,_local_8c0);
          auVar209 = vmaxps_avx(_local_9c0,_local_8c0);
          auVar32 = vminps_avx(_local_8a0,_local_8e0);
          auVar183 = vminps_avx(auVar31,auVar32);
          auVar31 = vmaxps_avx(_local_8a0,_local_8e0);
          auVar32 = vmaxps_avx(auVar209,auVar31);
          auVar212._8_4_ = 0x7fffffff;
          auVar212._0_8_ = 0x7fffffff7fffffff;
          auVar212._12_4_ = 0x7fffffff;
          auVar209 = vandps_avx(auVar183,auVar212);
          auVar31 = vandps_avx(auVar32,auVar212);
          auVar209 = vmaxps_avx(auVar209,auVar31);
          auVar31 = vmovshdup_avx(auVar209);
          auVar31 = vmaxss_avx(auVar31,auVar209);
          auVar209 = vshufpd_avx(auVar209,auVar209,1);
          auVar209 = vmaxss_avx(auVar209,auVar31);
          local_920 = auVar209._0_4_ * 1.9073486e-06;
          local_980._0_4_ = fVar225 * 1.9073486e-06;
          local_960._0_16_ = vshufps_avx(auVar32,auVar32,0xff);
          auVar209 = vinsertps_avx(ZEXT416(uVar112),ZEXT416((uint)fVar203),0x10);
          auVar373 = ZEXT1664(auVar209);
          uVar109 = 0;
          while( true ) {
            auVar209 = auVar373._0_16_;
            bVar103 = (byte)uVar106;
            if (uVar109 == 5) break;
            auVar32 = vmovshdup_avx(auVar209);
            fVar203 = auVar32._0_4_;
            fVar230 = 1.0 - fVar203;
            fVar225 = fVar230 * fVar230;
            fVar226 = fVar230 * fVar225;
            fVar227 = fVar203 * fVar203;
            fVar228 = fVar203 * fVar227;
            fVar229 = fVar203 * fVar230;
            auVar31 = vshufps_avx(ZEXT416((uint)(fVar228 * 0.16666667)),
                                  ZEXT416((uint)(fVar228 * 0.16666667)),0);
            auVar183 = ZEXT416((uint)((fVar228 * 4.0 + fVar226 +
                                      fVar203 * fVar229 * 12.0 + fVar230 * fVar229 * 6.0) *
                                     0.16666667));
            auVar183 = vshufps_avx(auVar183,auVar183,0);
            auVar121 = ZEXT416((uint)((fVar226 * 4.0 + fVar228 +
                                      fVar230 * fVar229 * 12.0 + fVar203 * fVar229 * 6.0) *
                                     0.16666667));
            auVar121 = vshufps_avx(auVar121,auVar121,0);
            auVar153 = vshufps_avx(auVar209,auVar209,0);
            auVar187._0_4_ = auVar153._0_4_ * local_900 + 0.0;
            auVar187._4_4_ = auVar153._4_4_ * fStack_8fc + 0.0;
            auVar187._8_4_ = auVar153._8_4_ * fStack_8f8 + 0.0;
            auVar187._12_4_ = auVar153._12_4_ * aStack_8f4.w + 0.0;
            auVar153 = vshufps_avx(ZEXT416((uint)(fVar226 * 0.16666667)),
                                   ZEXT416((uint)(fVar226 * 0.16666667)),0);
            auVar126._0_4_ =
                 auVar153._0_4_ * (float)local_9c0._0_4_ +
                 auVar121._0_4_ * (float)local_8c0._0_4_ +
                 auVar31._0_4_ * (float)local_8e0._0_4_ + auVar183._0_4_ * (float)local_8a0._0_4_;
            auVar126._4_4_ =
                 auVar153._4_4_ * (float)local_9c0._4_4_ +
                 auVar121._4_4_ * (float)local_8c0._4_4_ +
                 auVar31._4_4_ * (float)local_8e0._4_4_ + auVar183._4_4_ * (float)local_8a0._4_4_;
            auVar126._8_4_ =
                 auVar153._8_4_ * fStack_9b8 +
                 auVar121._8_4_ * fStack_8b8 +
                 auVar31._8_4_ * fStack_8d8 + auVar183._8_4_ * fStack_898;
            auVar126._12_4_ =
                 auVar153._12_4_ * fStack_9b4 +
                 auVar121._12_4_ * fStack_8b4 +
                 auVar31._12_4_ * fStack_8d4 + auVar183._12_4_ * fStack_894;
            local_940._0_16_ = auVar126;
            auVar183 = vsubps_avx(auVar187,auVar126);
            auVar31 = vdpps_avx(auVar183,auVar183,0x7f);
            fVar226 = auVar31._0_4_;
            if (fVar226 < 0.0) {
              local_a80._0_16_ = auVar32;
              local_a20._0_4_ = fVar227;
              local_aa0._0_4_ = fVar225;
              local_ac0._0_4_ = fVar229;
              fVar228 = sqrtf(fVar226);
              uVar106 = extraout_RAX_04;
              fVar225 = (float)local_aa0._0_4_;
              fVar227 = (float)local_a20._0_4_;
              fVar203 = (float)local_a80._0_4_;
            }
            else {
              auVar32 = vsqrtss_avx(auVar31,auVar31);
              fVar228 = auVar32._0_4_;
              local_ac0._0_4_ = fVar229;
            }
            auVar390 = ZEXT464((uint)fVar230);
            auVar32 = vshufps_avx(ZEXT416((uint)(fVar227 * 0.5)),ZEXT416((uint)(fVar227 * 0.5)),0);
            auVar121 = ZEXT416((uint)((fVar225 + (float)local_ac0._0_4_ * 4.0) * 0.5));
            auVar121 = vshufps_avx(auVar121,auVar121,0);
            auVar153 = ZEXT416((uint)((fVar203 * -fVar203 - (float)local_ac0._0_4_ * 4.0) * 0.5));
            auVar153 = vshufps_avx(auVar153,auVar153,0);
            auVar120 = ZEXT416((uint)(fVar230 * -fVar230 * 0.5));
            auVar120 = vshufps_avx(auVar120,auVar120,0);
            auVar317._0_4_ =
                 (float)local_9c0._0_4_ * auVar120._0_4_ +
                 (float)local_8c0._0_4_ * auVar153._0_4_ +
                 (float)local_8e0._0_4_ * auVar32._0_4_ + (float)local_8a0._0_4_ * auVar121._0_4_;
            auVar317._4_4_ =
                 (float)local_9c0._4_4_ * auVar120._4_4_ +
                 (float)local_8c0._4_4_ * auVar153._4_4_ +
                 (float)local_8e0._4_4_ * auVar32._4_4_ + (float)local_8a0._4_4_ * auVar121._4_4_;
            auVar317._8_4_ =
                 fStack_9b8 * auVar120._8_4_ +
                 fStack_8b8 * auVar153._8_4_ +
                 fStack_8d8 * auVar32._8_4_ + fStack_898 * auVar121._8_4_;
            auVar317._12_4_ =
                 fStack_9b4 * auVar120._12_4_ +
                 fStack_8b4 * auVar153._12_4_ +
                 fStack_8d4 * auVar32._12_4_ + fStack_894 * auVar121._12_4_;
            auVar32 = vshufps_avx(auVar209,auVar209,0x55);
            auVar121 = ZEXT416((uint)(fVar230 - (fVar203 + fVar203)));
            auVar153 = vshufps_avx(auVar121,auVar121,0);
            auVar121 = ZEXT416((uint)(fVar203 - (fVar230 + fVar230)));
            auVar120 = vshufps_avx(auVar121,auVar121,0);
            auVar159 = ZEXT416((uint)fVar230);
            auVar115 = vshufps_avx(auVar159,auVar159,0);
            auVar121 = vdpps_avx(auVar317,auVar317,0x7f);
            auVar157._0_4_ =
                 (float)local_9c0._0_4_ * auVar115._0_4_ +
                 (float)local_8c0._0_4_ * auVar120._0_4_ +
                 (float)local_8e0._0_4_ * auVar32._0_4_ + (float)local_8a0._0_4_ * auVar153._0_4_;
            auVar157._4_4_ =
                 (float)local_9c0._4_4_ * auVar115._4_4_ +
                 (float)local_8c0._4_4_ * auVar120._4_4_ +
                 (float)local_8e0._4_4_ * auVar32._4_4_ + (float)local_8a0._4_4_ * auVar153._4_4_;
            auVar157._8_4_ =
                 fStack_9b8 * auVar115._8_4_ +
                 fStack_8b8 * auVar120._8_4_ +
                 fStack_8d8 * auVar32._8_4_ + fStack_898 * auVar153._8_4_;
            auVar157._12_4_ =
                 fStack_9b4 * auVar115._12_4_ +
                 fStack_8b4 * auVar120._12_4_ +
                 fStack_8d4 * auVar32._12_4_ + fStack_894 * auVar153._12_4_;
            auVar32 = vblendps_avx(auVar121,_DAT_01f45a50,0xe);
            auVar153 = vrsqrtss_avx(auVar32,auVar32);
            fVar225 = auVar153._0_4_;
            fVar203 = auVar121._0_4_;
            auVar153 = vdpps_avx(auVar317,auVar157,0x7f);
            auVar120 = vshufps_avx(auVar121,auVar121,0);
            auVar158._0_4_ = auVar157._0_4_ * auVar120._0_4_;
            auVar158._4_4_ = auVar157._4_4_ * auVar120._4_4_;
            auVar158._8_4_ = auVar157._8_4_ * auVar120._8_4_;
            auVar158._12_4_ = auVar157._12_4_ * auVar120._12_4_;
            auVar153 = vshufps_avx(auVar153,auVar153,0);
            auVar239._0_4_ = auVar317._0_4_ * auVar153._0_4_;
            auVar239._4_4_ = auVar317._4_4_ * auVar153._4_4_;
            auVar239._8_4_ = auVar317._8_4_ * auVar153._8_4_;
            auVar239._12_4_ = auVar317._12_4_ * auVar153._12_4_;
            auVar115 = vsubps_avx(auVar158,auVar239);
            auVar153 = vrcpss_avx(auVar32,auVar32);
            auVar32 = vmaxss_avx(ZEXT416((uint)local_920),
                                 ZEXT416((uint)(auVar373._0_4_ * (float)local_980._0_4_)));
            auVar153 = ZEXT416((uint)(auVar153._0_4_ * (2.0 - fVar203 * auVar153._0_4_)));
            auVar153 = vshufps_avx(auVar153,auVar153,0);
            uVar94 = CONCAT44(auVar317._4_4_,auVar317._0_4_);
            auVar300._0_8_ = uVar94 ^ 0x8000000080000000;
            auVar300._8_4_ = -auVar317._8_4_;
            auVar300._12_4_ = -auVar317._12_4_;
            auVar120 = ZEXT416((uint)(fVar225 * 1.5 + fVar203 * -0.5 * fVar225 * fVar225 * fVar225))
            ;
            auVar120 = vshufps_avx(auVar120,auVar120,0);
            auVar213._0_4_ = auVar120._0_4_ * auVar115._0_4_ * auVar153._0_4_;
            auVar213._4_4_ = auVar120._4_4_ * auVar115._4_4_ * auVar153._4_4_;
            auVar213._8_4_ = auVar120._8_4_ * auVar115._8_4_ * auVar153._8_4_;
            auVar213._12_4_ = auVar120._12_4_ * auVar115._12_4_ * auVar153._12_4_;
            local_ac0._0_4_ = auVar317._0_4_ * auVar120._0_4_;
            local_ac0._4_4_ = auVar317._4_4_ * auVar120._4_4_;
            local_ac0._8_4_ = auVar317._8_4_ * auVar120._8_4_;
            local_ac0._12_4_ = auVar317._12_4_ * auVar120._12_4_;
            local_a80._0_4_ = auVar32._0_4_;
            if (fVar203 < 0.0) {
              local_a20._0_4_ = fVar228;
              local_aa0._0_16_ = auVar300;
              local_9a0._0_16_ = auVar213;
              auVar390 = ZEXT1664(auVar159);
              fVar225 = sqrtf(fVar203);
              uVar106 = extraout_RAX_05;
              auVar213 = local_9a0._0_16_;
              auVar300 = local_aa0._0_16_;
              fVar203 = (float)local_a80._0_4_;
            }
            else {
              auVar121 = vsqrtss_avx(auVar121,auVar121);
              fVar225 = auVar121._0_4_;
              local_a20._0_4_ = fVar228;
              fVar203 = auVar32._0_4_;
            }
            auVar304 = ZEXT1664(auVar300);
            auVar32 = vdpps_avx(auVar183,local_ac0._0_16_,0x7f);
            local_aa0._0_4_ =
                 (local_920 / fVar225) * ((float)local_a20._0_4_ + 1.0) +
                 fVar203 + (float)local_a20._0_4_ * local_920;
            auVar121 = vdpps_avx(auVar300,local_ac0._0_16_,0x7f);
            auVar153 = vdpps_avx(auVar183,auVar213,0x7f);
            auVar99._4_4_ = fStack_8fc;
            auVar99._0_4_ = local_900;
            auVar99._8_4_ = fStack_8f8;
            auVar99._12_4_ = aStack_8f4.a;
            auVar120 = vdpps_avx(auVar99,local_ac0._0_16_,0x7f);
            auVar115 = vdpps_avx(auVar183,auVar300,0x7f);
            fVar225 = auVar121._0_4_ + auVar153._0_4_;
            fVar227 = auVar32._0_4_;
            auVar127._0_4_ = fVar227 * fVar227;
            auVar127._4_4_ = auVar32._4_4_ * auVar32._4_4_;
            auVar127._8_4_ = auVar32._8_4_ * auVar32._8_4_;
            auVar127._12_4_ = auVar32._12_4_ * auVar32._12_4_;
            auVar153 = vsubps_avx(auVar31,auVar127);
            local_ac0._0_16_ = ZEXT416((uint)fVar225);
            auVar121 = vdpps_avx(auVar183,auVar99,0x7f);
            fVar228 = auVar115._0_4_ - fVar227 * fVar225;
            local_a20._0_16_ = auVar32;
            fVar227 = auVar121._0_4_ - fVar227 * auVar120._0_4_;
            auVar32 = vrsqrtss_avx(auVar153,auVar153);
            fVar229 = auVar153._0_4_;
            fVar225 = auVar32._0_4_;
            fVar225 = fVar225 * 1.5 + fVar229 * -0.5 * fVar225 * fVar225 * fVar225;
            if (fVar229 < 0.0) {
              local_9a0._0_16_ = auVar120;
              local_7a0._0_4_ = fVar228;
              local_7c0._0_4_ = fVar227;
              local_7e0._0_4_ = fVar225;
              auVar304 = ZEXT1664(auVar300);
              auVar390 = ZEXT1664(auVar390._0_16_);
              fVar229 = sqrtf(fVar229);
              uVar106 = extraout_RAX_06;
              fVar225 = (float)local_7e0._0_4_;
              fVar228 = (float)local_7a0._0_4_;
              fVar227 = (float)local_7c0._0_4_;
              auVar120 = local_9a0._0_16_;
              fVar203 = (float)local_a80._0_4_;
            }
            else {
              auVar32 = vsqrtss_avx(auVar153,auVar153);
              fVar229 = auVar32._0_4_;
            }
            auVar409 = ZEXT1664(auVar31);
            auVar159 = vpermilps_avx(local_940._0_16_,0xff);
            auVar115 = vshufps_avx(auVar317,auVar317,0xff);
            fVar228 = fVar228 * fVar225 - auVar115._0_4_;
            auVar240._0_8_ = auVar120._0_8_ ^ 0x8000000080000000;
            auVar240._8_4_ = auVar120._8_4_ ^ 0x80000000;
            auVar240._12_4_ = auVar120._12_4_ ^ 0x80000000;
            auVar260._0_4_ = -fVar228;
            auVar260._4_4_ = 0x80000000;
            auVar260._8_4_ = 0x80000000;
            auVar260._12_4_ = 0x80000000;
            auVar362 = ZEXT1664(local_ac0._0_16_);
            auVar32 = vinsertps_avx(auVar260,ZEXT416((uint)(fVar227 * fVar225)),0x1c);
            auVar153 = vmovsldup_avx(ZEXT416((uint)(local_ac0._0_4_ * fVar227 * fVar225 -
                                                   auVar120._0_4_ * fVar228)));
            auVar32 = vdivps_avx(auVar32,auVar153);
            auVar121 = vinsertps_avx(local_ac0._0_16_,auVar240,0x10);
            auVar121 = vdivps_avx(auVar121,auVar153);
            auVar153 = vmovsldup_avx(local_a20._0_16_);
            auVar159 = ZEXT416((uint)(fVar229 - auVar159._0_4_));
            auVar120 = vmovsldup_avx(auVar159);
            auVar188._0_4_ = auVar153._0_4_ * auVar32._0_4_ + auVar120._0_4_ * auVar121._0_4_;
            auVar188._4_4_ = auVar153._4_4_ * auVar32._4_4_ + auVar120._4_4_ * auVar121._4_4_;
            auVar188._8_4_ = auVar153._8_4_ * auVar32._8_4_ + auVar120._8_4_ * auVar121._8_4_;
            auVar188._12_4_ = auVar153._12_4_ * auVar32._12_4_ + auVar120._12_4_ * auVar121._12_4_;
            auVar32 = vsubps_avx(auVar209,auVar188);
            auVar373 = ZEXT1664(auVar32);
            auVar189._8_4_ = 0x7fffffff;
            auVar189._0_8_ = 0x7fffffff7fffffff;
            auVar189._12_4_ = 0x7fffffff;
            auVar209 = vandps_avx(local_a20._0_16_,auVar189);
            if (auVar209._0_4_ < (float)local_aa0._0_4_) {
              auVar214._8_4_ = 0x7fffffff;
              auVar214._0_8_ = 0x7fffffff7fffffff;
              auVar214._12_4_ = 0x7fffffff;
              auVar209 = vandps_avx(auVar159,auVar214);
              if (auVar209._0_4_ <
                  (float)local_960._0_4_ * 1.9073486e-06 + fVar203 + (float)local_aa0._0_4_) {
                bVar114 = uVar109 < 5;
                fVar203 = auVar32._0_4_ + (float)local_880._0_4_;
                bVar103 = 0;
                if (((ray->org).field_0.m128[3] <= fVar203) &&
                   (fVar225 = ray->tfar, fVar203 <= fVar225)) {
                  auVar209 = vmovshdup_avx(auVar32);
                  fVar227 = auVar209._0_4_;
                  bVar103 = 0;
                  if ((0.0 <= fVar227) && (bVar103 = 0, fVar227 <= 1.0)) {
                    auVar209 = vrsqrtss_avx(auVar31,auVar31);
                    fVar228 = auVar209._0_4_;
                    pGVar19 = (context->scene->geometries).items[uVar110].ptr;
                    if ((pGVar19->mask & ray->mask) == 0) {
                      bVar103 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar103 = 1, pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar209 = ZEXT416((uint)(fVar228 * 1.5 +
                                               fVar226 * -0.5 * fVar228 * fVar228 * fVar228));
                      auVar209 = vshufps_avx(auVar209,auVar209,0);
                      local_b20 = auVar183._0_4_;
                      fStack_b1c = auVar183._4_4_;
                      fStack_b18 = auVar183._8_4_;
                      fStack_b14 = auVar183._12_4_;
                      auVar215._0_4_ = auVar209._0_4_ * local_b20;
                      auVar215._4_4_ = auVar209._4_4_ * fStack_b1c;
                      auVar215._8_4_ = auVar209._8_4_ * fStack_b18;
                      auVar215._12_4_ = auVar209._12_4_ * fStack_b14;
                      auVar128._0_4_ = auVar317._0_4_ + auVar115._0_4_ * auVar215._0_4_;
                      auVar128._4_4_ = auVar317._4_4_ + auVar115._4_4_ * auVar215._4_4_;
                      auVar128._8_4_ = auVar317._8_4_ + auVar115._8_4_ * auVar215._8_4_;
                      auVar128._12_4_ = auVar317._12_4_ + auVar115._12_4_ * auVar215._12_4_;
                      auVar209 = vshufps_avx(auVar215,auVar215,0xc9);
                      auVar183 = vshufps_avx(auVar317,auVar317,0xc9);
                      auVar216._0_4_ = auVar183._0_4_ * auVar215._0_4_;
                      auVar216._4_4_ = auVar183._4_4_ * auVar215._4_4_;
                      auVar216._8_4_ = auVar183._8_4_ * auVar215._8_4_;
                      auVar216._12_4_ = auVar183._12_4_ * auVar215._12_4_;
                      auVar241._0_4_ = auVar317._0_4_ * auVar209._0_4_;
                      auVar241._4_4_ = auVar317._4_4_ * auVar209._4_4_;
                      auVar241._8_4_ = auVar317._8_4_ * auVar209._8_4_;
                      auVar241._12_4_ = auVar317._12_4_ * auVar209._12_4_;
                      auVar121 = vsubps_avx(auVar241,auVar216);
                      auVar209 = vshufps_avx(auVar121,auVar121,0xc9);
                      auVar183 = vshufps_avx(auVar128,auVar128,0xc9);
                      auVar242._0_4_ = auVar183._0_4_ * auVar209._0_4_;
                      auVar242._4_4_ = auVar183._4_4_ * auVar209._4_4_;
                      auVar242._8_4_ = auVar183._8_4_ * auVar209._8_4_;
                      auVar242._12_4_ = auVar183._12_4_ * auVar209._12_4_;
                      auVar209 = vshufps_avx(auVar121,auVar121,0xd2);
                      auVar129._0_4_ = auVar128._0_4_ * auVar209._0_4_;
                      auVar129._4_4_ = auVar128._4_4_ * auVar209._4_4_;
                      auVar129._8_4_ = auVar128._8_4_ * auVar209._8_4_;
                      auVar129._12_4_ = auVar128._12_4_ * auVar209._12_4_;
                      auVar183 = vsubps_avx(auVar242,auVar129);
                      auVar209 = vshufps_avx(auVar183,auVar183,0xe9);
                      local_a00 = vmovlps_avx(auVar209);
                      local_9f8 = auVar183._0_4_;
                      local_9f0 = 0;
                      local_9ec = (undefined4)local_9c8;
                      local_9e4 = context->user->instID[0];
                      local_9e0 = context->user->instPrimID[0];
                      ray->tfar = fVar203;
                      local_ac4 = -1;
                      local_a50.valid = &local_ac4;
                      local_a50.geometryUserPtr = pGVar19->userPtr;
                      local_a50.context = context->user;
                      local_a50.hit = (RTCHitN *)&local_a00;
                      local_a50.N = 1;
                      local_a50.ray = (RTCRayN *)ray;
                      local_9f4 = fVar227;
                      local_9e8 = uVar110;
                      if (pGVar19->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00acde6f:
                        p_Var23 = context->args->filter;
                        if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar304 = ZEXT1664(auVar304._0_16_);
                          auVar362 = ZEXT1664(auVar362._0_16_);
                          auVar373 = ZEXT1664(auVar373._0_16_);
                          auVar390 = ZEXT1664(auVar390._0_16_);
                          auVar409 = ZEXT1664(auVar409._0_16_);
                          (*p_Var23)(&local_a50);
                          if (*local_a50.valid == 0) goto LAB_00acdeb7;
                        }
                        bVar103 = 1;
                      }
                      else {
                        auVar304 = ZEXT1664(auVar304._0_16_);
                        auVar362 = ZEXT1664(local_ac0._0_16_);
                        auVar373 = ZEXT1664(auVar32);
                        auVar390 = ZEXT1664(auVar390._0_16_);
                        auVar409 = ZEXT1664(auVar31);
                        (*pGVar19->occlusionFilterN)(&local_a50);
                        if (*local_a50.valid != 0) goto LAB_00acde6f;
LAB_00acdeb7:
                        ray->tfar = fVar225;
                        bVar103 = 0;
                      }
                    }
                  }
                }
                goto LAB_00acdc71;
              }
            }
            uVar109 = uVar109 + 1;
          }
          bVar114 = false;
LAB_00acdc71:
          bVar113 = bVar113 | bVar114 & bVar103;
          fVar203 = ray->tfar;
          auVar174._4_4_ = fVar203;
          auVar174._0_4_ = fVar203;
          auVar174._8_4_ = fVar203;
          auVar174._12_4_ = fVar203;
          auVar174._16_4_ = fVar203;
          auVar174._20_4_ = fVar203;
          auVar174._24_4_ = fVar203;
          auVar174._28_4_ = fVar203;
          auVar125._0_4_ = ray->tfar;
          auVar125._4_4_ = ray->mask;
          auVar125._8_4_ = ray->id;
          auVar125._12_4_ = ray->flags;
          auVar130 = vcmpps_avx(_local_b40,auVar174,2);
        }
        auVar130 = vandps_avx(local_6a0,local_780);
        auVar168 = vandps_avx(_local_860,local_840);
        auVar284 = ZEXT3264(_local_740);
        auVar249._0_4_ = local_740._0_4_ + local_600._0_4_;
        auVar249._4_4_ = local_740._4_4_ + local_600._4_4_;
        auVar249._8_4_ = local_740._8_4_ + local_600._8_4_;
        auVar249._12_4_ = local_740._12_4_ + local_600._12_4_;
        auVar249._16_4_ = local_740._16_4_ + local_600._16_4_;
        auVar249._20_4_ = local_740._20_4_ + local_600._20_4_;
        auVar249._24_4_ = local_740._24_4_ + local_600._24_4_;
        auVar249._28_4_ = local_740._28_4_ + local_600._28_4_;
        auVar209 = vshufps_avx(auVar125,auVar125,0);
        auVar269._16_16_ = auVar209;
        auVar269._0_16_ = auVar209;
        auVar271 = ZEXT3264(auVar269);
        auVar24 = vcmpps_avx(auVar249,auVar269,2);
        auVar130 = vandps_avx(auVar24,auVar130);
        auVar250._0_4_ = local_740._0_4_ + local_640._0_4_;
        auVar250._4_4_ = local_740._4_4_ + local_640._4_4_;
        auVar250._8_4_ = local_740._8_4_ + local_640._8_4_;
        auVar250._12_4_ = local_740._12_4_ + local_640._12_4_;
        auVar250._16_4_ = local_740._16_4_ + local_640._16_4_;
        auVar250._20_4_ = local_740._20_4_ + local_640._20_4_;
        auVar250._24_4_ = local_740._24_4_ + local_640._24_4_;
        auVar250._28_4_ = local_740._28_4_ + local_640._28_4_;
        auVar24 = vcmpps_avx(auVar250,auVar269,2);
        auVar168 = vandps_avx(auVar24,auVar168);
        auVar168 = vorps_avx(auVar130,auVar168);
        if ((((((((auVar168 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar168 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar168 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar168 >> 0x7f,0) != '\0') ||
              (auVar168 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar168 >> 0xbf,0) != '\0') ||
            (auVar168 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar168[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar105 * 0x60) = auVar168;
          auVar130 = vblendvps_avx(_local_640,local_600,auVar130);
          *(undefined1 (*) [32])(auStack_160 + uVar105 * 0x60) = auVar130;
          uVar106 = vmovlps_avx(local_650);
          (&uStack_140)[uVar105 * 0xc] = uVar106;
          auStack_138[uVar105 * 0x18] = local_bc4 + 1;
          uVar105 = (ulong)((int)uVar105 + 1);
        }
      }
    }
    fVar203 = ray->tfar;
    auVar140._4_4_ = fVar203;
    auVar140._0_4_ = fVar203;
    auVar140._8_4_ = fVar203;
    auVar140._12_4_ = fVar203;
    auVar140._16_4_ = fVar203;
    auVar140._20_4_ = fVar203;
    auVar140._24_4_ = fVar203;
    auVar140._28_4_ = fVar203;
    while( true ) {
      uVar112 = (uint)uVar105;
      if (uVar112 == 0) {
        if (bVar113 != 0) goto LAB_00ace0d5;
        auVar130 = vcmpps_avx(local_3a0,auVar140,2);
        uVar110 = vmovmskps_avx(auVar130);
        uVar110 = (uint)local_868 - 1 & (uint)local_868 & uVar110;
        goto LAB_00acb7b1;
      }
      uVar105 = (ulong)(uVar112 - 1);
      lVar108 = uVar105 * 0x60;
      auVar130 = *(undefined1 (*) [32])(auStack_160 + lVar108);
      auVar167._0_4_ = auVar130._0_4_ + (float)local_740._0_4_;
      auVar167._4_4_ = auVar130._4_4_ + (float)local_740._4_4_;
      auVar167._8_4_ = auVar130._8_4_ + fStack_738;
      auVar167._12_4_ = auVar130._12_4_ + fStack_734;
      auVar167._16_4_ = auVar130._16_4_ + fStack_730;
      auVar167._20_4_ = auVar130._20_4_ + fStack_72c;
      auVar167._24_4_ = auVar130._24_4_ + fStack_728;
      auVar167._28_4_ = auVar130._28_4_ + fStack_724;
      auVar24 = vcmpps_avx(auVar167,auVar140,2);
      auVar168 = vandps_avx(auVar24,*(undefined1 (*) [32])(auStack_180 + lVar108));
      local_600 = auVar168;
      auVar24 = *(undefined1 (*) [32])(auStack_180 + lVar108) & auVar24;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0x7f,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0xbf,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar24[0x1f] < '\0') break;
      uVar105 = (ulong)(uVar112 - 1);
    }
    auVar141._8_4_ = 0x7f800000;
    auVar141._0_8_ = 0x7f8000007f800000;
    auVar141._12_4_ = 0x7f800000;
    auVar141._16_4_ = 0x7f800000;
    auVar141._20_4_ = 0x7f800000;
    auVar141._24_4_ = 0x7f800000;
    auVar141._28_4_ = 0x7f800000;
    auVar130 = vblendvps_avx(auVar141,auVar130,auVar168);
    auVar24 = vshufps_avx(auVar130,auVar130,0xb1);
    auVar24 = vminps_avx(auVar130,auVar24);
    auVar25 = vshufpd_avx(auVar24,auVar24,5);
    auVar24 = vminps_avx(auVar24,auVar25);
    auVar25 = vperm2f128_avx(auVar24,auVar24,1);
    auVar24 = vminps_avx(auVar24,auVar25);
    auVar130 = vcmpps_avx(auVar130,auVar24,0);
    auVar24 = auVar168 & auVar130;
    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0x7f,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0xbf,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0')
    {
      auVar168 = vandps_avx(auVar130,auVar168);
    }
    auVar118._8_8_ = 0;
    auVar118._0_8_ = (&uStack_140)[uVar105 * 0xc];
    local_bc4 = auStack_138[uVar105 * 0x18];
    uVar107 = vmovmskps_avx(auVar168);
    uVar104 = 0;
    if (uVar107 != 0) {
      for (; (uVar107 >> uVar104 & 1) == 0; uVar104 = uVar104 + 1) {
      }
    }
    *(undefined4 *)(local_600 + (ulong)uVar104 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar108) = local_600;
    uVar107 = uVar112 - 1;
    if ((((((((local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_600 >> 0x7f,0) != '\0') ||
          (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_600 >> 0xbf,0) != '\0') ||
        (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_600[0x1f] < '\0') {
      uVar107 = uVar112;
    }
    auVar209 = vshufps_avx(auVar118,auVar118,0);
    auVar31 = vshufps_avx(auVar118,auVar118,0x55);
    auVar31 = vsubps_avx(auVar31,auVar209);
    local_640._4_4_ = auVar209._4_4_ + auVar31._4_4_ * 0.14285715;
    local_640._0_4_ = auVar209._0_4_ + auVar31._0_4_ * 0.0;
    fStack_638 = auVar209._8_4_ + auVar31._8_4_ * 0.2857143;
    fStack_634 = auVar209._12_4_ + auVar31._12_4_ * 0.42857146;
    fStack_630 = auVar209._0_4_ + auVar31._0_4_ * 0.5714286;
    fStack_62c = auVar209._4_4_ + auVar31._4_4_ * 0.71428573;
    fStack_628 = auVar209._8_4_ + auVar31._8_4_ * 0.8571429;
    fStack_624 = auVar209._12_4_ + auVar31._12_4_;
    local_650._8_8_ = 0;
    local_650._0_8_ = *(ulong *)(local_640 + (ulong)uVar104 * 4);
    uVar105 = (ulong)uVar107;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }